

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx::CurveNiMBIntersector1<8>::
     occluded_t<embree::avx::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::avx::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  Primitive PVar28;
  Geometry *pGVar29;
  __int_type_conflict _Var30;
  long lVar31;
  RTCFilterFunctionN p_Var32;
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  float fVar65;
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  ulong uVar102;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  byte bVar112;
  byte bVar113;
  uint uVar114;
  uint uVar115;
  undefined1 (*pauVar116) [32];
  ulong uVar117;
  uint uVar118;
  uint uVar119;
  long lVar120;
  long lVar121;
  long lVar122;
  bool bVar123;
  int iVar124;
  ulong uVar125;
  bool bVar126;
  float fVar127;
  float fVar156;
  float fVar157;
  __m128 a;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar161;
  float fVar163;
  float fVar165;
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  float fVar159;
  float fVar167;
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  float fVar158;
  float fVar160;
  float fVar162;
  float fVar164;
  float fVar166;
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar130 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  float fVar168;
  float fVar193;
  float fVar194;
  undefined1 auVar170 [16];
  undefined1 auVar179 [32];
  undefined1 auVar171 [16];
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar196;
  undefined1 auVar172 [16];
  float fVar169;
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  float fVar195;
  float fVar197;
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [64];
  undefined1 auVar199 [16];
  float fVar198;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  float fVar220;
  float fVar221;
  float fVar223;
  float fVar224;
  undefined1 auVar207 [32];
  float fVar225;
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar200 [16];
  float fVar222;
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar203 [16];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  float fVar226;
  float fVar250;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [28];
  float fVar249;
  float fVar251;
  float fVar252;
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  float fVar253;
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  float fVar254;
  float fVar255;
  float fVar269;
  float fVar271;
  float fVar273;
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  float fVar270;
  float fVar272;
  float fVar274;
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  float fVar275;
  float fVar278;
  float fVar281;
  undefined1 auVar266 [32];
  float fVar276;
  float fVar277;
  float fVar279;
  float fVar280;
  float fVar282;
  float fVar283;
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  float fVar284;
  float fVar300;
  float fVar301;
  undefined1 auVar285 [16];
  float fVar302;
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  float fVar303;
  float fVar304;
  float fVar306;
  undefined1 auVar291 [32];
  float fVar308;
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  float fVar305;
  float fVar307;
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [64];
  float fVar309;
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  float fVar323;
  float fVar324;
  float fVar326;
  float fVar327;
  float fVar330;
  undefined1 auVar314 [32];
  float fVar328;
  float fVar331;
  undefined1 auVar315 [32];
  float fVar325;
  float fVar329;
  float fVar332;
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [64];
  float fVar333;
  float fVar342;
  float fVar343;
  float fVar345;
  float fVar347;
  float fVar349;
  float fVar351;
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  float fVar344;
  float fVar346;
  float fVar348;
  float fVar350;
  float fVar352;
  undefined1 auVar340 [32];
  undefined1 auVar341 [64];
  float fVar353;
  float fVar354;
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  float fVar364;
  float fVar366;
  float fVar370;
  float fVar371;
  float fVar372;
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  float fVar365;
  float fVar367;
  float fVar368;
  float fVar369;
  float fVar373;
  undefined1 auVar363 [64];
  float fVar375;
  undefined1 auVar376 [16];
  float fVar374;
  undefined1 auVar377 [28];
  float fVar384;
  float fVar386;
  float fVar390;
  float fVar392;
  undefined1 auVar378 [32];
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  undefined1 auVar381 [32];
  float fVar385;
  float fVar387;
  float fVar388;
  float fVar389;
  float fVar391;
  float fVar393;
  float fVar394;
  float fVar395;
  float fVar396;
  float fVar397;
  undefined1 auVar382 [32];
  undefined1 auVar383 [64];
  undefined1 auVar398 [32];
  undefined1 auVar399 [32];
  undefined1 auVar400 [32];
  undefined1 auVar401 [32];
  float fVar410;
  undefined1 auVar402 [32];
  undefined1 auVar403 [32];
  undefined1 auVar404 [32];
  undefined1 auVar405 [32];
  undefined1 auVar406 [32];
  undefined1 auVar407 [32];
  undefined1 auVar408 [32];
  undefined1 auVar409 [64];
  float fVar411;
  float fVar420;
  float fVar421;
  float fVar422;
  float fVar423;
  float fVar424;
  float fVar425;
  undefined1 auVar412 [32];
  undefined1 auVar413 [32];
  undefined1 auVar414 [32];
  undefined1 auVar415 [32];
  undefined1 auVar416 [32];
  float fVar426;
  undefined1 auVar417 [32];
  undefined1 auVar418 [32];
  undefined1 auVar419 [64];
  float fVar427;
  float fVar436;
  float fVar437;
  float fVar438;
  float fVar439;
  float fVar440;
  float fVar441;
  float in_register_0000151c;
  undefined1 auVar428 [32];
  undefined1 auVar429 [32];
  undefined1 auVar430 [32];
  undefined1 auVar431 [32];
  undefined1 auVar432 [32];
  undefined1 auVar433 [32];
  undefined1 auVar434 [32];
  undefined1 auVar435 [64];
  float fVar442;
  float fVar448;
  float fVar449;
  float fVar450;
  float fVar451;
  float fVar452;
  float fVar453;
  undefined1 auVar443 [32];
  undefined1 auVar444 [32];
  undefined1 auVar445 [32];
  undefined1 auVar446 [32];
  undefined1 auVar447 [32];
  float in_register_0000159c;
  undefined1 auVar454 [32];
  undefined1 auVar455 [32];
  undefined1 auVar456 [32];
  float in_register_000015dc;
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  uint local_b44;
  float local_b40;
  undefined1 local_b00 [8];
  float fStack_af8;
  float fStack_af4;
  float fStack_af0;
  float fStack_aec;
  float fStack_ae8;
  float fStack_ae4;
  int local_aa4;
  undefined1 local_aa0 [32];
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  undefined1 auStack_a70 [16];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a10 [8];
  float fStack_a08;
  float fStack_a04;
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  undefined1 local_9f0 [8];
  float fStack_9e8;
  float fStack_9e4;
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  RTCFilterFunctionNArguments local_9d0;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined8 local_920;
  undefined4 local_918;
  float local_914;
  undefined4 local_910;
  undefined4 local_90c;
  uint local_908;
  uint local_904;
  uint local_900;
  ulong local_8e8;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  float local_860;
  float fStack_85c;
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  float local_840;
  float fStack_83c;
  float fStack_838;
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [16];
  Primitive *local_7d0;
  ulong local_7c8;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float local_6c0;
  float fStack_6bc;
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [32];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_550 [16];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined4 uStack_224;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined4 uStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  
  PVar28 = prim[1];
  uVar125 = (ulong)(byte)PVar28;
  lVar120 = uVar125 * 0x25;
  fVar226 = *(float *)(prim + lVar120 + 0x12);
  auVar238 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + lVar120 + 6));
  auVar285._0_4_ = fVar226 * (ray->dir).field_0.m128[0];
  auVar285._4_4_ = fVar226 * (ray->dir).field_0.m128[1];
  auVar285._8_4_ = fVar226 * (ray->dir).field_0.m128[2];
  auVar285._12_4_ = fVar226 * (ray->dir).field_0.m128[3];
  auVar232 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 4 + 6)));
  auVar170._0_4_ = fVar226 * auVar238._0_4_;
  auVar170._4_4_ = fVar226 * auVar238._4_4_;
  auVar170._8_4_ = fVar226 * auVar238._8_4_;
  auVar170._12_4_ = fVar226 * auVar238._12_4_;
  auVar238 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 4 + 10)));
  auVar141._16_16_ = auVar238;
  auVar141._0_16_ = auVar232;
  auVar141 = vcvtdq2ps_avx(auVar141);
  lVar31 = uVar125 * 5;
  auVar232 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar31 + 6)));
  auVar238 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar31 + 10)));
  auVar207._16_16_ = auVar238;
  auVar207._0_16_ = auVar232;
  auVar232 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 6 + 6)));
  auVar238 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 6 + 10)));
  auVar186 = vcvtdq2ps_avx(auVar207);
  auVar242._16_16_ = auVar238;
  auVar242._0_16_ = auVar232;
  auVar34 = vcvtdq2ps_avx(auVar242);
  auVar232 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 0xf + 6)));
  auVar238 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 0xf + 10)));
  auVar243._16_16_ = auVar238;
  auVar243._0_16_ = auVar232;
  auVar35 = vcvtdq2ps_avx(auVar243);
  lVar122 = (ulong)(byte)PVar28 * 0x10;
  auVar232 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar122 + 6)));
  auVar238 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar122 + 10)));
  auVar314._16_16_ = auVar238;
  auVar314._0_16_ = auVar232;
  auVar232 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar122 + uVar125 + 6)));
  auVar183 = vcvtdq2ps_avx(auVar314);
  auVar238 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar122 + uVar125 + 10)));
  auVar334._16_16_ = auVar238;
  auVar334._0_16_ = auVar232;
  auVar232 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 0x1a + 6)));
  auVar36 = vcvtdq2ps_avx(auVar334);
  auVar238 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 0x1a + 10)));
  auVar335._16_16_ = auVar238;
  auVar335._0_16_ = auVar232;
  auVar211 = vcvtdq2ps_avx(auVar335);
  auVar232 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 0x1b + 6)));
  auVar238 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 0x1b + 10)));
  auVar378._16_16_ = auVar238;
  auVar378._0_16_ = auVar232;
  auVar232 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 0x1c + 6)));
  auVar238 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 0x1c + 10)));
  auVar37 = vcvtdq2ps_avx(auVar378);
  auVar398._16_16_ = auVar238;
  auVar398._0_16_ = auVar232;
  auVar38 = vcvtdq2ps_avx(auVar398);
  auVar232 = vshufps_avx(auVar285,auVar285,0);
  auVar238 = vshufps_avx(auVar285,auVar285,0x55);
  auVar137 = vshufps_avx(auVar285,auVar285,0xaa);
  fVar226 = auVar137._0_4_;
  fVar169 = auVar137._4_4_;
  fVar249 = auVar137._8_4_;
  fVar195 = auVar137._12_4_;
  fVar225 = auVar238._0_4_;
  fVar223 = auVar238._4_4_;
  fVar250 = auVar238._8_4_;
  fVar224 = auVar238._12_4_;
  fVar251 = auVar232._0_4_;
  fVar252 = auVar232._4_4_;
  fVar253 = auVar232._8_4_;
  fVar254 = auVar232._12_4_;
  auVar428._0_4_ = fVar251 * auVar141._0_4_ + fVar225 * auVar186._0_4_ + fVar226 * auVar34._0_4_;
  auVar428._4_4_ = fVar252 * auVar141._4_4_ + fVar223 * auVar186._4_4_ + fVar169 * auVar34._4_4_;
  auVar428._8_4_ = fVar253 * auVar141._8_4_ + fVar250 * auVar186._8_4_ + fVar249 * auVar34._8_4_;
  auVar428._12_4_ = fVar254 * auVar141._12_4_ + fVar224 * auVar186._12_4_ + fVar195 * auVar34._12_4_
  ;
  auVar428._16_4_ = fVar251 * auVar141._16_4_ + fVar225 * auVar186._16_4_ + fVar226 * auVar34._16_4_
  ;
  auVar428._20_4_ = fVar252 * auVar141._20_4_ + fVar223 * auVar186._20_4_ + fVar169 * auVar34._20_4_
  ;
  auVar428._24_4_ = fVar253 * auVar141._24_4_ + fVar250 * auVar186._24_4_ + fVar249 * auVar34._24_4_
  ;
  auVar428._28_4_ = fVar224 + in_register_000015dc + in_register_0000151c;
  auVar412._0_4_ = fVar251 * auVar35._0_4_ + fVar225 * auVar183._0_4_ + auVar36._0_4_ * fVar226;
  auVar412._4_4_ = fVar252 * auVar35._4_4_ + fVar223 * auVar183._4_4_ + auVar36._4_4_ * fVar169;
  auVar412._8_4_ = fVar253 * auVar35._8_4_ + fVar250 * auVar183._8_4_ + auVar36._8_4_ * fVar249;
  auVar412._12_4_ = fVar254 * auVar35._12_4_ + fVar224 * auVar183._12_4_ + auVar36._12_4_ * fVar195;
  auVar412._16_4_ = fVar251 * auVar35._16_4_ + fVar225 * auVar183._16_4_ + auVar36._16_4_ * fVar226;
  auVar412._20_4_ = fVar252 * auVar35._20_4_ + fVar223 * auVar183._20_4_ + auVar36._20_4_ * fVar169;
  auVar412._24_4_ = fVar253 * auVar35._24_4_ + fVar250 * auVar183._24_4_ + auVar36._24_4_ * fVar249;
  auVar412._28_4_ = fVar224 + in_register_000015dc + in_register_0000159c;
  auVar291._0_4_ = fVar251 * auVar211._0_4_ + fVar225 * auVar37._0_4_ + auVar38._0_4_ * fVar226;
  auVar291._4_4_ = fVar252 * auVar211._4_4_ + fVar223 * auVar37._4_4_ + auVar38._4_4_ * fVar169;
  auVar291._8_4_ = fVar253 * auVar211._8_4_ + fVar250 * auVar37._8_4_ + auVar38._8_4_ * fVar249;
  auVar291._12_4_ = fVar254 * auVar211._12_4_ + fVar224 * auVar37._12_4_ + auVar38._12_4_ * fVar195;
  auVar291._16_4_ = fVar251 * auVar211._16_4_ + fVar225 * auVar37._16_4_ + auVar38._16_4_ * fVar226;
  auVar291._20_4_ = fVar252 * auVar211._20_4_ + fVar223 * auVar37._20_4_ + auVar38._20_4_ * fVar169;
  auVar291._24_4_ = fVar253 * auVar211._24_4_ + fVar250 * auVar37._24_4_ + auVar38._24_4_ * fVar249;
  auVar291._28_4_ = fVar254 + fVar224 + fVar195;
  auVar232 = vshufps_avx(auVar170,auVar170,0);
  auVar238 = vshufps_avx(auVar170,auVar170,0x55);
  auVar137 = vshufps_avx(auVar170,auVar170,0xaa);
  fVar226 = auVar137._0_4_;
  fVar169 = auVar137._4_4_;
  fVar249 = auVar137._8_4_;
  fVar195 = auVar137._12_4_;
  fVar252 = auVar238._0_4_;
  fVar253 = auVar238._4_4_;
  fVar254 = auVar238._8_4_;
  fVar269 = auVar238._12_4_;
  fVar225 = auVar186._28_4_ + auVar34._28_4_;
  fVar223 = auVar232._0_4_;
  fVar250 = auVar232._4_4_;
  fVar224 = auVar232._8_4_;
  fVar251 = auVar232._12_4_;
  auVar179._0_4_ = fVar223 * auVar141._0_4_ + fVar252 * auVar186._0_4_ + fVar226 * auVar34._0_4_;
  auVar179._4_4_ = fVar250 * auVar141._4_4_ + fVar253 * auVar186._4_4_ + fVar169 * auVar34._4_4_;
  auVar179._8_4_ = fVar224 * auVar141._8_4_ + fVar254 * auVar186._8_4_ + fVar249 * auVar34._8_4_;
  auVar179._12_4_ = fVar251 * auVar141._12_4_ + fVar269 * auVar186._12_4_ + fVar195 * auVar34._12_4_
  ;
  auVar179._16_4_ = fVar223 * auVar141._16_4_ + fVar252 * auVar186._16_4_ + fVar226 * auVar34._16_4_
  ;
  auVar179._20_4_ = fVar250 * auVar141._20_4_ + fVar253 * auVar186._20_4_ + fVar169 * auVar34._20_4_
  ;
  auVar179._24_4_ = fVar224 * auVar141._24_4_ + fVar254 * auVar186._24_4_ + fVar249 * auVar34._24_4_
  ;
  auVar179._28_4_ = auVar141._28_4_ + fVar225;
  auVar142._0_4_ = fVar223 * auVar35._0_4_ + auVar36._0_4_ * fVar226 + fVar252 * auVar183._0_4_;
  auVar142._4_4_ = fVar250 * auVar35._4_4_ + auVar36._4_4_ * fVar169 + fVar253 * auVar183._4_4_;
  auVar142._8_4_ = fVar224 * auVar35._8_4_ + auVar36._8_4_ * fVar249 + fVar254 * auVar183._8_4_;
  auVar142._12_4_ = fVar251 * auVar35._12_4_ + auVar36._12_4_ * fVar195 + fVar269 * auVar183._12_4_;
  auVar142._16_4_ = fVar223 * auVar35._16_4_ + auVar36._16_4_ * fVar226 + fVar252 * auVar183._16_4_;
  auVar142._20_4_ = fVar250 * auVar35._20_4_ + auVar36._20_4_ * fVar169 + fVar253 * auVar183._20_4_;
  auVar142._24_4_ = fVar224 * auVar35._24_4_ + auVar36._24_4_ * fVar249 + fVar254 * auVar183._24_4_;
  auVar142._28_4_ = auVar141._28_4_ + auVar36._28_4_ + auVar34._28_4_;
  auVar336._8_4_ = 0x7fffffff;
  auVar336._0_8_ = 0x7fffffff7fffffff;
  auVar336._12_4_ = 0x7fffffff;
  auVar336._16_4_ = 0x7fffffff;
  auVar336._20_4_ = 0x7fffffff;
  auVar336._24_4_ = 0x7fffffff;
  auVar336._28_4_ = 0x7fffffff;
  auVar357._8_4_ = 0x219392ef;
  auVar357._0_8_ = 0x219392ef219392ef;
  auVar357._12_4_ = 0x219392ef;
  auVar357._16_4_ = 0x219392ef;
  auVar357._20_4_ = 0x219392ef;
  auVar357._24_4_ = 0x219392ef;
  auVar357._28_4_ = 0x219392ef;
  auVar141 = vandps_avx(auVar428,auVar336);
  auVar141 = vcmpps_avx(auVar141,auVar357,1);
  auVar186 = vblendvps_avx(auVar428,auVar357,auVar141);
  auVar141 = vandps_avx(auVar412,auVar336);
  auVar141 = vcmpps_avx(auVar141,auVar357,1);
  auVar34 = vblendvps_avx(auVar412,auVar357,auVar141);
  auVar141 = vandps_avx(auVar291,auVar336);
  auVar141 = vcmpps_avx(auVar141,auVar357,1);
  auVar141 = vblendvps_avx(auVar291,auVar357,auVar141);
  auVar208._0_4_ = fVar223 * auVar211._0_4_ + fVar252 * auVar37._0_4_ + auVar38._0_4_ * fVar226;
  auVar208._4_4_ = fVar250 * auVar211._4_4_ + fVar253 * auVar37._4_4_ + auVar38._4_4_ * fVar169;
  auVar208._8_4_ = fVar224 * auVar211._8_4_ + fVar254 * auVar37._8_4_ + auVar38._8_4_ * fVar249;
  auVar208._12_4_ = fVar251 * auVar211._12_4_ + fVar269 * auVar37._12_4_ + auVar38._12_4_ * fVar195;
  auVar208._16_4_ = fVar223 * auVar211._16_4_ + fVar252 * auVar37._16_4_ + auVar38._16_4_ * fVar226;
  auVar208._20_4_ = fVar250 * auVar211._20_4_ + fVar253 * auVar37._20_4_ + auVar38._20_4_ * fVar169;
  auVar208._24_4_ = fVar224 * auVar211._24_4_ + fVar254 * auVar37._24_4_ + auVar38._24_4_ * fVar249;
  auVar208._28_4_ = fVar225 + auVar183._28_4_ + fVar195;
  auVar35 = vrcpps_avx(auVar186);
  fVar226 = auVar35._0_4_;
  fVar249 = auVar35._4_4_;
  auVar183._4_4_ = auVar186._4_4_ * fVar249;
  auVar183._0_4_ = auVar186._0_4_ * fVar226;
  fVar225 = auVar35._8_4_;
  auVar183._8_4_ = auVar186._8_4_ * fVar225;
  fVar250 = auVar35._12_4_;
  auVar183._12_4_ = auVar186._12_4_ * fVar250;
  fVar251 = auVar35._16_4_;
  auVar183._16_4_ = auVar186._16_4_ * fVar251;
  fVar252 = auVar35._20_4_;
  auVar183._20_4_ = auVar186._20_4_ * fVar252;
  fVar253 = auVar35._24_4_;
  auVar183._24_4_ = auVar186._24_4_ * fVar253;
  auVar183._28_4_ = auVar186._28_4_;
  auVar358._8_4_ = 0x3f800000;
  auVar358._0_8_ = 0x3f8000003f800000;
  auVar358._12_4_ = 0x3f800000;
  auVar358._16_4_ = 0x3f800000;
  auVar358._20_4_ = 0x3f800000;
  auVar358._24_4_ = 0x3f800000;
  auVar358._28_4_ = 0x3f800000;
  auVar36 = vsubps_avx(auVar358,auVar183);
  auVar183 = vrcpps_avx(auVar34);
  fVar226 = fVar226 + fVar226 * auVar36._0_4_;
  fVar249 = fVar249 + fVar249 * auVar36._4_4_;
  fVar225 = fVar225 + fVar225 * auVar36._8_4_;
  fVar250 = fVar250 + fVar250 * auVar36._12_4_;
  fVar251 = fVar251 + fVar251 * auVar36._16_4_;
  fVar252 = fVar252 + fVar252 * auVar36._20_4_;
  fVar253 = fVar253 + fVar253 * auVar36._24_4_;
  fVar254 = auVar183._0_4_;
  fVar269 = auVar183._4_4_;
  auVar186._4_4_ = fVar269 * auVar34._4_4_;
  auVar186._0_4_ = fVar254 * auVar34._0_4_;
  fVar271 = auVar183._8_4_;
  auVar186._8_4_ = fVar271 * auVar34._8_4_;
  fVar273 = auVar183._12_4_;
  auVar186._12_4_ = fVar273 * auVar34._12_4_;
  fVar275 = auVar183._16_4_;
  auVar186._16_4_ = fVar275 * auVar34._16_4_;
  fVar278 = auVar183._20_4_;
  auVar186._20_4_ = fVar278 * auVar34._20_4_;
  fVar281 = auVar183._24_4_;
  auVar186._24_4_ = fVar281 * auVar34._24_4_;
  auVar186._28_4_ = auVar34._28_4_;
  auVar34 = vsubps_avx(auVar358,auVar186);
  fVar254 = fVar254 + fVar254 * auVar34._0_4_;
  fVar269 = fVar269 + fVar269 * auVar34._4_4_;
  fVar271 = fVar271 + fVar271 * auVar34._8_4_;
  fVar273 = fVar273 + fVar273 * auVar34._12_4_;
  fVar275 = fVar275 + fVar275 * auVar34._16_4_;
  fVar278 = fVar278 + fVar278 * auVar34._20_4_;
  fVar281 = fVar281 + fVar281 * auVar34._24_4_;
  auVar186 = vrcpps_avx(auVar141);
  fVar284 = auVar186._0_4_;
  fVar300 = auVar186._4_4_;
  auVar211._4_4_ = fVar300 * auVar141._4_4_;
  auVar211._0_4_ = fVar284 * auVar141._0_4_;
  fVar301 = auVar186._8_4_;
  auVar211._8_4_ = fVar301 * auVar141._8_4_;
  fVar302 = auVar186._12_4_;
  auVar211._12_4_ = fVar302 * auVar141._12_4_;
  fVar303 = auVar186._16_4_;
  auVar211._16_4_ = fVar303 * auVar141._16_4_;
  fVar304 = auVar186._20_4_;
  auVar211._20_4_ = fVar304 * auVar141._20_4_;
  fVar306 = auVar186._24_4_;
  auVar211._24_4_ = fVar306 * auVar141._24_4_;
  auVar211._28_4_ = auVar141._28_4_;
  auVar141 = vsubps_avx(auVar358,auVar211);
  fVar284 = fVar284 + fVar284 * auVar141._0_4_;
  fVar300 = fVar300 + fVar300 * auVar141._4_4_;
  fVar301 = fVar301 + fVar301 * auVar141._8_4_;
  fVar302 = fVar302 + fVar302 * auVar141._12_4_;
  fVar303 = fVar303 + fVar303 * auVar141._16_4_;
  fVar304 = fVar304 + fVar304 * auVar141._20_4_;
  fVar306 = fVar306 + fVar306 * auVar141._24_4_;
  auVar232 = ZEXT416((uint)(((ray->dir).field_0.m128[3] - *(float *)(prim + lVar120 + 0x16)) *
                           *(float *)(prim + lVar120 + 0x1a)));
  auVar136 = vshufps_avx(auVar232,auVar232,0);
  auVar232._8_8_ = 0;
  auVar232._0_8_ = *(ulong *)(prim + uVar125 * 7 + 6);
  auVar232 = vpmovsxwd_avx(auVar232);
  auVar238._8_8_ = 0;
  auVar238._0_8_ = *(ulong *)(prim + uVar125 * 7 + 0xe);
  auVar238 = vpmovsxwd_avx(auVar238);
  auVar337._16_16_ = auVar238;
  auVar337._0_16_ = auVar232;
  auVar141 = vcvtdq2ps_avx(auVar337);
  auVar137._8_8_ = 0;
  auVar137._0_8_ = *(ulong *)(prim + uVar125 * 0xb + 6);
  auVar232 = vpmovsxwd_avx(auVar137);
  auVar175._8_8_ = 0;
  auVar175._0_8_ = *(ulong *)(prim + uVar125 * 0xb + 0xe);
  auVar238 = vpmovsxwd_avx(auVar175);
  auVar359._16_16_ = auVar238;
  auVar359._0_16_ = auVar232;
  auVar186 = vcvtdq2ps_avx(auVar359);
  auVar186 = vsubps_avx(auVar186,auVar141);
  fVar169 = auVar136._0_4_;
  fVar195 = auVar136._4_4_;
  fVar223 = auVar136._8_4_;
  fVar224 = auVar136._12_4_;
  auVar136._8_8_ = 0;
  auVar136._0_8_ = *(ulong *)(prim + uVar125 * 9 + 6);
  auVar232 = vpmovsxwd_avx(auVar136);
  auVar376._8_8_ = 0;
  auVar376._0_8_ = *(ulong *)(prim + uVar125 * 9 + 0xe);
  auVar238 = vpmovsxwd_avx(auVar376);
  auVar338._0_4_ = auVar186._0_4_ * fVar169 + auVar141._0_4_;
  auVar338._4_4_ = auVar186._4_4_ * fVar195 + auVar141._4_4_;
  auVar338._8_4_ = auVar186._8_4_ * fVar223 + auVar141._8_4_;
  auVar338._12_4_ = auVar186._12_4_ * fVar224 + auVar141._12_4_;
  auVar338._16_4_ = auVar186._16_4_ * fVar169 + auVar141._16_4_;
  auVar338._20_4_ = auVar186._20_4_ * fVar195 + auVar141._20_4_;
  auVar338._24_4_ = auVar186._24_4_ * fVar223 + auVar141._24_4_;
  auVar338._28_4_ = auVar186._28_4_ + auVar141._28_4_;
  auVar360._16_16_ = auVar238;
  auVar360._0_16_ = auVar232;
  auVar141 = vcvtdq2ps_avx(auVar360);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar125 * 0xd + 6);
  auVar232 = vpmovsxwd_avx(auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar125 * 0xd + 0xe);
  auVar238 = vpmovsxwd_avx(auVar12);
  auVar379._16_16_ = auVar238;
  auVar379._0_16_ = auVar232;
  auVar186 = vcvtdq2ps_avx(auVar379);
  auVar186 = vsubps_avx(auVar186,auVar141);
  auVar178._8_8_ = 0;
  auVar178._0_8_ = *(ulong *)(prim + uVar125 * 0x12 + 6);
  auVar232 = vpmovsxwd_avx(auVar178);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar125 * 0x12 + 0xe);
  auVar238 = vpmovsxwd_avx(auVar13);
  auVar361._0_4_ = auVar141._0_4_ + auVar186._0_4_ * fVar169;
  auVar361._4_4_ = auVar141._4_4_ + auVar186._4_4_ * fVar195;
  auVar361._8_4_ = auVar141._8_4_ + auVar186._8_4_ * fVar223;
  auVar361._12_4_ = auVar141._12_4_ + auVar186._12_4_ * fVar224;
  auVar361._16_4_ = auVar141._16_4_ + auVar186._16_4_ * fVar169;
  auVar361._20_4_ = auVar141._20_4_ + auVar186._20_4_ * fVar195;
  auVar361._24_4_ = auVar141._24_4_ + auVar186._24_4_ * fVar223;
  auVar361._28_4_ = auVar141._28_4_ + auVar186._28_4_;
  auVar380._16_16_ = auVar238;
  auVar380._0_16_ = auVar232;
  auVar141 = vcvtdq2ps_avx(auVar380);
  uVar117 = (ulong)(uint)((int)lVar31 << 2);
  lVar120 = uVar125 * 2 + uVar117;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + lVar120 + 6);
  auVar232 = vpmovsxwd_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + lVar120 + 0xe);
  auVar238 = vpmovsxwd_avx(auVar15);
  auVar399._16_16_ = auVar238;
  auVar399._0_16_ = auVar232;
  auVar186 = vcvtdq2ps_avx(auVar399);
  auVar186 = vsubps_avx(auVar186,auVar141);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar117 + 6);
  auVar232 = vpmovsxwd_avx(auVar16);
  auVar381._0_4_ = auVar141._0_4_ + auVar186._0_4_ * fVar169;
  auVar381._4_4_ = auVar141._4_4_ + auVar186._4_4_ * fVar195;
  auVar381._8_4_ = auVar141._8_4_ + auVar186._8_4_ * fVar223;
  auVar381._12_4_ = auVar141._12_4_ + auVar186._12_4_ * fVar224;
  auVar381._16_4_ = auVar141._16_4_ + auVar186._16_4_ * fVar169;
  auVar381._20_4_ = auVar141._20_4_ + auVar186._20_4_ * fVar195;
  auVar381._24_4_ = auVar141._24_4_ + auVar186._24_4_ * fVar223;
  auVar381._28_4_ = auVar141._28_4_ + auVar186._28_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar117 + 0xe);
  auVar238 = vpmovsxwd_avx(auVar17);
  auVar400._16_16_ = auVar238;
  auVar400._0_16_ = auVar232;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar125 * 0x18 + 6);
  auVar232 = vpmovsxwd_avx(auVar18);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar125 * 0x18 + 0xe);
  auVar238 = vpmovsxwd_avx(auVar19);
  auVar141 = vcvtdq2ps_avx(auVar400);
  auVar413._16_16_ = auVar238;
  auVar413._0_16_ = auVar232;
  auVar186 = vcvtdq2ps_avx(auVar413);
  auVar186 = vsubps_avx(auVar186,auVar141);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar125 * 0x1d + 6);
  auVar232 = vpmovsxwd_avx(auVar20);
  auVar401._0_4_ = auVar141._0_4_ + auVar186._0_4_ * fVar169;
  auVar401._4_4_ = auVar141._4_4_ + auVar186._4_4_ * fVar195;
  auVar401._8_4_ = auVar141._8_4_ + auVar186._8_4_ * fVar223;
  auVar401._12_4_ = auVar141._12_4_ + auVar186._12_4_ * fVar224;
  auVar401._16_4_ = auVar141._16_4_ + auVar186._16_4_ * fVar169;
  auVar401._20_4_ = auVar141._20_4_ + auVar186._20_4_ * fVar195;
  auVar401._24_4_ = auVar141._24_4_ + auVar186._24_4_ * fVar223;
  auVar401._28_4_ = auVar141._28_4_ + auVar186._28_4_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar125 * 0x1d + 0xe);
  auVar238 = vpmovsxwd_avx(auVar21);
  lVar120 = uVar125 + (ulong)(byte)PVar28 * 0x20;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + lVar120 + 6);
  auVar137 = vpmovsxwd_avx(auVar22);
  auVar414._16_16_ = auVar238;
  auVar414._0_16_ = auVar232;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + lVar120 + 0xe);
  auVar232 = vpmovsxwd_avx(auVar23);
  auVar429._16_16_ = auVar232;
  auVar429._0_16_ = auVar137;
  auVar141 = vcvtdq2ps_avx(auVar414);
  auVar186 = vcvtdq2ps_avx(auVar429);
  auVar186 = vsubps_avx(auVar186,auVar141);
  auVar415._0_4_ = auVar141._0_4_ + auVar186._0_4_ * fVar169;
  auVar415._4_4_ = auVar141._4_4_ + auVar186._4_4_ * fVar195;
  auVar415._8_4_ = auVar141._8_4_ + auVar186._8_4_ * fVar223;
  auVar415._12_4_ = auVar141._12_4_ + auVar186._12_4_ * fVar224;
  auVar415._16_4_ = auVar141._16_4_ + auVar186._16_4_ * fVar169;
  auVar415._20_4_ = auVar141._20_4_ + auVar186._20_4_ * fVar195;
  auVar415._24_4_ = auVar141._24_4_ + auVar186._24_4_ * fVar223;
  auVar415._28_4_ = auVar141._28_4_ + auVar186._28_4_;
  lVar120 = (ulong)(byte)PVar28 * 0x20 - uVar125;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + lVar120 + 6);
  auVar232 = vpmovsxwd_avx(auVar24);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + lVar120 + 0xe);
  auVar238 = vpmovsxwd_avx(auVar25);
  auVar430._16_16_ = auVar238;
  auVar430._0_16_ = auVar232;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar125 * 0x23 + 6);
  auVar232 = vpmovsxwd_avx(auVar26);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar125 * 0x23 + 0xe);
  auVar238 = vpmovsxwd_avx(auVar27);
  auVar443._16_16_ = auVar238;
  auVar443._0_16_ = auVar232;
  auVar141 = vcvtdq2ps_avx(auVar430);
  auVar186 = vcvtdq2ps_avx(auVar443);
  auVar186 = vsubps_avx(auVar186,auVar141);
  auVar431._0_4_ = auVar141._0_4_ + auVar186._0_4_ * fVar169;
  auVar431._4_4_ = auVar141._4_4_ + auVar186._4_4_ * fVar195;
  auVar431._8_4_ = auVar141._8_4_ + auVar186._8_4_ * fVar223;
  auVar431._12_4_ = auVar141._12_4_ + auVar186._12_4_ * fVar224;
  auVar431._16_4_ = auVar141._16_4_ + auVar186._16_4_ * fVar169;
  auVar431._20_4_ = auVar141._20_4_ + auVar186._20_4_ * fVar195;
  auVar431._24_4_ = auVar141._24_4_ + auVar186._24_4_ * fVar223;
  auVar431._28_4_ = auVar141._28_4_ + fVar224;
  auVar141 = vsubps_avx(auVar338,auVar179);
  auVar310._0_4_ = fVar226 * auVar141._0_4_;
  auVar310._4_4_ = fVar249 * auVar141._4_4_;
  auVar310._8_4_ = fVar225 * auVar141._8_4_;
  auVar310._12_4_ = fVar250 * auVar141._12_4_;
  auVar37._16_4_ = fVar251 * auVar141._16_4_;
  auVar37._0_16_ = auVar310;
  auVar37._20_4_ = fVar252 * auVar141._20_4_;
  auVar37._24_4_ = fVar253 * auVar141._24_4_;
  auVar37._28_4_ = auVar141._28_4_;
  auVar141 = vsubps_avx(auVar361,auVar179);
  auVar227._0_4_ = fVar226 * auVar141._0_4_;
  auVar227._4_4_ = fVar249 * auVar141._4_4_;
  auVar227._8_4_ = fVar225 * auVar141._8_4_;
  auVar227._12_4_ = fVar250 * auVar141._12_4_;
  auVar38._16_4_ = fVar251 * auVar141._16_4_;
  auVar38._0_16_ = auVar227;
  auVar38._20_4_ = fVar252 * auVar141._20_4_;
  auVar38._24_4_ = fVar253 * auVar141._24_4_;
  auVar38._28_4_ = auVar35._28_4_ + auVar36._28_4_;
  auVar141 = vsubps_avx(auVar381,auVar142);
  auVar171._0_4_ = fVar254 * auVar141._0_4_;
  auVar171._4_4_ = fVar269 * auVar141._4_4_;
  auVar171._8_4_ = fVar271 * auVar141._8_4_;
  auVar171._12_4_ = fVar273 * auVar141._12_4_;
  auVar35._16_4_ = fVar275 * auVar141._16_4_;
  auVar35._0_16_ = auVar171;
  auVar35._20_4_ = fVar278 * auVar141._20_4_;
  auVar35._24_4_ = fVar281 * auVar141._24_4_;
  auVar35._28_4_ = auVar141._28_4_;
  auVar141 = vsubps_avx(auVar401,auVar142);
  auVar256._0_4_ = fVar254 * auVar141._0_4_;
  auVar256._4_4_ = fVar269 * auVar141._4_4_;
  auVar256._8_4_ = fVar271 * auVar141._8_4_;
  auVar256._12_4_ = fVar273 * auVar141._12_4_;
  auVar36._16_4_ = fVar275 * auVar141._16_4_;
  auVar36._0_16_ = auVar256;
  auVar36._20_4_ = fVar278 * auVar141._20_4_;
  auVar36._24_4_ = fVar281 * auVar141._24_4_;
  auVar36._28_4_ = auVar183._28_4_ + auVar34._28_4_;
  auVar141 = vsubps_avx(auVar415,auVar208);
  auVar128._0_4_ = fVar284 * auVar141._0_4_;
  auVar128._4_4_ = fVar300 * auVar141._4_4_;
  auVar128._8_4_ = fVar301 * auVar141._8_4_;
  auVar128._12_4_ = fVar302 * auVar141._12_4_;
  auVar34._16_4_ = fVar303 * auVar141._16_4_;
  auVar34._0_16_ = auVar128;
  auVar34._20_4_ = fVar304 * auVar141._20_4_;
  auVar34._24_4_ = fVar306 * auVar141._24_4_;
  auVar34._28_4_ = auVar141._28_4_;
  auVar141 = vsubps_avx(auVar431,auVar208);
  auVar199._0_4_ = fVar284 * auVar141._0_4_;
  auVar199._4_4_ = fVar300 * auVar141._4_4_;
  auVar199._8_4_ = fVar301 * auVar141._8_4_;
  auVar199._12_4_ = fVar302 * auVar141._12_4_;
  auVar46._16_4_ = fVar303 * auVar141._16_4_;
  auVar46._0_16_ = auVar199;
  auVar46._20_4_ = fVar304 * auVar141._20_4_;
  auVar46._24_4_ = fVar306 * auVar141._24_4_;
  auVar46._28_4_ = auVar141._28_4_;
  auVar232 = vpminsd_avx(auVar37._16_16_,auVar38._16_16_);
  auVar238 = vpminsd_avx(auVar310,auVar227);
  auVar362._16_16_ = auVar232;
  auVar362._0_16_ = auVar238;
  auVar175 = auVar35._16_16_;
  auVar409 = ZEXT1664(auVar175);
  auVar232 = vpminsd_avx(auVar175,auVar36._16_16_);
  auVar238 = vpminsd_avx(auVar171,auVar256);
  auVar416._16_16_ = auVar232;
  auVar416._0_16_ = auVar238;
  auVar141 = vmaxps_avx(auVar362,auVar416);
  auVar136 = auVar46._16_16_;
  auVar419 = ZEXT1664(auVar136);
  auVar137 = auVar34._16_16_;
  auVar435 = ZEXT1664(auVar137);
  auVar232 = vpminsd_avx(auVar137,auVar136);
  auVar238 = vpminsd_avx(auVar128,auVar199);
  auVar444._16_16_ = auVar232;
  auVar444._0_16_ = auVar238;
  uVar7 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar454._4_4_ = uVar7;
  auVar454._0_4_ = uVar7;
  auVar454._8_4_ = uVar7;
  auVar454._12_4_ = uVar7;
  auVar454._16_4_ = uVar7;
  auVar454._20_4_ = uVar7;
  auVar454._24_4_ = uVar7;
  auVar454._28_4_ = uVar7;
  auVar186 = vmaxps_avx(auVar444,auVar454);
  auVar141 = vmaxps_avx(auVar141,auVar186);
  local_2c0._4_4_ = auVar141._4_4_ * 0.99999964;
  local_2c0._0_4_ = auVar141._0_4_ * 0.99999964;
  local_2c0._8_4_ = auVar141._8_4_ * 0.99999964;
  local_2c0._12_4_ = auVar141._12_4_ * 0.99999964;
  local_2c0._16_4_ = auVar141._16_4_ * 0.99999964;
  local_2c0._20_4_ = auVar141._20_4_ * 0.99999964;
  local_2c0._24_4_ = auVar141._24_4_ * 0.99999964;
  local_2c0._28_4_ = auVar141._28_4_;
  auVar232 = vpmaxsd_avx(auVar37._16_16_,auVar38._16_16_);
  auVar238 = vpmaxsd_avx(auVar310,auVar227);
  auVar244._16_16_ = auVar232;
  auVar244._0_16_ = auVar238;
  auVar232 = vpmaxsd_avx(auVar175,auVar36._16_16_);
  auVar238 = vpmaxsd_avx(auVar171,auVar256);
  auVar180._16_16_ = auVar232;
  auVar180._0_16_ = auVar238;
  auVar141 = vminps_avx(auVar244,auVar180);
  auVar232 = vpmaxsd_avx(auVar137,auVar136);
  auVar238 = vpmaxsd_avx(auVar128,auVar199);
  fVar226 = ray->tfar;
  auVar209._4_4_ = fVar226;
  auVar209._0_4_ = fVar226;
  auVar209._8_4_ = fVar226;
  auVar209._12_4_ = fVar226;
  auVar209._16_4_ = fVar226;
  auVar209._20_4_ = fVar226;
  auVar209._24_4_ = fVar226;
  auVar209._28_4_ = fVar226;
  auVar143._16_16_ = auVar232;
  auVar143._0_16_ = auVar238;
  auVar186 = vminps_avx(auVar143,auVar209);
  auVar141 = vminps_avx(auVar141,auVar186);
  auVar47._4_4_ = auVar141._4_4_ * 1.0000004;
  auVar47._0_4_ = auVar141._0_4_ * 1.0000004;
  auVar47._8_4_ = auVar141._8_4_ * 1.0000004;
  auVar47._12_4_ = auVar141._12_4_ * 1.0000004;
  auVar47._16_4_ = auVar141._16_4_ * 1.0000004;
  auVar47._20_4_ = auVar141._20_4_ * 1.0000004;
  auVar47._24_4_ = auVar141._24_4_ * 1.0000004;
  auVar47._28_4_ = auVar141._28_4_;
  auVar141 = vcmpps_avx(local_2c0,auVar47,2);
  auVar232 = vpshufd_avx(ZEXT116((byte)PVar28),0);
  auVar181._16_16_ = auVar232;
  auVar181._0_16_ = auVar232;
  auVar186 = vcvtdq2ps_avx(auVar181);
  auVar186 = vcmpps_avx(_DAT_01faff40,auVar186,1);
  auVar141 = vandps_avx(auVar141,auVar186);
  uVar114 = vmovmskps_avx(auVar141);
  if (uVar114 == 0) {
    return false;
  }
  uVar114 = uVar114 & 0xff;
  auVar144._16_16_ = mm_lookupmask_ps._240_16_;
  auVar144._0_16_ = mm_lookupmask_ps._240_16_;
  local_480 = vblendps_avx(auVar144,ZEXT832(0) << 0x20,0x80);
  local_7d0 = prim;
LAB_0113d422:
  local_7c8 = (ulong)uVar114;
  lVar120 = 0;
  if (local_7c8 != 0) {
    for (; (uVar114 >> lVar120 & 1) == 0; lVar120 = lVar120 + 1) {
    }
  }
  uVar114 = *(uint *)(local_7d0 + 2);
  local_8e8 = (ulong)*(uint *)(local_7d0 + lVar120 * 4 + 6);
  pGVar29 = (context->scene->geometries).items[uVar114].ptr;
  uVar125 = (ulong)*(uint *)(*(long *)&pGVar29->field_0x58 +
                            local_8e8 *
                            pGVar29[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar226 = (pGVar29->time_range).lower;
  fVar226 = pGVar29->fnumTimeSegments *
            (((ray->dir).field_0.m128[3] - fVar226) / ((pGVar29->time_range).upper - fVar226));
  auVar232 = vroundss_avx(ZEXT416((uint)fVar226),ZEXT416((uint)fVar226),9);
  auVar232 = vminss_avx(auVar232,ZEXT416((uint)(pGVar29->fnumTimeSegments + -1.0)));
  auVar232 = vmaxss_avx(ZEXT816(0) << 0x20,auVar232);
  fVar226 = fVar226 - auVar232._0_4_;
  _Var30 = pGVar29[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar121 = (long)(int)auVar232._0_4_ * 0x38;
  lVar120 = *(long *)(_Var30 + 0x10 + lVar121);
  lVar31 = *(long *)(_Var30 + 0x38 + lVar121);
  lVar122 = *(long *)(_Var30 + 0x48 + lVar121);
  auVar232 = vshufps_avx(ZEXT416((uint)fVar226),ZEXT416((uint)fVar226),0);
  pfVar1 = (float *)(lVar31 + uVar125 * lVar122);
  fVar225 = auVar232._0_4_;
  fVar223 = auVar232._4_4_;
  fVar250 = auVar232._8_4_;
  fVar224 = auVar232._12_4_;
  pfVar2 = (float *)(lVar31 + (uVar125 + 1) * lVar122);
  pfVar3 = (float *)(lVar31 + (uVar125 + 2) * lVar122);
  pfVar4 = (float *)(lVar31 + lVar122 * (uVar125 + 3));
  lVar31 = *(long *)(_Var30 + lVar121);
  auVar232 = vshufps_avx(ZEXT416((uint)(1.0 - fVar226)),ZEXT416((uint)(1.0 - fVar226)),0);
  pfVar5 = (float *)(lVar31 + lVar120 * uVar125);
  fVar226 = auVar232._0_4_;
  fVar169 = auVar232._4_4_;
  fVar249 = auVar232._8_4_;
  fVar195 = auVar232._12_4_;
  pfVar6 = (float *)(lVar31 + lVar120 * (uVar125 + 1));
  auVar200._0_4_ = fVar225 * *pfVar1 + fVar226 * *pfVar5;
  auVar200._4_4_ = fVar223 * pfVar1[1] + fVar169 * pfVar5[1];
  auVar200._8_4_ = fVar250 * pfVar1[2] + fVar249 * pfVar5[2];
  auVar200._12_4_ = fVar224 * pfVar1[3] + fVar195 * pfVar5[3];
  pfVar1 = (float *)(lVar31 + lVar120 * (uVar125 + 2));
  auVar228._0_4_ = fVar226 * *pfVar6 + fVar225 * *pfVar2;
  auVar228._4_4_ = fVar169 * pfVar6[1] + fVar223 * pfVar2[1];
  auVar228._8_4_ = fVar249 * pfVar6[2] + fVar250 * pfVar2[2];
  auVar228._12_4_ = fVar195 * pfVar6[3] + fVar224 * pfVar2[3];
  auVar257._0_4_ = fVar226 * *pfVar1 + fVar225 * *pfVar3;
  auVar257._4_4_ = fVar169 * pfVar1[1] + fVar223 * pfVar3[1];
  auVar257._8_4_ = fVar249 * pfVar1[2] + fVar250 * pfVar3[2];
  auVar257._12_4_ = fVar195 * pfVar1[3] + fVar224 * pfVar3[3];
  pfVar1 = (float *)(lVar31 + lVar120 * (uVar125 + 3));
  auVar286._0_4_ = fVar226 * *pfVar1 + fVar225 * *pfVar4;
  auVar286._4_4_ = fVar169 * pfVar1[1] + fVar223 * pfVar4[1];
  auVar286._8_4_ = fVar249 * pfVar1[2] + fVar250 * pfVar4[2];
  auVar286._12_4_ = fVar195 * pfVar1[3] + fVar224 * pfVar4[3];
  auVar129._0_4_ = (auVar200._0_4_ + auVar228._0_4_ + auVar257._0_4_ + auVar286._0_4_) * 0.25;
  auVar129._4_4_ = (auVar200._4_4_ + auVar228._4_4_ + auVar257._4_4_ + auVar286._4_4_) * 0.25;
  auVar129._8_4_ = (auVar200._8_4_ + auVar228._8_4_ + auVar257._8_4_ + auVar286._8_4_) * 0.25;
  auVar129._12_4_ = (auVar200._12_4_ + auVar228._12_4_ + auVar257._12_4_ + auVar286._12_4_) * 0.25;
  aVar9 = (ray->org).field_0.field_1;
  aVar10 = (ray->dir).field_0.field_1;
  auVar232 = vsubps_avx(auVar129,(undefined1  [16])aVar9);
  auVar232 = vdpps_avx(auVar232,(undefined1  [16])aVar10,0x7f);
  auVar238 = vdpps_avx((undefined1  [16])aVar10,(undefined1  [16])aVar10,0x7f);
  auVar137 = vrcpss_avx(auVar238,auVar238);
  auVar383 = ZEXT464(0x40000000);
  fVar226 = auVar232._0_4_ * auVar137._0_4_ * (2.0 - auVar137._0_4_ * auVar238._0_4_);
  local_7e0 = ZEXT416((uint)fVar226);
  auVar238 = vshufps_avx(local_7e0,ZEXT416((uint)fVar226),0);
  fVar226 = aVar10.x;
  fVar169 = aVar10.y;
  fVar249 = aVar10.z;
  aVar196 = aVar10.field_3;
  auVar311._0_4_ = aVar9.x + fVar226 * auVar238._0_4_;
  auVar311._4_4_ = aVar9.y + fVar169 * auVar238._4_4_;
  auVar311._8_4_ = aVar9.z + fVar249 * auVar238._8_4_;
  auVar311._12_4_ = aVar9.field_3.w + aVar196.w * auVar238._12_4_;
  auVar232 = vblendps_avx(auVar311,_DAT_01f7aa10,8);
  _local_9e0 = vsubps_avx(auVar200,auVar232);
  auVar341 = ZEXT1664(_local_9e0);
  _local_9f0 = vsubps_avx(auVar257,auVar232);
  _local_a00 = vsubps_avx(auVar228,auVar232);
  _local_a10 = vsubps_avx(auVar286,auVar232);
  auVar299 = ZEXT1664(_local_a10);
  auVar232 = vshufps_avx(_local_9e0,_local_9e0,0);
  register0x00001290 = auVar232;
  _local_1e0 = auVar232;
  auVar232 = vshufps_avx(_local_9e0,_local_9e0,0x55);
  register0x00001290 = auVar232;
  _local_200 = auVar232;
  auVar232 = vshufps_avx(_local_9e0,_local_9e0,0xaa);
  register0x00001290 = auVar232;
  _local_220 = auVar232;
  auVar232 = vshufps_avx(_local_9e0,_local_9e0,0xff);
  register0x00001290 = auVar232;
  _local_240 = auVar232;
  auVar232 = vshufps_avx(_local_a00,_local_a00,0);
  register0x00001290 = auVar232;
  _local_260 = auVar232;
  auVar232 = vshufps_avx(_local_a00,_local_a00,0x55);
  register0x00001290 = auVar232;
  _local_280 = auVar232;
  auVar232 = vshufps_avx(_local_a00,_local_a00,0xaa);
  register0x00001290 = auVar232;
  _local_340 = auVar232;
  auVar172._0_4_ = fVar226 * fVar226;
  auVar172._4_4_ = fVar169 * fVar169;
  auVar172._8_4_ = fVar249 * fVar249;
  auVar172._12_4_ = aVar196.w * aVar196.w;
  auVar232 = vshufps_avx(auVar172,auVar172,0xaa);
  auVar137 = vshufps_avx(auVar172,auVar172,0x55);
  auVar175 = vshufps_avx(_local_a00,_local_a00,0xff);
  register0x000012d0 = auVar175;
  _local_360 = auVar175;
  auVar175 = vshufps_avx(auVar172,auVar172,0);
  local_2a0._0_4_ = auVar175._0_4_ + auVar137._0_4_ + auVar232._0_4_;
  local_2a0._4_4_ = auVar175._4_4_ + auVar137._4_4_ + auVar232._4_4_;
  local_2a0._8_4_ = auVar175._8_4_ + auVar137._8_4_ + auVar232._8_4_;
  local_2a0._12_4_ = auVar175._12_4_ + auVar137._12_4_ + auVar232._12_4_;
  local_2a0._16_4_ = auVar175._0_4_ + auVar137._0_4_ + auVar232._0_4_;
  local_2a0._20_4_ = auVar175._4_4_ + auVar137._4_4_ + auVar232._4_4_;
  local_2a0._24_4_ = auVar175._8_4_ + auVar137._8_4_ + auVar232._8_4_;
  local_2a0._28_4_ = auVar175._12_4_ + auVar137._12_4_ + auVar232._12_4_;
  auVar322 = ZEXT3264(local_2a0);
  auVar232 = vshufps_avx(_local_9f0,_local_9f0,0);
  register0x00001250 = auVar232;
  _local_380 = auVar232;
  auVar232 = vshufps_avx(_local_9f0,_local_9f0,0x55);
  register0x00001250 = auVar232;
  _local_3a0 = auVar232;
  auVar232 = vshufps_avx(_local_9f0,_local_9f0,0xaa);
  register0x00001250 = auVar232;
  _local_3c0 = auVar232;
  auVar232 = vshufps_avx(_local_9f0,_local_9f0,0xff);
  register0x00001250 = auVar232;
  _local_3e0 = auVar232;
  auVar232 = vshufps_avx(_local_a10,_local_a10,0);
  register0x00001250 = auVar232;
  _local_400 = auVar232;
  auVar232 = vshufps_avx(_local_a10,_local_a10,0x55);
  register0x00001250 = auVar232;
  _local_420 = auVar232;
  auVar232 = vshufps_avx(_local_a10,_local_a10,0xaa);
  register0x00001250 = auVar232;
  _local_440 = auVar232;
  auVar232 = vshufps_avx(_local_a10,_local_a10,0xff);
  local_460._16_16_ = auVar232;
  local_460._0_16_ = auVar232;
  local_aa0._16_16_ = auVar238;
  local_aa0._0_16_ = auVar238;
  local_b44 = 1;
  uVar125 = 0;
  bVar123 = false;
  local_5a0 = (ray->dir).field_0.m128[0];
  local_5c0 = (ray->dir).field_0.m128[1];
  local_5e0 = (ray->dir).field_0.m128[2];
  auVar145._8_4_ = 0x7fffffff;
  auVar145._0_8_ = 0x7fffffff7fffffff;
  auVar145._12_4_ = 0x7fffffff;
  auVar145._16_4_ = 0x7fffffff;
  auVar145._20_4_ = 0x7fffffff;
  auVar145._24_4_ = 0x7fffffff;
  auVar145._28_4_ = 0x7fffffff;
  local_4a0 = vandps_avx(local_2a0,auVar145);
  local_550 = ZEXT816(0x3f80000000000000);
  fStack_5dc = local_5e0;
  fStack_5d8 = local_5e0;
  fStack_5d4 = local_5e0;
  fStack_5d0 = local_5e0;
  fStack_5cc = local_5e0;
  fStack_5c8 = local_5e0;
  fStack_5c4 = local_5e0;
  fStack_5bc = local_5c0;
  fStack_5b8 = local_5c0;
  fStack_5b4 = local_5c0;
  fStack_5b0 = local_5c0;
  fStack_5ac = local_5c0;
  fStack_5a8 = local_5c0;
  fStack_5a4 = local_5c0;
  fStack_59c = local_5a0;
  fStack_598 = local_5a0;
  fStack_594 = local_5a0;
  fStack_590 = local_5a0;
  fStack_58c = local_5a0;
  fStack_588 = local_5a0;
  fStack_584 = local_5a0;
  do {
    auVar266._8_4_ = 0x3f800000;
    auVar266._0_8_ = 0x3f8000003f800000;
    auVar266._12_4_ = 0x3f800000;
    auVar266._16_4_ = 0x3f800000;
    auVar266._20_4_ = 0x3f800000;
    iVar124 = (int)uVar125;
    auVar266._24_4_ = 0x3f800000;
    auVar266._28_4_ = 0x3f800000;
    auVar232 = vmovshdup_avx(local_550);
    auVar137 = vsubps_avx(auVar232,local_550);
    auVar232 = vshufps_avx(local_550,local_550,0);
    local_8e0._16_16_ = auVar232;
    local_8e0._0_16_ = auVar232;
    auVar238 = vshufps_avx(auVar137,auVar137,0);
    _fStack_790 = auVar238;
    _local_7a0 = auVar238;
    fVar168 = auVar238._0_4_;
    fVar193 = auVar238._4_4_;
    fVar194 = auVar238._8_4_;
    fVar197 = auVar238._12_4_;
    fVar198 = auVar232._0_4_;
    auVar245._0_4_ = fVar198 + fVar168 * 0.0;
    fVar220 = auVar232._4_4_;
    auVar245._4_4_ = fVar220 + fVar193 * 0.14285715;
    fVar221 = auVar232._8_4_;
    auVar245._8_4_ = fVar221 + fVar194 * 0.2857143;
    fVar222 = auVar232._12_4_;
    auVar245._12_4_ = fVar222 + fVar197 * 0.42857146;
    auVar245._16_4_ = fVar198 + fVar168 * 0.5714286;
    auVar245._20_4_ = fVar220 + fVar193 * 0.71428573;
    auVar245._24_4_ = fVar221 + fVar194 * 0.8571429;
    auVar245._28_4_ = fVar222 + fVar197;
    auVar141 = vsubps_avx(auVar266,auVar245);
    fVar169 = auVar141._0_4_;
    fVar249 = auVar141._4_4_;
    fVar195 = auVar141._8_4_;
    fVar225 = auVar141._12_4_;
    fVar223 = auVar141._16_4_;
    fVar250 = auVar141._20_4_;
    fVar224 = auVar141._24_4_;
    fVar254 = fVar169 * fVar169 * fVar169;
    fVar273 = fVar249 * fVar249 * fVar249;
    fVar278 = fVar195 * fVar195 * fVar195;
    fVar302 = fVar225 * fVar225 * fVar225;
    fVar304 = fVar223 * fVar223 * fVar223;
    fVar327 = fVar250 * fVar250 * fVar250;
    fVar330 = fVar224 * fVar224 * fVar224;
    fVar333 = auVar245._0_4_ * auVar245._0_4_ * auVar245._0_4_;
    fVar342 = auVar245._4_4_ * auVar245._4_4_ * auVar245._4_4_;
    fVar343 = auVar245._8_4_ * auVar245._8_4_ * auVar245._8_4_;
    fVar345 = auVar245._12_4_ * auVar245._12_4_ * auVar245._12_4_;
    fVar347 = auVar245._16_4_ * auVar245._16_4_ * auVar245._16_4_;
    fVar349 = auVar245._20_4_ * auVar245._20_4_ * auVar245._20_4_;
    fVar351 = auVar245._24_4_ * auVar245._24_4_ * auVar245._24_4_;
    fVar226 = auVar299._28_4_;
    fVar251 = auVar245._0_4_ * fVar169;
    fVar252 = auVar245._4_4_ * fVar249;
    fVar253 = auVar245._8_4_ * fVar195;
    fVar271 = auVar245._12_4_ * fVar225;
    fVar284 = auVar245._16_4_ * fVar223;
    fVar300 = auVar245._20_4_ * fVar250;
    fVar301 = auVar245._24_4_ * fVar224;
    fVar269 = auVar409._28_4_ + auVar435._28_4_;
    fVar373 = auVar341._28_4_ + fVar226 + fVar269;
    fVar396 = fVar269 + auVar322._28_4_ + auVar419._28_4_ + auVar383._28_4_;
    fVar269 = fVar254 * 0.16666667;
    fVar275 = fVar273 * 0.16666667;
    fVar281 = fVar278 * 0.16666667;
    fVar303 = fVar302 * 0.16666667;
    fVar306 = fVar304 * 0.16666667;
    fVar328 = fVar327 * 0.16666667;
    fVar331 = fVar330 * 0.16666667;
    fVar353 = (fVar333 + fVar254 * 4.0 + fVar169 * fVar251 * 12.0 + auVar245._0_4_ * fVar251 * 6.0)
              * 0.16666667;
    fVar364 = (fVar342 + fVar273 * 4.0 + fVar249 * fVar252 * 12.0 + auVar245._4_4_ * fVar252 * 6.0)
              * 0.16666667;
    fVar366 = (fVar343 + fVar278 * 4.0 + fVar195 * fVar253 * 12.0 + auVar245._8_4_ * fVar253 * 6.0)
              * 0.16666667;
    fVar368 = (fVar345 + fVar302 * 4.0 + fVar225 * fVar271 * 12.0 + auVar245._12_4_ * fVar271 * 6.0)
              * 0.16666667;
    fVar370 = (fVar347 + fVar304 * 4.0 + fVar223 * fVar284 * 12.0 + auVar245._16_4_ * fVar284 * 6.0)
              * 0.16666667;
    fVar371 = (fVar349 + fVar327 * 4.0 + fVar250 * fVar300 * 12.0 + auVar245._20_4_ * fVar300 * 6.0)
              * 0.16666667;
    fVar372 = (fVar351 + fVar330 * 4.0 + fVar224 * fVar301 * 12.0 + auVar245._24_4_ * fVar301 * 6.0)
              * 0.16666667;
    fVar254 = (fVar333 * 4.0 + fVar254 + auVar245._0_4_ * fVar251 * 12.0 + fVar169 * fVar251 * 6.0)
              * 0.16666667;
    fVar273 = (fVar342 * 4.0 + fVar273 + auVar245._4_4_ * fVar252 * 12.0 + fVar249 * fVar252 * 6.0)
              * 0.16666667;
    fVar278 = (fVar343 * 4.0 + fVar278 + auVar245._8_4_ * fVar253 * 12.0 + fVar195 * fVar253 * 6.0)
              * 0.16666667;
    fVar302 = (fVar345 * 4.0 + fVar302 + auVar245._12_4_ * fVar271 * 12.0 + fVar225 * fVar271 * 6.0)
              * 0.16666667;
    fVar304 = (fVar347 * 4.0 + fVar304 + auVar245._16_4_ * fVar284 * 12.0 + fVar223 * fVar284 * 6.0)
              * 0.16666667;
    fVar327 = (fVar349 * 4.0 + fVar327 + auVar245._20_4_ * fVar300 * 12.0 + fVar250 * fVar300 * 6.0)
              * 0.16666667;
    fVar330 = (fVar351 * 4.0 + fVar330 + auVar245._24_4_ * fVar301 * 12.0 + fVar224 * fVar301 * 6.0)
              * 0.16666667;
    fVar333 = fVar333 * 0.16666667;
    fVar342 = fVar342 * 0.16666667;
    fVar343 = fVar343 * 0.16666667;
    fVar345 = fVar345 * 0.16666667;
    fVar347 = fVar347 * 0.16666667;
    fVar349 = fVar349 * 0.16666667;
    fVar351 = fVar351 * 0.16666667;
    fVar426 = auVar419._28_4_ + 12.0;
    fVar397 = fVar396 + 12.166667;
    fVar410 = fVar426 + 12.166667;
    local_860 = (float)local_1e0._0_4_ * fVar269 +
                (float)local_260._0_4_ * fVar353 +
                fVar333 * (float)local_400._0_4_ + fVar254 * (float)local_380._0_4_;
    fStack_85c = (float)local_1e0._4_4_ * fVar275 +
                 (float)local_260._4_4_ * fVar364 +
                 fVar342 * (float)local_400._4_4_ + fVar273 * (float)local_380._4_4_;
    fStack_858 = fStack_1d8 * fVar281 +
                 fStack_258 * fVar366 + fVar343 * fStack_3f8 + fVar278 * fStack_378;
    fStack_854 = fStack_1d4 * fVar303 +
                 fStack_254 * fVar368 + fVar345 * fStack_3f4 + fVar302 * fStack_374;
    fStack_850 = fStack_1d0 * fVar306 +
                 fStack_250 * fVar370 + fVar347 * fStack_3f0 + fVar304 * fStack_370;
    fStack_84c = fStack_1cc * fVar328 +
                 fStack_24c * fVar371 + fVar349 * fStack_3ec + fVar327 * fStack_36c;
    fStack_848 = fStack_1c8 * fVar331 +
                 fStack_248 * fVar372 + fVar351 * fStack_3e8 + fVar330 * fStack_368;
    fStack_844 = fVar373 + fVar397;
    fVar127 = (float)local_200._0_4_ * fVar269 +
              (float)local_280._0_4_ * fVar353 +
              fVar333 * (float)local_420._0_4_ + fVar254 * (float)local_3a0._0_4_;
    fVar156 = (float)local_200._4_4_ * fVar275 +
              (float)local_280._4_4_ * fVar364 +
              fVar342 * (float)local_420._4_4_ + fVar273 * (float)local_3a0._4_4_;
    fVar157 = fStack_1f8 * fVar281 +
              fStack_278 * fVar366 + fVar343 * fStack_418 + fVar278 * fStack_398;
    fVar159 = fStack_1f4 * fVar303 +
              fStack_274 * fVar368 + fVar345 * fStack_414 + fVar302 * fStack_394;
    fVar161 = fStack_1f0 * fVar306 +
              fStack_270 * fVar370 + fVar347 * fStack_410 + fVar304 * fStack_390;
    fVar163 = fStack_1ec * fVar328 +
              fStack_26c * fVar371 + fVar349 * fStack_40c + fVar327 * fStack_38c;
    fVar165 = fStack_1e8 * fVar331 +
              fStack_268 * fVar372 + fVar351 * fStack_408 + fVar330 * fStack_388;
    fVar167 = fVar373 + fVar410;
    fVar354 = (float)local_220._0_4_ * fVar269 +
              fVar353 * (float)local_340._0_4_ +
              fVar333 * (float)local_440._0_4_ + fVar254 * (float)local_3c0._0_4_;
    fVar365 = (float)local_220._4_4_ * fVar275 +
              fVar364 * (float)local_340._4_4_ +
              fVar342 * (float)local_440._4_4_ + fVar273 * (float)local_3c0._4_4_;
    fVar367 = fStack_218 * fVar281 +
              fVar366 * fStack_338 + fVar343 * fStack_438 + fVar278 * fStack_3b8;
    fVar369 = fStack_214 * fVar303 +
              fVar368 * fStack_334 + fVar345 * fStack_434 + fVar302 * fStack_3b4;
    fStack_830 = fStack_210 * fVar306 +
                 fVar370 * fStack_330 + fVar347 * fStack_430 + fVar304 * fStack_3b0;
    fStack_82c = fStack_20c * fVar328 +
                 fVar371 * fStack_32c + fVar349 * fStack_42c + fVar327 * fStack_3ac;
    fStack_828 = fStack_208 * fVar331 +
                 fVar372 * fStack_328 + fVar351 * fStack_428 + fVar330 * fStack_3a8;
    fStack_824 = fVar373 + fVar426 + auVar435._28_4_ + 12.0;
    local_b00._0_4_ =
         (float)local_240._0_4_ * fVar269 +
         fVar353 * (float)local_360._0_4_ +
         fVar254 * (float)local_3e0._0_4_ + local_460._0_4_ * fVar333;
    local_b00._4_4_ =
         (float)local_240._4_4_ * fVar275 +
         fVar364 * (float)local_360._4_4_ +
         fVar273 * (float)local_3e0._4_4_ + local_460._4_4_ * fVar342;
    fStack_af8 = fStack_238 * fVar281 +
                 fVar366 * fStack_358 + fVar278 * fStack_3d8 + local_460._8_4_ * fVar343;
    fStack_af4 = fStack_234 * fVar303 +
                 fVar368 * fStack_354 + fVar302 * fStack_3d4 + local_460._12_4_ * fVar345;
    fStack_af0 = fStack_230 * fVar306 +
                 fVar370 * fStack_350 + fVar304 * fStack_3d0 + local_460._16_4_ * fVar347;
    fStack_aec = fStack_22c * fVar328 +
                 fVar371 * fStack_34c + fVar327 * fStack_3cc + local_460._20_4_ * fVar349;
    fStack_ae8 = fStack_228 * fVar331 +
                 fVar372 * fStack_348 + fVar330 * fStack_3c8 + local_460._24_4_ * fVar351;
    fStack_ae4 = auVar322._28_4_ + fVar373 + fVar396 + auVar341._28_4_;
    auVar48._4_4_ = auVar245._4_4_ * -auVar245._4_4_;
    auVar48._0_4_ = auVar245._0_4_ * -auVar245._0_4_;
    auVar48._8_4_ = auVar245._8_4_ * -auVar245._8_4_;
    auVar48._12_4_ = auVar245._12_4_ * -auVar245._12_4_;
    auVar48._16_4_ = auVar245._16_4_ * -auVar245._16_4_;
    auVar48._20_4_ = auVar245._20_4_ * -auVar245._20_4_;
    auVar48._24_4_ = auVar245._24_4_ * -auVar245._24_4_;
    auVar48._28_4_ = auVar245._28_4_;
    auVar49._4_4_ = fVar252 * 4.0;
    auVar49._0_4_ = fVar251 * 4.0;
    auVar49._8_4_ = fVar253 * 4.0;
    auVar49._12_4_ = fVar271 * 4.0;
    auVar49._16_4_ = fVar284 * 4.0;
    auVar49._20_4_ = fVar300 * 4.0;
    auVar49._24_4_ = fVar301 * 4.0;
    auVar49._28_4_ = fVar226;
    auVar141 = vsubps_avx(auVar48,auVar49);
    fVar330 = fVar169 * -fVar169 * 0.5;
    fVar331 = fVar249 * -fVar249 * 0.5;
    fVar333 = fVar195 * -fVar195 * 0.5;
    fVar342 = fVar225 * -fVar225 * 0.5;
    fVar343 = fVar223 * -fVar223 * 0.5;
    fVar345 = fVar250 * -fVar250 * 0.5;
    fVar347 = fVar224 * -fVar224 * 0.5;
    fVar273 = auVar141._0_4_ * 0.5;
    fVar275 = auVar141._4_4_ * 0.5;
    fVar303 = auVar141._8_4_ * 0.5;
    fVar304 = auVar141._12_4_ * 0.5;
    fVar306 = auVar141._16_4_ * 0.5;
    fVar327 = auVar141._20_4_ * 0.5;
    fVar328 = auVar141._24_4_ * 0.5;
    fVar254 = (fVar169 * fVar169 + fVar251 * 4.0) * 0.5;
    fVar269 = (fVar249 * fVar249 + fVar252 * 4.0) * 0.5;
    fVar278 = (fVar195 * fVar195 + fVar253 * 4.0) * 0.5;
    fVar281 = (fVar225 * fVar225 + fVar271 * 4.0) * 0.5;
    fVar284 = (fVar223 * fVar223 + fVar284 * 4.0) * 0.5;
    fVar300 = (fVar250 * fVar250 + fVar300 * 4.0) * 0.5;
    fVar301 = (fVar224 * fVar224 + fVar301 * 4.0) * 0.5;
    fVar169 = auVar245._0_4_ * auVar245._0_4_ * 0.5;
    fVar249 = auVar245._4_4_ * auVar245._4_4_ * 0.5;
    fVar195 = auVar245._8_4_ * auVar245._8_4_ * 0.5;
    fVar225 = auVar245._12_4_ * auVar245._12_4_ * 0.5;
    fVar251 = auVar245._16_4_ * auVar245._16_4_ * 0.5;
    fVar252 = auVar245._20_4_ * auVar245._20_4_ * 0.5;
    fVar253 = auVar245._24_4_ * auVar245._24_4_ * 0.5;
    fVar302 = auVar141._28_4_ + fVar222 + fVar226 + fVar397 + fVar226;
    auVar232 = vpermilps_avx(ZEXT416((uint)(auVar137._0_4_ * 0.04761905)),0);
    fVar223 = auVar232._0_4_;
    fVar427 = fVar223 * ((float)local_1e0._0_4_ * fVar330 +
                        (float)local_260._0_4_ * fVar273 +
                        fVar254 * (float)local_380._0_4_ + fVar169 * (float)local_400._0_4_);
    fVar250 = auVar232._4_4_;
    fVar436 = fVar250 * ((float)local_1e0._4_4_ * fVar331 +
                        (float)local_260._4_4_ * fVar275 +
                        fVar269 * (float)local_380._4_4_ + fVar249 * (float)local_400._4_4_);
    auVar50._4_4_ = fVar436;
    auVar50._0_4_ = fVar427;
    fVar224 = auVar232._8_4_;
    fVar437 = fVar224 * (fStack_1d8 * fVar333 +
                        fStack_258 * fVar303 + fVar278 * fStack_378 + fVar195 * fStack_3f8);
    auVar50._8_4_ = fVar437;
    fVar271 = auVar232._12_4_;
    fVar438 = fVar271 * (fStack_1d4 * fVar342 +
                        fStack_254 * fVar304 + fVar281 * fStack_374 + fVar225 * fStack_3f4);
    auVar50._12_4_ = fVar438;
    fVar439 = fVar223 * (fStack_1d0 * fVar343 +
                        fStack_250 * fVar306 + fVar284 * fStack_370 + fVar251 * fStack_3f0);
    auVar50._16_4_ = fVar439;
    fVar440 = fVar250 * (fStack_1cc * fVar345 +
                        fStack_24c * fVar327 + fVar300 * fStack_36c + fVar252 * fStack_3ec);
    auVar50._20_4_ = fVar440;
    fVar441 = fVar224 * (fStack_1c8 * fVar347 +
                        fStack_248 * fVar328 + fVar301 * fStack_368 + fVar253 * fStack_3e8);
    auVar50._24_4_ = fVar441;
    auVar50._28_4_ = uStack_1c4;
    fVar411 = fVar223 * ((float)local_200._0_4_ * fVar330 +
                        (float)local_280._0_4_ * fVar273 +
                        fVar254 * (float)local_3a0._0_4_ + fVar169 * (float)local_420._0_4_);
    fVar420 = fVar250 * ((float)local_200._4_4_ * fVar331 +
                        (float)local_280._4_4_ * fVar275 +
                        fVar269 * (float)local_3a0._4_4_ + fVar249 * (float)local_420._4_4_);
    auVar51._4_4_ = fVar420;
    auVar51._0_4_ = fVar411;
    fVar421 = fVar224 * (fStack_1f8 * fVar333 +
                        fStack_278 * fVar303 + fVar278 * fStack_398 + fVar195 * fStack_418);
    auVar51._8_4_ = fVar421;
    fVar422 = fVar271 * (fStack_1f4 * fVar342 +
                        fStack_274 * fVar304 + fVar281 * fStack_394 + fVar225 * fStack_414);
    auVar51._12_4_ = fVar422;
    fVar423 = fVar223 * (fStack_1f0 * fVar343 +
                        fStack_270 * fVar306 + fVar284 * fStack_390 + fVar251 * fStack_410);
    auVar51._16_4_ = fVar423;
    fVar424 = fVar250 * (fStack_1ec * fVar345 +
                        fStack_26c * fVar327 + fVar300 * fStack_38c + fVar252 * fStack_40c);
    auVar51._20_4_ = fVar424;
    fVar425 = fVar224 * (fStack_1e8 * fVar347 +
                        fStack_268 * fVar328 + fVar301 * fStack_388 + fVar253 * fStack_408);
    auVar51._24_4_ = fVar425;
    auVar51._28_4_ = uStack_224;
    fVar374 = fVar223 * ((float)local_220._0_4_ * fVar330 +
                        fVar169 * (float)local_440._0_4_ + fVar254 * (float)local_3c0._0_4_ +
                        fVar273 * (float)local_340._0_4_);
    fVar384 = fVar250 * ((float)local_220._4_4_ * fVar331 +
                        fVar249 * (float)local_440._4_4_ + fVar269 * (float)local_3c0._4_4_ +
                        fVar275 * (float)local_340._4_4_);
    local_a60._4_4_ = fVar384;
    local_a60._0_4_ = fVar374;
    fVar386 = fVar224 * (fStack_218 * fVar333 +
                        fVar195 * fStack_438 + fVar278 * fStack_3b8 + fVar303 * fStack_338);
    local_a60._8_4_ = fVar386;
    fVar388 = fVar271 * (fStack_214 * fVar342 +
                        fVar225 * fStack_434 + fVar281 * fStack_3b4 + fVar304 * fStack_334);
    local_a60._12_4_ = fVar388;
    fVar390 = fVar223 * (fStack_210 * fVar343 +
                        fVar251 * fStack_430 + fVar284 * fStack_3b0 + fVar306 * fStack_330);
    local_a60._16_4_ = fVar390;
    fVar392 = fVar250 * (fStack_20c * fVar345 +
                        fVar252 * fStack_42c + fVar300 * fStack_3ac + fVar327 * fStack_32c);
    local_a60._20_4_ = fVar392;
    fVar394 = fVar224 * (fStack_208 * fVar347 +
                        fVar253 * fStack_428 + fVar301 * fStack_3a8 + fVar328 * fStack_328);
    local_a60._24_4_ = fVar394;
    local_a60._28_4_ = fVar397;
    fVar273 = fVar223 * ((float)local_240._0_4_ * fVar330 +
                        fVar273 * (float)local_360._0_4_ +
                        fVar169 * local_460._0_4_ + fVar254 * (float)local_3e0._0_4_);
    fVar275 = fVar250 * ((float)local_240._4_4_ * fVar331 +
                        fVar275 * (float)local_360._4_4_ +
                        fVar249 * local_460._4_4_ + fVar269 * (float)local_3e0._4_4_);
    auVar52._4_4_ = fVar275;
    auVar52._0_4_ = fVar273;
    fVar278 = fVar224 * (fStack_238 * fVar333 +
                        fVar303 * fStack_358 + fVar195 * local_460._8_4_ + fVar278 * fStack_3d8);
    auVar52._8_4_ = fVar278;
    fVar271 = fVar271 * (fStack_234 * fVar342 +
                        fVar304 * fStack_354 + fVar225 * local_460._12_4_ + fVar281 * fStack_3d4);
    auVar52._12_4_ = fVar271;
    fVar223 = fVar223 * (fStack_230 * fVar343 +
                        fVar306 * fStack_350 + fVar251 * local_460._16_4_ + fVar284 * fStack_3d0);
    auVar52._16_4_ = fVar223;
    fVar250 = fVar250 * (fStack_22c * fVar345 +
                        fVar327 * fStack_34c + fVar252 * local_460._20_4_ + fVar300 * fStack_3cc);
    auVar52._20_4_ = fVar250;
    fVar224 = fVar224 * (fStack_228 * fVar347 +
                        fVar328 * fStack_348 + fVar253 * local_460._24_4_ + fVar301 * fStack_3c8);
    auVar52._24_4_ = fVar224;
    auVar52._28_4_ = fVar302;
    auVar103._4_4_ = fVar156;
    auVar103._0_4_ = fVar127;
    auVar103._8_4_ = fVar157;
    auVar103._12_4_ = fVar159;
    auVar103._16_4_ = fVar161;
    auVar103._20_4_ = fVar163;
    auVar103._24_4_ = fVar165;
    auVar103._28_4_ = fVar167;
    auVar141 = vperm2f128_avx(auVar103,auVar103,1);
    auVar141 = vshufps_avx(auVar141,auVar103,0x30);
    local_880 = vshufps_avx(auVar103,auVar141,0x29);
    auVar108._4_4_ = fVar365;
    auVar108._0_4_ = fVar354;
    auVar108._8_4_ = fVar367;
    auVar108._12_4_ = fVar369;
    auVar108._16_4_ = fStack_830;
    auVar108._20_4_ = fStack_82c;
    auVar108._24_4_ = fStack_828;
    auVar108._28_4_ = fStack_824;
    auVar141 = vperm2f128_avx(auVar108,auVar108,1);
    auVar141 = vshufps_avx(auVar141,auVar108,0x30);
    auVar35 = vshufps_avx(auVar108,auVar141,0x29);
    auVar186 = vsubps_avx(_local_b00,auVar52);
    auVar141 = vperm2f128_avx(auVar186,auVar186,1);
    auVar141 = vshufps_avx(auVar141,auVar186,0x30);
    auVar183 = vshufps_avx(auVar186,auVar141,0x29);
    auVar34 = vsubps_avx(local_880,auVar103);
    auVar37 = vsubps_avx(auVar35,auVar108);
    fVar169 = auVar34._0_4_;
    fVar252 = auVar34._4_4_;
    auVar53._4_4_ = fVar384 * fVar252;
    auVar53._0_4_ = fVar374 * fVar169;
    fVar281 = auVar34._8_4_;
    auVar53._8_4_ = fVar386 * fVar281;
    fVar327 = auVar34._12_4_;
    auVar53._12_4_ = fVar388 * fVar327;
    fVar347 = auVar34._16_4_;
    auVar53._16_4_ = fVar390 * fVar347;
    fVar371 = auVar34._20_4_;
    auVar53._20_4_ = fVar392 * fVar371;
    fVar39 = auVar34._24_4_;
    auVar53._24_4_ = fVar394 * fVar39;
    auVar53._28_4_ = auVar186._28_4_;
    fVar249 = auVar37._0_4_;
    fVar253 = auVar37._4_4_;
    auVar54._4_4_ = fVar420 * fVar253;
    auVar54._0_4_ = fVar411 * fVar249;
    fVar284 = auVar37._8_4_;
    auVar54._8_4_ = fVar421 * fVar284;
    fVar328 = auVar37._12_4_;
    auVar54._12_4_ = fVar422 * fVar328;
    fVar349 = auVar37._16_4_;
    auVar54._16_4_ = fVar423 * fVar349;
    fVar372 = auVar37._20_4_;
    auVar54._20_4_ = fVar424 * fVar372;
    fVar40 = auVar37._24_4_;
    auVar54._24_4_ = fVar425 * fVar40;
    auVar54._28_4_ = auVar141._28_4_;
    auVar34 = vsubps_avx(auVar54,auVar53);
    auVar105._4_4_ = fStack_85c;
    auVar105._0_4_ = local_860;
    auVar105._8_4_ = fStack_858;
    auVar105._12_4_ = fStack_854;
    auVar105._16_4_ = fStack_850;
    auVar105._20_4_ = fStack_84c;
    auVar105._24_4_ = fStack_848;
    auVar105._28_4_ = fStack_844;
    auVar141 = vperm2f128_avx(auVar105,auVar105,1);
    auVar141 = vshufps_avx(auVar141,auVar105,0x30);
    auVar36 = vshufps_avx(auVar105,auVar141,0x29);
    auVar38 = vsubps_avx(auVar36,auVar105);
    auVar55._4_4_ = fVar436 * fVar253;
    auVar55._0_4_ = fVar427 * fVar249;
    auVar55._8_4_ = fVar437 * fVar284;
    auVar55._12_4_ = fVar438 * fVar328;
    auVar55._16_4_ = fVar439 * fVar349;
    auVar55._20_4_ = fVar440 * fVar372;
    auVar55._24_4_ = fVar441 * fVar40;
    auVar55._28_4_ = auVar36._28_4_;
    fVar195 = auVar38._0_4_;
    fVar254 = auVar38._4_4_;
    auVar56._4_4_ = fVar384 * fVar254;
    auVar56._0_4_ = fVar374 * fVar195;
    fVar300 = auVar38._8_4_;
    auVar56._8_4_ = fVar386 * fVar300;
    fVar330 = auVar38._12_4_;
    auVar56._12_4_ = fVar388 * fVar330;
    fVar351 = auVar38._16_4_;
    auVar56._16_4_ = fVar390 * fVar351;
    fVar373 = auVar38._20_4_;
    auVar56._20_4_ = fVar392 * fVar373;
    fVar41 = auVar38._24_4_;
    auVar56._24_4_ = fVar394 * fVar41;
    auVar56._28_4_ = local_880._28_4_;
    auVar211 = vsubps_avx(auVar56,auVar55);
    auVar57._4_4_ = fVar420 * fVar254;
    auVar57._0_4_ = fVar411 * fVar195;
    auVar57._8_4_ = fVar421 * fVar300;
    auVar57._12_4_ = fVar422 * fVar330;
    auVar57._16_4_ = fVar423 * fVar351;
    auVar57._20_4_ = fVar424 * fVar373;
    auVar57._24_4_ = fVar425 * fVar41;
    auVar57._28_4_ = local_880._28_4_;
    auVar58._4_4_ = fVar436 * fVar252;
    auVar58._0_4_ = fVar427 * fVar169;
    auVar58._8_4_ = fVar437 * fVar281;
    auVar58._12_4_ = fVar438 * fVar327;
    auVar58._16_4_ = fVar439 * fVar347;
    auVar58._20_4_ = fVar440 * fVar371;
    auVar58._24_4_ = fVar441 * fVar39;
    auVar58._28_4_ = fVar410;
    auVar46 = vsubps_avx(auVar58,auVar57);
    fVar226 = auVar46._28_4_;
    auVar182._0_4_ = fVar195 * fVar195 + fVar169 * fVar169 + fVar249 * fVar249;
    auVar182._4_4_ = fVar254 * fVar254 + fVar252 * fVar252 + fVar253 * fVar253;
    auVar182._8_4_ = fVar300 * fVar300 + fVar281 * fVar281 + fVar284 * fVar284;
    auVar182._12_4_ = fVar330 * fVar330 + fVar327 * fVar327 + fVar328 * fVar328;
    auVar182._16_4_ = fVar351 * fVar351 + fVar347 * fVar347 + fVar349 * fVar349;
    auVar182._20_4_ = fVar373 * fVar373 + fVar371 * fVar371 + fVar372 * fVar372;
    auVar182._24_4_ = fVar41 * fVar41 + fVar39 * fVar39 + fVar40 * fVar40;
    auVar182._28_4_ = fVar226 + fVar226 + auVar34._28_4_;
    auVar141 = vrcpps_avx(auVar182);
    fVar303 = auVar141._0_4_;
    fVar304 = auVar141._4_4_;
    auVar59._4_4_ = fVar304 * auVar182._4_4_;
    auVar59._0_4_ = fVar303 * auVar182._0_4_;
    fVar306 = auVar141._8_4_;
    auVar59._8_4_ = fVar306 * auVar182._8_4_;
    fVar333 = auVar141._12_4_;
    auVar59._12_4_ = fVar333 * auVar182._12_4_;
    fVar342 = auVar141._16_4_;
    auVar59._16_4_ = fVar342 * auVar182._16_4_;
    fVar343 = auVar141._20_4_;
    auVar59._20_4_ = fVar343 * auVar182._20_4_;
    fVar345 = auVar141._24_4_;
    auVar59._24_4_ = fVar345 * auVar182._24_4_;
    auVar59._28_4_ = fVar410;
    auVar146._8_4_ = 0x3f800000;
    auVar146._0_8_ = 0x3f8000003f800000;
    auVar146._12_4_ = 0x3f800000;
    auVar146._16_4_ = 0x3f800000;
    auVar146._20_4_ = 0x3f800000;
    auVar146._24_4_ = 0x3f800000;
    auVar146._28_4_ = 0x3f800000;
    auVar47 = vsubps_avx(auVar146,auVar59);
    fVar303 = auVar47._0_4_ * fVar303 + fVar303;
    fVar304 = auVar47._4_4_ * fVar304 + fVar304;
    fVar306 = auVar47._8_4_ * fVar306 + fVar306;
    fVar333 = auVar47._12_4_ * fVar333 + fVar333;
    fVar342 = auVar47._16_4_ * fVar342 + fVar342;
    fVar343 = auVar47._20_4_ * fVar343 + fVar343;
    fVar345 = auVar47._24_4_ * fVar345 + fVar345;
    auVar186 = vperm2f128_avx(auVar51,auVar51,1);
    auVar186 = vshufps_avx(auVar186,auVar51,0x30);
    local_940 = vshufps_avx(auVar51,auVar186,0x29);
    auVar186 = vperm2f128_avx(local_a60,local_a60,1);
    auVar186 = vshufps_avx(auVar186,local_a60,0x30);
    local_820 = vshufps_avx(local_a60,auVar186,0x29);
    fVar225 = local_820._0_4_;
    fVar269 = local_820._4_4_;
    auVar60._4_4_ = fVar252 * fVar269;
    auVar60._0_4_ = fVar169 * fVar225;
    fVar301 = local_820._8_4_;
    auVar60._8_4_ = fVar281 * fVar301;
    fVar331 = local_820._12_4_;
    auVar60._12_4_ = fVar327 * fVar331;
    fVar353 = local_820._16_4_;
    auVar60._16_4_ = fVar347 * fVar353;
    fVar396 = local_820._20_4_;
    auVar60._20_4_ = fVar371 * fVar396;
    fVar42 = local_820._24_4_;
    auVar60._24_4_ = fVar39 * fVar42;
    auVar60._28_4_ = auVar186._28_4_;
    fVar442 = local_940._0_4_;
    fVar448 = local_940._4_4_;
    auVar61._4_4_ = fVar448 * fVar253;
    auVar61._0_4_ = fVar442 * fVar249;
    fVar449 = local_940._8_4_;
    auVar61._8_4_ = fVar449 * fVar284;
    fVar450 = local_940._12_4_;
    auVar61._12_4_ = fVar450 * fVar328;
    fVar451 = local_940._16_4_;
    auVar61._16_4_ = fVar451 * fVar349;
    fVar452 = local_940._20_4_;
    auVar61._20_4_ = fVar452 * fVar372;
    fVar453 = local_940._24_4_;
    auVar61._24_4_ = fVar453 * fVar40;
    auVar61._28_4_ = uStack_224;
    auVar142 = vsubps_avx(auVar61,auVar60);
    auVar186 = vperm2f128_avx(auVar50,auVar50,1);
    auVar186 = vshufps_avx(auVar186,auVar50,0x30);
    local_8a0 = vshufps_avx(auVar50,auVar186,0x29);
    fVar375 = local_8a0._0_4_;
    fVar385 = local_8a0._4_4_;
    auVar62._4_4_ = fVar385 * fVar253;
    auVar62._0_4_ = fVar375 * fVar249;
    fVar387 = local_8a0._8_4_;
    auVar62._8_4_ = fVar387 * fVar284;
    fVar389 = local_8a0._12_4_;
    auVar62._12_4_ = fVar389 * fVar328;
    fVar391 = local_8a0._16_4_;
    auVar62._16_4_ = fVar391 * fVar349;
    fVar393 = local_8a0._20_4_;
    auVar62._20_4_ = fVar393 * fVar372;
    fVar395 = local_8a0._24_4_;
    auVar62._24_4_ = fVar395 * fVar40;
    auVar62._28_4_ = auVar186._28_4_;
    auVar63._4_4_ = fVar269 * fVar254;
    auVar63._0_4_ = fVar225 * fVar195;
    auVar63._8_4_ = fVar301 * fVar300;
    auVar63._12_4_ = fVar331 * fVar330;
    auVar63._16_4_ = fVar353 * fVar351;
    auVar63._20_4_ = fVar396 * fVar373;
    auVar63._24_4_ = fVar42 * fVar41;
    auVar63._28_4_ = uStack_1c4;
    auVar143 = vsubps_avx(auVar63,auVar62);
    auVar64._4_4_ = fVar448 * fVar254;
    auVar64._0_4_ = fVar442 * fVar195;
    auVar64._8_4_ = fVar449 * fVar300;
    auVar64._12_4_ = fVar450 * fVar330;
    auVar64._16_4_ = fVar451 * fVar351;
    auVar64._20_4_ = fVar452 * fVar373;
    auVar64._24_4_ = fVar453 * fVar41;
    auVar64._28_4_ = uStack_1c4;
    auVar66._4_4_ = fVar385 * fVar252;
    auVar66._0_4_ = fVar375 * fVar169;
    auVar66._8_4_ = fVar387 * fVar281;
    auVar66._12_4_ = fVar389 * fVar327;
    auVar66._16_4_ = fVar391 * fVar347;
    auVar66._20_4_ = fVar393 * fVar371;
    fVar65 = local_940._28_4_;
    auVar66._24_4_ = fVar395 * fVar39;
    auVar66._28_4_ = fVar65;
    auVar186 = vsubps_avx(auVar66,auVar64);
    fVar251 = auVar186._28_4_;
    auVar67._4_4_ =
         (auVar34._4_4_ * auVar34._4_4_ +
         auVar211._4_4_ * auVar211._4_4_ + auVar46._4_4_ * auVar46._4_4_) * fVar304;
    auVar67._0_4_ =
         (auVar34._0_4_ * auVar34._0_4_ +
         auVar211._0_4_ * auVar211._0_4_ + auVar46._0_4_ * auVar46._0_4_) * fVar303;
    auVar67._8_4_ =
         (auVar34._8_4_ * auVar34._8_4_ +
         auVar211._8_4_ * auVar211._8_4_ + auVar46._8_4_ * auVar46._8_4_) * fVar306;
    auVar67._12_4_ =
         (auVar34._12_4_ * auVar34._12_4_ +
         auVar211._12_4_ * auVar211._12_4_ + auVar46._12_4_ * auVar46._12_4_) * fVar333;
    auVar67._16_4_ =
         (auVar34._16_4_ * auVar34._16_4_ +
         auVar211._16_4_ * auVar211._16_4_ + auVar46._16_4_ * auVar46._16_4_) * fVar342;
    auVar67._20_4_ =
         (auVar34._20_4_ * auVar34._20_4_ +
         auVar211._20_4_ * auVar211._20_4_ + auVar46._20_4_ * auVar46._20_4_) * fVar343;
    auVar67._24_4_ =
         (auVar34._24_4_ * auVar34._24_4_ +
         auVar211._24_4_ * auVar211._24_4_ + auVar46._24_4_ * auVar46._24_4_) * fVar345;
    auVar67._28_4_ = auVar34._28_4_ + auVar211._28_4_ + fVar226;
    auVar68._4_4_ =
         (auVar142._4_4_ * auVar142._4_4_ +
         auVar143._4_4_ * auVar143._4_4_ + auVar186._4_4_ * auVar186._4_4_) * fVar304;
    auVar68._0_4_ =
         (auVar142._0_4_ * auVar142._0_4_ +
         auVar143._0_4_ * auVar143._0_4_ + auVar186._0_4_ * auVar186._0_4_) * fVar303;
    auVar68._8_4_ =
         (auVar142._8_4_ * auVar142._8_4_ +
         auVar143._8_4_ * auVar143._8_4_ + auVar186._8_4_ * auVar186._8_4_) * fVar306;
    auVar68._12_4_ =
         (auVar142._12_4_ * auVar142._12_4_ +
         auVar143._12_4_ * auVar143._12_4_ + auVar186._12_4_ * auVar186._12_4_) * fVar333;
    auVar68._16_4_ =
         (auVar142._16_4_ * auVar142._16_4_ +
         auVar143._16_4_ * auVar143._16_4_ + auVar186._16_4_ * auVar186._16_4_) * fVar342;
    auVar68._20_4_ =
         (auVar142._20_4_ * auVar142._20_4_ +
         auVar143._20_4_ * auVar143._20_4_ + auVar186._20_4_ * auVar186._20_4_) * fVar343;
    auVar68._24_4_ =
         (auVar142._24_4_ * auVar142._24_4_ +
         auVar143._24_4_ * auVar143._24_4_ + auVar186._24_4_ * auVar186._24_4_) * fVar345;
    auVar68._28_4_ = auVar47._28_4_ + auVar141._28_4_;
    auVar141 = vmaxps_avx(auVar67,auVar68);
    auVar186 = vperm2f128_avx(_local_b00,_local_b00,1);
    auVar186 = vshufps_avx(auVar186,_local_b00,0x30);
    auVar211 = vshufps_avx(_local_b00,auVar186,0x29);
    auVar147._0_4_ = (float)local_b00._0_4_ + fVar273;
    auVar147._4_4_ = (float)local_b00._4_4_ + fVar275;
    auVar147._8_4_ = fStack_af8 + fVar278;
    auVar147._12_4_ = fStack_af4 + fVar271;
    auVar147._16_4_ = fStack_af0 + fVar223;
    auVar147._20_4_ = fStack_aec + fVar250;
    auVar147._24_4_ = fStack_ae8 + fVar224;
    auVar147._28_4_ = fStack_ae4 + fVar302;
    auVar186 = vmaxps_avx(_local_b00,auVar147);
    auVar34 = vmaxps_avx(auVar183,auVar211);
    auVar186 = vmaxps_avx(auVar186,auVar34);
    auVar34 = vrsqrtps_avx(auVar182);
    fVar226 = auVar34._0_4_;
    fVar223 = auVar34._4_4_;
    fVar250 = auVar34._8_4_;
    fVar224 = auVar34._12_4_;
    fVar271 = auVar34._16_4_;
    fVar273 = auVar34._20_4_;
    fVar275 = auVar34._24_4_;
    auVar69._4_4_ = fVar223 * fVar223 * fVar223 * auVar182._4_4_ * 0.5;
    auVar69._0_4_ = fVar226 * fVar226 * fVar226 * auVar182._0_4_ * 0.5;
    auVar69._8_4_ = fVar250 * fVar250 * fVar250 * auVar182._8_4_ * 0.5;
    auVar69._12_4_ = fVar224 * fVar224 * fVar224 * auVar182._12_4_ * 0.5;
    auVar69._16_4_ = fVar271 * fVar271 * fVar271 * auVar182._16_4_ * 0.5;
    auVar69._20_4_ = fVar273 * fVar273 * fVar273 * auVar182._20_4_ * 0.5;
    auVar69._24_4_ = fVar275 * fVar275 * fVar275 * auVar182._24_4_ * 0.5;
    auVar69._28_4_ = auVar182._28_4_;
    auVar70._4_4_ = fVar223 * 1.5;
    auVar70._0_4_ = fVar226 * 1.5;
    auVar70._8_4_ = fVar250 * 1.5;
    auVar70._12_4_ = fVar224 * 1.5;
    auVar70._16_4_ = fVar271 * 1.5;
    auVar70._20_4_ = fVar273 * 1.5;
    auVar70._24_4_ = fVar275 * 1.5;
    auVar70._28_4_ = auVar34._28_4_;
    auVar46 = vsubps_avx(auVar70,auVar69);
    auVar104._4_4_ = fVar156;
    auVar104._0_4_ = fVar127;
    auVar104._8_4_ = fVar157;
    auVar104._12_4_ = fVar159;
    auVar104._16_4_ = fVar161;
    auVar104._20_4_ = fVar163;
    auVar104._24_4_ = fVar165;
    auVar104._28_4_ = fVar167;
    _local_a80 = vsubps_avx(ZEXT832(0) << 0x20,auVar104);
    local_780 = vsubps_avx(ZEXT832(0) << 0x20,auVar108);
    fVar223 = local_780._0_4_;
    fVar271 = local_780._4_4_;
    fVar302 = local_780._8_4_;
    fVar333 = local_780._12_4_;
    fVar364 = local_780._16_4_;
    fVar397 = local_780._20_4_;
    fVar43 = local_780._24_4_;
    auVar33._4_4_ = fStack_5bc;
    auVar33._0_4_ = local_5c0;
    auVar33._8_4_ = fStack_5b8;
    auVar33._12_4_ = fStack_5b4;
    auVar33._16_4_ = fStack_5b0;
    auVar33._20_4_ = fStack_5ac;
    auVar33._24_4_ = fStack_5a8;
    auVar33._28_4_ = fStack_5a4;
    fVar250 = local_a80._0_4_;
    fVar273 = local_a80._4_4_;
    fVar303 = local_a80._8_4_;
    fVar342 = local_a80._12_4_;
    fVar366 = local_a80._16_4_;
    fVar410 = local_a80._20_4_;
    fVar44 = local_a80._24_4_;
    auVar47 = vsubps_avx(ZEXT832(0) << 0x20,auVar105);
    fVar224 = auVar47._0_4_;
    fVar275 = auVar47._4_4_;
    fVar304 = auVar47._8_4_;
    fVar343 = auVar47._12_4_;
    fVar368 = auVar47._16_4_;
    fVar426 = auVar47._20_4_;
    fVar45 = auVar47._24_4_;
    auVar402._0_4_ = local_5a0 * fVar224 + local_5c0 * fVar250 + local_5e0 * fVar223;
    auVar402._4_4_ = fStack_59c * fVar275 + fStack_5bc * fVar273 + fStack_5dc * fVar271;
    auVar402._8_4_ = fStack_598 * fVar304 + fStack_5b8 * fVar303 + fStack_5d8 * fVar302;
    auVar402._12_4_ = fStack_594 * fVar343 + fStack_5b4 * fVar342 + fStack_5d4 * fVar333;
    auVar402._16_4_ = fStack_590 * fVar368 + fStack_5b0 * fVar366 + fStack_5d0 * fVar364;
    auVar402._20_4_ = fStack_58c * fVar426 + fStack_5ac * fVar410 + fStack_5cc * fVar397;
    auVar402._24_4_ = fStack_588 * fVar45 + fStack_5a8 * fVar44 + fStack_5c8 * fVar43;
    auVar402._28_4_ = fVar251 + auVar142._28_4_ + auVar143._28_4_ + fVar251 + auVar34._28_4_;
    auVar432._0_4_ = fVar224 * fVar224 + fVar250 * fVar250 + fVar223 * fVar223;
    auVar432._4_4_ = fVar275 * fVar275 + fVar273 * fVar273 + fVar271 * fVar271;
    auVar432._8_4_ = fVar304 * fVar304 + fVar303 * fVar303 + fVar302 * fVar302;
    auVar432._12_4_ = fVar343 * fVar343 + fVar342 * fVar342 + fVar333 * fVar333;
    auVar432._16_4_ = fVar368 * fVar368 + fVar366 * fVar366 + fVar364 * fVar364;
    auVar432._20_4_ = fVar426 * fVar426 + fVar410 * fVar410 + fVar397 * fVar397;
    auVar432._24_4_ = fVar45 * fVar45 + fVar44 * fVar44 + fVar43 * fVar43;
    auVar432._28_4_ = fVar65 + fVar65 + fVar251;
    fVar251 = auVar46._0_4_;
    fVar278 = auVar46._4_4_;
    fVar306 = auVar46._8_4_;
    fVar345 = auVar46._12_4_;
    fVar370 = auVar46._16_4_;
    fVar305 = auVar46._20_4_;
    fVar307 = auVar46._24_4_;
    fVar226 = auVar37._28_4_;
    fVar255 = local_5a0 * fVar195 * fVar251 +
              local_5c0 * fVar169 * fVar251 + fVar249 * fVar251 * local_5e0;
    fVar270 = fStack_59c * fVar254 * fVar278 +
              fStack_5bc * fVar252 * fVar278 + fVar253 * fVar278 * fStack_5dc;
    fVar272 = fStack_598 * fVar300 * fVar306 +
              fStack_5b8 * fVar281 * fVar306 + fVar284 * fVar306 * fStack_5d8;
    fVar274 = fStack_594 * fVar330 * fVar345 +
              fStack_5b4 * fVar327 * fVar345 + fVar328 * fVar345 * fStack_5d4;
    fVar276 = fStack_590 * fVar351 * fVar370 +
              fStack_5b0 * fVar347 * fVar370 + fVar349 * fVar370 * fStack_5d0;
    fVar279 = fStack_58c * fVar373 * fVar305 +
              fStack_5ac * fVar371 * fVar305 + fVar372 * fVar305 * fStack_5cc;
    fVar282 = fStack_588 * fVar41 * fVar307 +
              fStack_5a8 * fVar39 * fVar307 + fVar40 * fVar307 * fStack_5c8;
    fVar308 = auVar46._28_4_ + fVar226 + 0.0;
    local_8c0._0_4_ =
         fVar224 * fVar195 * fVar251 + fVar169 * fVar251 * fVar250 + fVar249 * fVar251 * fVar223;
    local_8c0._4_4_ =
         fVar275 * fVar254 * fVar278 + fVar252 * fVar278 * fVar273 + fVar253 * fVar278 * fVar271;
    fStack_8b8 = fVar304 * fVar300 * fVar306 +
                 fVar281 * fVar306 * fVar303 + fVar284 * fVar306 * fVar302;
    fStack_8b4 = fVar343 * fVar330 * fVar345 +
                 fVar327 * fVar345 * fVar342 + fVar328 * fVar345 * fVar333;
    fStack_8b0 = fVar368 * fVar351 * fVar370 +
                 fVar347 * fVar370 * fVar366 + fVar349 * fVar370 * fVar364;
    fStack_8ac = fVar426 * fVar373 * fVar305 +
                 fVar371 * fVar305 * fVar410 + fVar372 * fVar305 * fVar397;
    fStack_8a8 = fVar45 * fVar41 * fVar307 + fVar39 * fVar307 * fVar44 + fVar40 * fVar307 * fVar43;
    fStack_8a4 = fVar226 + fVar308;
    auVar71._4_4_ = (float)local_8c0._4_4_ * fVar270;
    auVar71._0_4_ = (float)local_8c0._0_4_ * fVar255;
    auVar71._8_4_ = fStack_8b8 * fVar272;
    auVar71._12_4_ = fStack_8b4 * fVar274;
    auVar71._16_4_ = fStack_8b0 * fVar276;
    auVar71._20_4_ = fStack_8ac * fVar279;
    auVar71._24_4_ = fStack_8a8 * fVar282;
    auVar71._28_4_ = fVar308;
    auVar37 = vsubps_avx(auVar402,auVar71);
    auVar72._4_4_ = (float)local_8c0._4_4_ * (float)local_8c0._4_4_;
    auVar72._0_4_ = (float)local_8c0._0_4_ * (float)local_8c0._0_4_;
    auVar72._8_4_ = fStack_8b8 * fStack_8b8;
    auVar72._12_4_ = fStack_8b4 * fStack_8b4;
    auVar72._16_4_ = fStack_8b0 * fStack_8b0;
    auVar72._20_4_ = fStack_8ac * fStack_8ac;
    auVar72._24_4_ = fStack_8a8 * fStack_8a8;
    auVar72._28_4_ = fVar226;
    auVar142 = vsubps_avx(auVar432,auVar72);
    auVar34 = vsqrtps_avx(auVar141);
    fVar226 = (auVar186._0_4_ + auVar34._0_4_) * 1.0000002;
    fVar308 = (auVar186._4_4_ + auVar34._4_4_) * 1.0000002;
    fVar158 = (auVar186._8_4_ + auVar34._8_4_) * 1.0000002;
    fVar160 = (auVar186._12_4_ + auVar34._12_4_) * 1.0000002;
    fVar162 = (auVar186._16_4_ + auVar34._16_4_) * 1.0000002;
    fVar164 = (auVar186._20_4_ + auVar34._20_4_) * 1.0000002;
    fVar166 = (auVar186._24_4_ + auVar34._24_4_) * 1.0000002;
    auVar73._4_4_ = fVar308 * fVar308;
    auVar73._0_4_ = fVar226 * fVar226;
    auVar73._8_4_ = fVar158 * fVar158;
    auVar73._12_4_ = fVar160 * fVar160;
    auVar73._16_4_ = fVar162 * fVar162;
    auVar73._20_4_ = fVar164 * fVar164;
    auVar73._24_4_ = fVar166 * fVar166;
    auVar73._28_4_ = auVar186._28_4_ + auVar34._28_4_;
    fVar308 = auVar37._0_4_ + auVar37._0_4_;
    fVar158 = auVar37._4_4_ + auVar37._4_4_;
    local_320._0_8_ = CONCAT44(fVar158,fVar308);
    local_320._8_4_ = auVar37._8_4_ + auVar37._8_4_;
    local_320._12_4_ = auVar37._12_4_ + auVar37._12_4_;
    local_320._16_4_ = auVar37._16_4_ + auVar37._16_4_;
    local_320._20_4_ = auVar37._20_4_ + auVar37._20_4_;
    local_320._24_4_ = auVar37._24_4_ + auVar37._24_4_;
    local_320._28_4_ = auVar37._28_4_ + auVar37._28_4_;
    auVar186 = vsubps_avx(auVar142,auVar73);
    auVar435 = ZEXT3264(auVar186);
    local_300._4_4_ = fVar270 * fVar270;
    local_300._0_4_ = fVar255 * fVar255;
    local_300._8_4_ = fVar272 * fVar272;
    local_300._12_4_ = fVar274 * fVar274;
    local_300._16_4_ = fVar276 * fVar276;
    local_300._20_4_ = fVar279 * fVar279;
    local_300._24_4_ = fVar282 * fVar282;
    local_300._28_4_ = fStack_584;
    local_4c0 = vsubps_avx(local_2a0,local_300);
    auVar74._4_4_ = fVar158 * fVar158;
    auVar74._0_4_ = fVar308 * fVar308;
    auVar74._8_4_ = local_320._8_4_ * local_320._8_4_;
    auVar74._12_4_ = local_320._12_4_ * local_320._12_4_;
    auVar74._16_4_ = local_320._16_4_ * local_320._16_4_;
    auVar74._20_4_ = local_320._20_4_ * local_320._20_4_;
    auVar74._24_4_ = local_320._24_4_ * local_320._24_4_;
    auVar74._28_4_ = auVar46._28_4_;
    fVar160 = local_4c0._0_4_;
    fVar162 = local_4c0._4_4_;
    fVar164 = local_4c0._8_4_;
    fVar166 = local_4c0._12_4_;
    fVar277 = local_4c0._16_4_;
    fVar280 = local_4c0._20_4_;
    fVar283 = local_4c0._24_4_;
    auVar75._4_4_ = auVar186._4_4_ * fVar162 * 4.0;
    auVar75._0_4_ = auVar186._0_4_ * fVar160 * 4.0;
    auVar75._8_4_ = auVar186._8_4_ * fVar164 * 4.0;
    auVar75._12_4_ = auVar186._12_4_ * fVar166 * 4.0;
    auVar75._16_4_ = auVar186._16_4_ * fVar277 * 4.0;
    auVar75._20_4_ = auVar186._20_4_ * fVar280 * 4.0;
    auVar75._24_4_ = auVar186._24_4_ * fVar283 * 4.0;
    auVar75._28_4_ = 0x40800000;
    auVar37 = vsubps_avx(auVar74,auVar75);
    auVar409 = ZEXT3264(auVar37);
    auVar141 = vcmpps_avx(auVar37,ZEXT832(0) << 0x20,5);
    fVar226 = local_4c0._28_4_;
    if ((((((((auVar141 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar141 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar141 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar141 >> 0x7f,0) == '\0') &&
          (auVar141 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar141 >> 0xbf,0) == '\0') &&
        (auVar141 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar141[0x1f])
    {
      auVar445._8_4_ = 0x7f800000;
      auVar445._0_8_ = 0x7f8000007f800000;
      auVar445._12_4_ = 0x7f800000;
      auVar445._16_4_ = 0x7f800000;
      auVar445._20_4_ = 0x7f800000;
      auVar445._24_4_ = 0x7f800000;
      auVar445._28_4_ = 0x7f800000;
      auVar417._8_4_ = 0xff800000;
      auVar417._0_8_ = 0xff800000ff800000;
      auVar417._12_4_ = 0xff800000;
      auVar417._16_4_ = 0xff800000;
      auVar417._20_4_ = 0xff800000;
      auVar417._24_4_ = 0xff800000;
      auVar417._28_4_ = 0xff800000;
      auVar316 = local_2a0;
    }
    else {
      auVar33 = vcmpps_avx(auVar37,ZEXT832(0) << 0x20,5);
      auVar46 = vsqrtps_avx(auVar37);
      auVar315._0_4_ = fVar160 + fVar160;
      auVar315._4_4_ = fVar162 + fVar162;
      auVar315._8_4_ = fVar164 + fVar164;
      auVar315._12_4_ = fVar166 + fVar166;
      auVar315._16_4_ = fVar277 + fVar277;
      auVar315._20_4_ = fVar280 + fVar280;
      auVar315._24_4_ = fVar283 + fVar283;
      auVar315._28_4_ = fVar226 + fVar226;
      auVar37 = vrcpps_avx(auVar315);
      fVar309 = auVar37._0_4_;
      fVar323 = auVar37._4_4_;
      auVar76._4_4_ = auVar315._4_4_ * fVar323;
      auVar76._0_4_ = auVar315._0_4_ * fVar309;
      fVar324 = auVar37._8_4_;
      auVar76._8_4_ = auVar315._8_4_ * fVar324;
      fVar325 = auVar37._12_4_;
      auVar76._12_4_ = auVar315._12_4_ * fVar325;
      fVar326 = auVar37._16_4_;
      auVar76._16_4_ = auVar315._16_4_ * fVar326;
      fVar329 = auVar37._20_4_;
      auVar76._20_4_ = auVar315._20_4_ * fVar329;
      fVar332 = auVar37._24_4_;
      auVar76._24_4_ = auVar315._24_4_ * fVar332;
      auVar76._28_4_ = auVar315._28_4_;
      auVar403._8_4_ = 0x3f800000;
      auVar403._0_8_ = 0x3f8000003f800000;
      auVar403._12_4_ = 0x3f800000;
      auVar403._16_4_ = 0x3f800000;
      auVar403._20_4_ = 0x3f800000;
      auVar403._24_4_ = 0x3f800000;
      auVar403._28_4_ = 0x3f800000;
      auVar143 = vsubps_avx(auVar403,auVar76);
      fVar309 = fVar309 + fVar309 * auVar143._0_4_;
      fVar323 = fVar323 + fVar323 * auVar143._4_4_;
      fVar324 = fVar324 + fVar324 * auVar143._8_4_;
      fVar325 = fVar325 + fVar325 * auVar143._12_4_;
      fVar326 = fVar326 + fVar326 * auVar143._16_4_;
      fVar329 = fVar329 + fVar329 * auVar143._20_4_;
      fVar332 = fVar332 + fVar332 * auVar143._24_4_;
      auVar339._0_8_ = CONCAT44(fVar158,fVar308) ^ 0x8000000080000000;
      auVar339._8_4_ = -local_320._8_4_;
      auVar339._12_4_ = -local_320._12_4_;
      auVar339._16_4_ = -local_320._16_4_;
      auVar339._20_4_ = -local_320._20_4_;
      auVar339._24_4_ = -local_320._24_4_;
      auVar339._28_4_ = -local_320._28_4_;
      auVar179 = vsubps_avx(auVar339,auVar46);
      fVar308 = auVar179._0_4_ * fVar309;
      fVar158 = auVar179._4_4_ * fVar323;
      auVar77._4_4_ = fVar158;
      auVar77._0_4_ = fVar308;
      fVar344 = auVar179._8_4_ * fVar324;
      auVar77._8_4_ = fVar344;
      fVar346 = auVar179._12_4_ * fVar325;
      auVar77._12_4_ = fVar346;
      fVar348 = auVar179._16_4_ * fVar326;
      auVar77._16_4_ = fVar348;
      fVar350 = auVar179._20_4_ * fVar329;
      auVar77._20_4_ = fVar350;
      fVar352 = auVar179._24_4_ * fVar332;
      auVar77._24_4_ = fVar352;
      auVar77._28_4_ = auVar179._28_4_;
      auVar46 = vsubps_avx(auVar46,local_320);
      fVar309 = auVar46._0_4_ * fVar309;
      fVar323 = auVar46._4_4_ * fVar323;
      auVar78._4_4_ = fVar323;
      auVar78._0_4_ = fVar309;
      fVar324 = auVar46._8_4_ * fVar324;
      auVar78._8_4_ = fVar324;
      fVar325 = auVar46._12_4_ * fVar325;
      auVar78._12_4_ = fVar325;
      fVar326 = auVar46._16_4_ * fVar326;
      auVar78._16_4_ = fVar326;
      fVar329 = auVar46._20_4_ * fVar329;
      auVar78._20_4_ = fVar329;
      fVar332 = auVar46._24_4_ * fVar332;
      auVar78._24_4_ = fVar332;
      auVar78._28_4_ = auVar46._28_4_;
      fStack_6a4 = fStack_8a4 + auVar37._28_4_ + auVar143._28_4_;
      local_6c0 = fVar251 * ((float)local_8c0._0_4_ + fVar255 * fVar308);
      fStack_6bc = fVar278 * ((float)local_8c0._4_4_ + fVar270 * fVar158);
      fStack_6b8 = fVar306 * (fStack_8b8 + fVar272 * fVar344);
      fStack_6b4 = fVar345 * (fStack_8b4 + fVar274 * fVar346);
      fStack_6b0 = fVar370 * (fStack_8b0 + fVar276 * fVar348);
      fStack_6ac = fVar305 * (fStack_8ac + fVar279 * fVar350);
      fStack_6a8 = fVar307 * (fStack_8a8 + fVar282 * fVar352);
      auVar404._8_4_ = 0x7fffffff;
      auVar404._0_8_ = 0x7fffffff7fffffff;
      auVar404._12_4_ = 0x7fffffff;
      auVar404._16_4_ = 0x7fffffff;
      auVar404._20_4_ = 0x7fffffff;
      auVar404._24_4_ = 0x7fffffff;
      auVar404._28_4_ = 0x7fffffff;
      auVar37 = vandps_avx(local_300,auVar404);
      auVar46 = vmaxps_avx(local_4a0,auVar37);
      auVar79._4_4_ = auVar46._4_4_ * 1.9073486e-06;
      auVar79._0_4_ = auVar46._0_4_ * 1.9073486e-06;
      auVar79._8_4_ = auVar46._8_4_ * 1.9073486e-06;
      auVar79._12_4_ = auVar46._12_4_ * 1.9073486e-06;
      auVar79._16_4_ = auVar46._16_4_ * 1.9073486e-06;
      auVar79._20_4_ = auVar46._20_4_ * 1.9073486e-06;
      auVar79._24_4_ = auVar46._24_4_ * 1.9073486e-06;
      auVar79._28_4_ = auVar46._28_4_;
      auVar37 = vandps_avx(auVar404,local_4c0);
      auVar37 = vcmpps_avx(auVar37,auVar79,1);
      auVar409 = ZEXT3264(auVar37);
      auVar418._8_4_ = 0x7f800000;
      auVar418._0_8_ = 0x7f8000007f800000;
      auVar418._12_4_ = 0x7f800000;
      auVar418._16_4_ = 0x7f800000;
      auVar418._20_4_ = 0x7f800000;
      auVar418._24_4_ = 0x7f800000;
      auVar418._28_4_ = 0x7f800000;
      auVar445 = vblendvps_avx(auVar418,auVar77,auVar33);
      local_2e0 = fVar251 * ((float)local_8c0._0_4_ + fVar255 * fVar309);
      fStack_2dc = fVar278 * ((float)local_8c0._4_4_ + fVar270 * fVar323);
      fStack_2d8 = fVar306 * (fStack_8b8 + fVar272 * fVar324);
      fStack_2d4 = fVar345 * (fStack_8b4 + fVar274 * fVar325);
      fStack_2d0 = fVar370 * (fStack_8b0 + fVar276 * fVar326);
      fStack_2cc = fVar305 * (fStack_8ac + fVar279 * fVar329);
      fStack_2c8 = fVar307 * (fStack_8a8 + fVar282 * fVar332);
      fStack_2c4 = fStack_8a4 + auVar46._28_4_;
      auVar316._8_4_ = 0xff800000;
      auVar316._0_8_ = 0xff800000ff800000;
      auVar316._12_4_ = 0xff800000;
      auVar316._16_4_ = 0xff800000;
      auVar316._20_4_ = 0xff800000;
      auVar316._24_4_ = 0xff800000;
      auVar316._28_4_ = 0xff800000;
      auVar417 = vblendvps_avx(auVar316,auVar78,auVar33);
      auVar46 = auVar33 & auVar37;
      if ((((((((auVar46 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar46 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar46 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar46 >> 0x7f,0) != '\0') ||
            (auVar46 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar46 >> 0xbf,0) != '\0') ||
          (auVar46 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar46[0x1f] < '\0') {
        auVar141 = vandps_avx(auVar37,auVar33);
        auVar232 = vpackssdw_avx(auVar141._0_16_,auVar141._16_16_);
        auVar316 = vcmpps_avx(auVar186,ZEXT832(0) << 0x20,2);
        auVar455._8_4_ = 0xff800000;
        auVar455._0_8_ = 0xff800000ff800000;
        auVar455._12_4_ = 0xff800000;
        auVar455._16_4_ = 0xff800000;
        auVar455._20_4_ = 0xff800000;
        auVar455._24_4_ = 0xff800000;
        auVar455._28_4_ = 0xff800000;
        auVar434._8_4_ = 0x7f800000;
        auVar434._0_8_ = 0x7f8000007f800000;
        auVar434._12_4_ = 0x7f800000;
        auVar434._16_4_ = 0x7f800000;
        auVar434._20_4_ = 0x7f800000;
        auVar434._24_4_ = 0x7f800000;
        auVar434._28_4_ = 0x7f800000;
        auVar435 = ZEXT3264(auVar434);
        auVar186 = vblendvps_avx(auVar434,auVar455,auVar316);
        auVar238 = vpmovsxwd_avx(auVar232);
        auVar409 = ZEXT1664(auVar238);
        auVar232 = vpunpckhwd_avx(auVar232,auVar232);
        auVar298._16_16_ = auVar232;
        auVar298._0_16_ = auVar238;
        auVar445 = vblendvps_avx(auVar445,auVar186,auVar298);
        auVar186 = vblendvps_avx(auVar455,auVar434,auVar316);
        auVar417 = vblendvps_avx(auVar417,auVar186,auVar298);
        auVar186 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar154._0_4_ = auVar141._0_4_ ^ auVar186._0_4_;
        auVar154._4_4_ = auVar141._4_4_ ^ auVar186._4_4_;
        auVar154._8_4_ = auVar141._8_4_ ^ auVar186._8_4_;
        auVar154._12_4_ = auVar141._12_4_ ^ auVar186._12_4_;
        auVar154._16_4_ = auVar141._16_4_ ^ auVar186._16_4_;
        auVar154._20_4_ = auVar141._20_4_ ^ auVar186._20_4_;
        auVar154._24_4_ = auVar141._24_4_ ^ auVar186._24_4_;
        auVar154._28_4_ = auVar141._28_4_ ^ auVar186._28_4_;
        auVar141 = vorps_avx(auVar316,auVar154);
        auVar141 = vandps_avx(auVar33,auVar141);
      }
    }
    auVar419 = ZEXT3264(auVar417);
    auVar322 = ZEXT3264(auVar316);
    auVar383 = ZEXT3264(auVar33);
    auVar299 = ZEXT3264(local_480);
    auVar186 = local_480 & auVar141;
    auVar341 = ZEXT3264(local_aa0);
    if ((((((((auVar186 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar186 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar186 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar186 >> 0x7f,0) != '\0') ||
          (auVar186 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar186 >> 0xbf,0) != '\0') ||
        (auVar186 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar186[0x1f] < '\0') {
      auVar232 = ZEXT416((uint)((ray->org).field_0.m128[3] - (float)local_7e0._0_4_));
      auVar232 = vshufps_avx(auVar232,auVar232,0);
      auVar292._16_16_ = auVar232;
      auVar292._0_16_ = auVar232;
      auVar46 = vmaxps_avx(auVar292,auVar445);
      auVar232 = ZEXT416((uint)(ray->tfar - (float)local_7e0._0_4_));
      auVar232 = vshufps_avx(auVar232,auVar232,0);
      auVar293._16_16_ = auVar232;
      auVar293._0_16_ = auVar232;
      auVar143 = vminps_avx(auVar293,auVar417);
      fVar329 = auVar142._28_4_;
      auVar210._0_4_ = local_5a0 * fVar427 + local_5c0 * fVar411 + local_5e0 * fVar374;
      auVar210._4_4_ = fStack_59c * fVar436 + fStack_5bc * fVar420 + fStack_5dc * fVar384;
      auVar210._8_4_ = fStack_598 * fVar437 + fStack_5b8 * fVar421 + fStack_5d8 * fVar386;
      auVar210._12_4_ = fStack_594 * fVar438 + fStack_5b4 * fVar422 + fStack_5d4 * fVar388;
      auVar210._16_4_ = fStack_590 * fVar439 + fStack_5b0 * fVar423 + fStack_5d0 * fVar390;
      auVar210._20_4_ = fStack_58c * fVar440 + fStack_5ac * fVar424 + fStack_5cc * fVar392;
      auVar210._24_4_ = fStack_588 * fVar441 + fStack_5a8 * fVar425 + fStack_5c8 * fVar394;
      auVar210._28_4_ = fVar329 + fVar329 + auVar47._28_4_;
      auVar186 = vrcpps_avx(auVar210);
      fVar308 = auVar186._0_4_;
      fVar158 = auVar186._4_4_;
      auVar80._4_4_ = auVar210._4_4_ * fVar158;
      auVar80._0_4_ = auVar210._0_4_ * fVar308;
      fVar309 = auVar186._8_4_;
      auVar80._8_4_ = auVar210._8_4_ * fVar309;
      fVar323 = auVar186._12_4_;
      auVar80._12_4_ = auVar210._12_4_ * fVar323;
      fVar324 = auVar186._16_4_;
      auVar80._16_4_ = auVar210._16_4_ * fVar324;
      fVar325 = auVar186._20_4_;
      auVar80._20_4_ = auVar210._20_4_ * fVar325;
      fVar326 = auVar186._24_4_;
      auVar80._24_4_ = auVar210._24_4_ * fVar326;
      auVar80._28_4_ = uStack_1c4;
      auVar405._8_4_ = 0x3f800000;
      auVar405._0_8_ = 0x3f8000003f800000;
      auVar405._12_4_ = 0x3f800000;
      auVar405._16_4_ = 0x3f800000;
      auVar405._20_4_ = 0x3f800000;
      auVar405._24_4_ = 0x3f800000;
      auVar405._28_4_ = 0x3f800000;
      auVar37 = vsubps_avx(auVar405,auVar80);
      auVar340._8_4_ = 0x7fffffff;
      auVar340._0_8_ = 0x7fffffff7fffffff;
      auVar340._12_4_ = 0x7fffffff;
      auVar340._16_4_ = 0x7fffffff;
      auVar340._20_4_ = 0x7fffffff;
      auVar340._24_4_ = 0x7fffffff;
      auVar340._28_4_ = 0x7fffffff;
      auVar186 = vandps_avx(auVar210,auVar340);
      auVar382._8_4_ = 0x219392ef;
      auVar382._0_8_ = 0x219392ef219392ef;
      auVar382._12_4_ = 0x219392ef;
      auVar382._16_4_ = 0x219392ef;
      auVar382._20_4_ = 0x219392ef;
      auVar382._24_4_ = 0x219392ef;
      auVar382._28_4_ = 0x219392ef;
      auVar383 = ZEXT3264(auVar382);
      auVar186 = vcmpps_avx(auVar186,auVar382,1);
      auVar81._4_4_ =
           (fVar158 + fVar158 * auVar37._4_4_) *
           -(fVar436 * fVar275 + fVar420 * fVar273 + fVar384 * fVar271);
      auVar81._0_4_ =
           (fVar308 + fVar308 * auVar37._0_4_) *
           -(fVar427 * fVar224 + fVar411 * fVar250 + fVar374 * fVar223);
      auVar81._8_4_ =
           (fVar309 + fVar309 * auVar37._8_4_) *
           -(fVar437 * fVar304 + fVar421 * fVar303 + fVar386 * fVar302);
      auVar81._12_4_ =
           (fVar323 + fVar323 * auVar37._12_4_) *
           -(fVar438 * fVar343 + fVar422 * fVar342 + fVar388 * fVar333);
      auVar81._16_4_ =
           (fVar324 + fVar324 * auVar37._16_4_) *
           -(fVar439 * fVar368 + fVar423 * fVar366 + fVar390 * fVar364);
      auVar81._20_4_ =
           (fVar325 + fVar325 * auVar37._20_4_) *
           -(fVar440 * fVar426 + fVar424 * fVar410 + fVar392 * fVar397);
      auVar81._24_4_ =
           (fVar326 + fVar326 * auVar37._24_4_) *
           -(fVar441 * fVar45 + fVar425 * fVar44 + fVar394 * fVar43);
      auVar81._28_4_ = -(auVar47._28_4_ + local_320._28_4_ + fVar329);
      auVar419 = ZEXT864(0) << 0x40;
      auVar37 = vcmpps_avx(auVar210,ZEXT832(0) << 0x40,1);
      auVar47 = vorps_avx(auVar186,auVar37);
      auVar37 = vcmpps_avx(auVar210,ZEXT832(0) << 0x40,6);
      auVar37 = vorps_avx(auVar186,auVar37);
      auVar446._8_4_ = 0xff800000;
      auVar446._0_8_ = 0xff800000ff800000;
      auVar446._12_4_ = 0xff800000;
      auVar446._16_4_ = 0xff800000;
      auVar446._20_4_ = 0xff800000;
      auVar446._24_4_ = 0xff800000;
      auVar446._28_4_ = 0xff800000;
      auVar186 = vblendvps_avx(auVar81,auVar446,auVar47);
      auVar406._8_4_ = 0x7f800000;
      auVar406._0_8_ = 0x7f8000007f800000;
      auVar406._12_4_ = 0x7f800000;
      auVar406._16_4_ = 0x7f800000;
      auVar406._20_4_ = 0x7f800000;
      auVar406._24_4_ = 0x7f800000;
      auVar406._28_4_ = 0x7f800000;
      auVar409 = ZEXT3264(auVar406);
      auVar37 = vblendvps_avx(auVar81,auVar406,auVar37);
      auVar46 = vmaxps_avx(auVar46,auVar186);
      auVar47 = vminps_avx(auVar143,auVar37);
      auVar181 = ZEXT832(0) << 0x40;
      auVar186 = vsubps_avx(auVar181,local_880);
      auVar37 = vsubps_avx(auVar181,auVar35);
      auVar82._4_4_ = auVar37._4_4_ * -fVar269;
      auVar82._0_4_ = auVar37._0_4_ * -fVar225;
      auVar82._8_4_ = auVar37._8_4_ * -fVar301;
      auVar82._12_4_ = auVar37._12_4_ * -fVar331;
      auVar82._16_4_ = auVar37._16_4_ * -fVar353;
      auVar82._20_4_ = auVar37._20_4_ * -fVar396;
      auVar82._24_4_ = auVar37._24_4_ * -fVar42;
      auVar82._28_4_ = auVar37._28_4_;
      auVar83._4_4_ = fVar448 * auVar186._4_4_;
      auVar83._0_4_ = fVar442 * auVar186._0_4_;
      auVar83._8_4_ = fVar449 * auVar186._8_4_;
      auVar83._12_4_ = fVar450 * auVar186._12_4_;
      auVar83._16_4_ = fVar451 * auVar186._16_4_;
      auVar83._20_4_ = fVar452 * auVar186._20_4_;
      auVar83._24_4_ = fVar453 * auVar186._24_4_;
      auVar83._28_4_ = auVar186._28_4_;
      auVar186 = vsubps_avx(auVar82,auVar83);
      auVar37 = vsubps_avx(auVar181,auVar36);
      auVar84._4_4_ = fVar385 * auVar37._4_4_;
      auVar84._0_4_ = fVar375 * auVar37._0_4_;
      auVar84._8_4_ = fVar387 * auVar37._8_4_;
      auVar84._12_4_ = fVar389 * auVar37._12_4_;
      auVar84._16_4_ = fVar391 * auVar37._16_4_;
      auVar84._20_4_ = fVar393 * auVar37._20_4_;
      uVar7 = auVar37._28_4_;
      auVar84._24_4_ = fVar395 * auVar37._24_4_;
      auVar84._28_4_ = uVar7;
      auVar143 = vsubps_avx(auVar186,auVar84);
      auVar85._4_4_ = fStack_5dc * -fVar269;
      auVar85._0_4_ = local_5e0 * -fVar225;
      auVar85._8_4_ = fStack_5d8 * -fVar301;
      auVar85._12_4_ = fStack_5d4 * -fVar331;
      auVar85._16_4_ = fStack_5d0 * -fVar353;
      auVar85._20_4_ = fStack_5cc * -fVar396;
      auVar85._24_4_ = fStack_5c8 * -fVar42;
      auVar85._28_4_ = local_820._28_4_ ^ 0x80000000;
      auVar86._4_4_ = fStack_5bc * fVar448;
      auVar86._0_4_ = local_5c0 * fVar442;
      auVar86._8_4_ = fStack_5b8 * fVar449;
      auVar86._12_4_ = fStack_5b4 * fVar450;
      auVar86._16_4_ = fStack_5b0 * fVar451;
      auVar86._20_4_ = fStack_5ac * fVar452;
      auVar86._24_4_ = fStack_5a8 * fVar453;
      auVar86._28_4_ = uVar7;
      auVar433._8_4_ = 0x3f800000;
      auVar433._0_8_ = 0x3f8000003f800000;
      auVar433._12_4_ = 0x3f800000;
      auVar433._16_4_ = 0x3f800000;
      auVar433._20_4_ = 0x3f800000;
      auVar433._24_4_ = 0x3f800000;
      auVar433._28_4_ = 0x3f800000;
      auVar435 = ZEXT3264(auVar433);
      auVar186 = vsubps_avx(auVar85,auVar86);
      auVar87._4_4_ = fVar385 * fStack_59c;
      auVar87._0_4_ = fVar375 * local_5a0;
      auVar87._8_4_ = fVar387 * fStack_598;
      auVar87._12_4_ = fVar389 * fStack_594;
      auVar87._16_4_ = fVar391 * fStack_590;
      auVar87._20_4_ = fVar393 * fStack_58c;
      auVar87._24_4_ = fVar395 * fStack_588;
      auVar87._28_4_ = uVar7;
      auVar179 = vsubps_avx(auVar186,auVar87);
      auVar186 = vrcpps_avx(auVar179);
      fVar225 = auVar186._0_4_;
      fVar223 = auVar186._4_4_;
      auVar88._4_4_ = auVar179._4_4_ * fVar223;
      auVar88._0_4_ = auVar179._0_4_ * fVar225;
      fVar250 = auVar186._8_4_;
      auVar88._8_4_ = auVar179._8_4_ * fVar250;
      fVar224 = auVar186._12_4_;
      auVar88._12_4_ = auVar179._12_4_ * fVar224;
      fVar269 = auVar186._16_4_;
      auVar88._16_4_ = auVar179._16_4_ * fVar269;
      fVar271 = auVar186._20_4_;
      auVar88._20_4_ = auVar179._20_4_ * fVar271;
      fVar273 = auVar186._24_4_;
      auVar88._24_4_ = auVar179._24_4_ * fVar273;
      auVar88._28_4_ = fVar65;
      auVar180 = vsubps_avx(auVar433,auVar88);
      auVar317._8_4_ = 0x7fffffff;
      auVar317._0_8_ = 0x7fffffff7fffffff;
      auVar317._12_4_ = 0x7fffffff;
      auVar317._16_4_ = 0x7fffffff;
      auVar317._20_4_ = 0x7fffffff;
      auVar317._24_4_ = 0x7fffffff;
      auVar317._28_4_ = 0x7fffffff;
      auVar186 = vandps_avx(auVar179,auVar317);
      auVar37 = vcmpps_avx(auVar186,auVar382,1);
      auVar322 = ZEXT3264(auVar37);
      auVar89._4_4_ = (fVar223 + fVar223 * auVar180._4_4_) * -auVar143._4_4_;
      auVar89._0_4_ = (fVar225 + fVar225 * auVar180._0_4_) * -auVar143._0_4_;
      auVar89._8_4_ = (fVar250 + fVar250 * auVar180._8_4_) * -auVar143._8_4_;
      auVar89._12_4_ = (fVar224 + fVar224 * auVar180._12_4_) * -auVar143._12_4_;
      auVar89._16_4_ = (fVar269 + fVar269 * auVar180._16_4_) * -auVar143._16_4_;
      auVar89._20_4_ = (fVar271 + fVar271 * auVar180._20_4_) * -auVar143._20_4_;
      auVar89._24_4_ = (fVar273 + fVar273 * auVar180._24_4_) * -auVar143._24_4_;
      auVar89._28_4_ = auVar143._28_4_ ^ 0x80000000;
      auVar186 = vcmpps_avx(auVar179,auVar181,1);
      auVar186 = vorps_avx(auVar37,auVar186);
      auVar186 = vblendvps_avx(auVar89,auVar446,auVar186);
      _local_680 = vmaxps_avx(auVar46,auVar186);
      auVar299 = ZEXT864(0) << 0x20;
      auVar186 = vcmpps_avx(auVar179,ZEXT832(0) << 0x20,6);
      auVar186 = vorps_avx(auVar37,auVar186);
      auVar186 = vblendvps_avx(auVar89,auVar406,auVar186);
      auVar141 = vandps_avx(auVar141,local_480);
      local_520 = vminps_avx(auVar47,auVar186);
      auVar186 = vcmpps_avx(_local_680,local_520,2);
      auVar37 = auVar141 & auVar186;
      if ((((((((auVar37 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar37 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar37 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar37 >> 0x7f,0) != '\0') ||
            (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar37 >> 0xbf,0) != '\0') ||
          (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar37[0x1f] < '\0') {
        auVar37 = vminps_avx(_local_b00,auVar147);
        auVar183 = vminps_avx(auVar183,auVar211);
        auVar183 = vminps_avx(auVar37,auVar183);
        auVar34 = vsubps_avx(auVar183,auVar34);
        auVar141 = vandps_avx(auVar186,auVar141);
        auVar110._4_4_ = fStack_6bc;
        auVar110._0_4_ = local_6c0;
        auVar110._8_4_ = fStack_6b8;
        auVar110._12_4_ = fStack_6b4;
        auVar110._16_4_ = fStack_6b0;
        auVar110._20_4_ = fStack_6ac;
        auVar110._24_4_ = fStack_6a8;
        auVar110._28_4_ = fStack_6a4;
        auVar186 = vminps_avx(auVar110,auVar433);
        auVar186 = vmaxps_avx(auVar186,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar198 + fVar168 * (auVar186._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar220 + fVar193 * (auVar186._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar221 + fVar194 * (auVar186._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fVar222 + fVar197 * (auVar186._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar198 + fVar168 * (auVar186._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar220 + fVar193 * (auVar186._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar221 + fVar194 * (auVar186._24_4_ + 6.0) * 0.125;
        fStack_184 = fVar222 + auVar186._28_4_ + 7.0;
        auVar111._4_4_ = fStack_2dc;
        auVar111._0_4_ = local_2e0;
        auVar111._8_4_ = fStack_2d8;
        auVar111._12_4_ = fStack_2d4;
        auVar111._16_4_ = fStack_2d0;
        auVar111._20_4_ = fStack_2cc;
        auVar111._24_4_ = fStack_2c8;
        auVar111._28_4_ = fStack_2c4;
        auVar186 = vminps_avx(auVar111,auVar433);
        auVar186 = vmaxps_avx(auVar186,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar198 + fVar168 * (auVar186._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar220 + fVar193 * (auVar186._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar221 + fVar194 * (auVar186._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fVar222 + fVar197 * (auVar186._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar198 + fVar168 * (auVar186._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar220 + fVar193 * (auVar186._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar221 + fVar194 * (auVar186._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fVar222 + auVar186._28_4_ + 7.0;
        auVar90._4_4_ = auVar34._4_4_ * 0.99999976;
        auVar90._0_4_ = auVar34._0_4_ * 0.99999976;
        auVar90._8_4_ = auVar34._8_4_ * 0.99999976;
        auVar90._12_4_ = auVar34._12_4_ * 0.99999976;
        auVar90._16_4_ = auVar34._16_4_ * 0.99999976;
        auVar90._20_4_ = auVar34._20_4_ * 0.99999976;
        auVar90._24_4_ = auVar34._24_4_ * 0.99999976;
        auVar90._28_4_ = 0x3f7ffffc;
        auVar186 = vmaxps_avx(ZEXT832(0) << 0x20,auVar90);
        auVar91._4_4_ = auVar186._4_4_ * auVar186._4_4_;
        auVar91._0_4_ = auVar186._0_4_ * auVar186._0_4_;
        auVar91._8_4_ = auVar186._8_4_ * auVar186._8_4_;
        auVar91._12_4_ = auVar186._12_4_ * auVar186._12_4_;
        auVar91._16_4_ = auVar186._16_4_ * auVar186._16_4_;
        auVar91._20_4_ = auVar186._20_4_ * auVar186._20_4_;
        auVar91._24_4_ = auVar186._24_4_ * auVar186._24_4_;
        auVar91._28_4_ = auVar186._28_4_;
        local_800 = vsubps_avx(auVar142,auVar91);
        auVar92._4_4_ = local_800._4_4_ * fVar162 * 4.0;
        auVar92._0_4_ = local_800._0_4_ * fVar160 * 4.0;
        auVar92._8_4_ = local_800._8_4_ * fVar164 * 4.0;
        auVar92._12_4_ = local_800._12_4_ * fVar166 * 4.0;
        auVar92._16_4_ = local_800._16_4_ * fVar277 * 4.0;
        auVar92._20_4_ = local_800._20_4_ * fVar280 * 4.0;
        auVar92._24_4_ = local_800._24_4_ * fVar283 * 4.0;
        auVar92._28_4_ = auVar186._28_4_;
        auVar34 = vsubps_avx(auVar74,auVar92);
        local_a40 = vcmpps_avx(auVar34,ZEXT832(0) << 0x20,5);
        auVar186 = local_a40;
        if ((((((((local_a40 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_a40 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_a40 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_a40 >> 0x7f,0) == '\0') &&
              (local_a40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_a40 >> 0xbf,0) == '\0') &&
            (local_a40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_a40[0x1f]) {
          auVar183 = SUB6432(ZEXT864(0),0) << 0x20;
          _local_700 = ZEXT832(0) << 0x20;
          _local_720 = ZEXT832(0) << 0x20;
          auVar211 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar241 = ZEXT828(0) << 0x20;
          auVar294._8_4_ = 0x7f800000;
          auVar294._0_8_ = 0x7f8000007f800000;
          auVar294._12_4_ = 0x7f800000;
          auVar294._16_4_ = 0x7f800000;
          auVar294._20_4_ = 0x7f800000;
          auVar294._24_4_ = 0x7f800000;
          auVar294._28_4_ = 0x7f800000;
          auVar318._8_4_ = 0xff800000;
          auVar318._0_8_ = 0xff800000ff800000;
          auVar318._12_4_ = 0xff800000;
          auVar318._16_4_ = 0xff800000;
          auVar318._20_4_ = 0xff800000;
          auVar318._24_4_ = 0xff800000;
          auVar318._28_4_ = 0xff800000;
          local_a40 = auVar35;
          local_800 = auVar50;
          _local_6e0 = _local_700;
        }
        else {
          auVar183 = vsqrtps_avx(auVar34);
          auVar212._0_4_ = fVar160 + fVar160;
          auVar212._4_4_ = fVar162 + fVar162;
          auVar212._8_4_ = fVar164 + fVar164;
          auVar212._12_4_ = fVar166 + fVar166;
          auVar212._16_4_ = fVar277 + fVar277;
          auVar212._20_4_ = fVar280 + fVar280;
          auVar212._24_4_ = fVar283 + fVar283;
          auVar212._28_4_ = fVar226 + fVar226;
          auVar35 = vrcpps_avx(auVar212);
          fVar226 = auVar35._0_4_;
          fVar225 = auVar35._4_4_;
          auVar93._4_4_ = auVar212._4_4_ * fVar225;
          auVar93._0_4_ = auVar212._0_4_ * fVar226;
          fVar223 = auVar35._8_4_;
          auVar93._8_4_ = auVar212._8_4_ * fVar223;
          fVar250 = auVar35._12_4_;
          auVar93._12_4_ = auVar212._12_4_ * fVar250;
          fVar224 = auVar35._16_4_;
          auVar93._16_4_ = auVar212._16_4_ * fVar224;
          fVar269 = auVar35._20_4_;
          auVar93._20_4_ = auVar212._20_4_ * fVar269;
          fVar271 = auVar35._24_4_;
          auVar93._24_4_ = auVar212._24_4_ * fVar271;
          auVar93._28_4_ = auVar212._28_4_;
          auVar211 = vsubps_avx(auVar433,auVar93);
          fVar226 = fVar226 + fVar226 * auVar211._0_4_;
          fVar225 = fVar225 + fVar225 * auVar211._4_4_;
          fVar223 = fVar223 + fVar223 * auVar211._8_4_;
          fVar250 = fVar250 + fVar250 * auVar211._12_4_;
          fVar224 = fVar224 + fVar224 * auVar211._16_4_;
          fVar269 = fVar269 + fVar269 * auVar211._20_4_;
          fVar271 = fVar271 + fVar271 * auVar211._24_4_;
          fVar273 = auVar35._28_4_ + auVar211._28_4_;
          auVar246._0_8_ = local_320._0_8_ ^ 0x8000000080000000;
          auVar246._8_4_ = -local_320._8_4_;
          auVar246._12_4_ = -local_320._12_4_;
          auVar246._16_4_ = -local_320._16_4_;
          auVar246._20_4_ = -local_320._20_4_;
          auVar246._24_4_ = -local_320._24_4_;
          auVar246._28_4_ = -local_320._28_4_;
          auVar35 = vsubps_avx(auVar246,auVar183);
          fVar342 = auVar35._0_4_ * fVar226;
          fVar343 = auVar35._4_4_ * fVar225;
          auVar94._4_4_ = fVar343;
          auVar94._0_4_ = fVar342;
          fVar353 = auVar35._8_4_ * fVar223;
          auVar94._8_4_ = fVar353;
          fVar364 = auVar35._12_4_ * fVar250;
          auVar94._12_4_ = fVar364;
          fVar366 = auVar35._16_4_ * fVar224;
          auVar94._16_4_ = fVar366;
          fVar368 = auVar35._20_4_ * fVar269;
          auVar94._20_4_ = fVar368;
          fVar396 = auVar35._24_4_ * fVar271;
          auVar94._24_4_ = fVar396;
          auVar94._28_4_ = 0xff800000;
          auVar183 = vsubps_avx(auVar183,local_320);
          fVar226 = auVar183._0_4_ * fVar226;
          fVar225 = auVar183._4_4_ * fVar225;
          auVar95._4_4_ = fVar225;
          auVar95._0_4_ = fVar226;
          fVar223 = auVar183._8_4_ * fVar223;
          auVar95._8_4_ = fVar223;
          fVar250 = auVar183._12_4_ * fVar250;
          auVar95._12_4_ = fVar250;
          fVar224 = auVar183._16_4_ * fVar224;
          auVar95._16_4_ = fVar224;
          fVar269 = auVar183._20_4_ * fVar269;
          auVar95._20_4_ = fVar269;
          fVar271 = auVar183._24_4_ * fVar271;
          auVar95._24_4_ = fVar271;
          auVar95._28_4_ = 0x3f800000;
          auVar435 = ZEXT3264(auVar95);
          fVar275 = fVar251 * (fVar255 * fVar342 + (float)local_8c0._0_4_);
          fVar301 = fVar278 * (fVar270 * fVar343 + (float)local_8c0._4_4_);
          fVar302 = fVar306 * (fVar272 * fVar353 + fStack_8b8);
          fVar303 = fVar345 * (fVar274 * fVar364 + fStack_8b4);
          fVar304 = fVar370 * (fVar276 * fVar366 + fStack_8b0);
          fVar331 = fVar305 * (fVar279 * fVar368 + fStack_8ac);
          fVar333 = fVar307 * (fVar282 * fVar396 + fStack_8a8);
          local_640._28_4_ = auVar38._28_4_;
          auVar184._0_4_ = local_860 + fVar195 * fVar275;
          auVar184._4_4_ = fStack_85c + fVar254 * fVar301;
          auVar184._8_4_ = fStack_858 + fVar300 * fVar302;
          auVar184._12_4_ = fStack_854 + fVar330 * fVar303;
          auVar184._16_4_ = fStack_850 + fVar351 * fVar304;
          auVar184._20_4_ = fStack_84c + fVar373 * fVar331;
          auVar184._24_4_ = fStack_848 + fVar41 * fVar333;
          auVar184._28_4_ = fStack_844 + auVar183._28_4_ + fStack_8a4;
          auVar96._4_4_ = fStack_59c * fVar343;
          auVar96._0_4_ = local_5a0 * fVar342;
          auVar96._8_4_ = fStack_598 * fVar353;
          auVar96._12_4_ = fStack_594 * fVar364;
          auVar96._16_4_ = fStack_590 * fVar366;
          auVar96._20_4_ = fStack_58c * fVar368;
          auVar96._24_4_ = fStack_588 * fVar396;
          auVar96._28_4_ = fVar273;
          auVar183 = vsubps_avx(auVar96,auVar184);
          auVar213._0_4_ = fVar127 + fVar169 * fVar275;
          auVar213._4_4_ = fVar156 + fVar252 * fVar301;
          auVar213._8_4_ = fVar157 + fVar281 * fVar302;
          auVar213._12_4_ = fVar159 + fVar327 * fVar303;
          auVar213._16_4_ = fVar161 + fVar347 * fVar304;
          auVar213._20_4_ = fVar163 + fVar371 * fVar331;
          auVar213._24_4_ = fVar165 + fVar39 * fVar333;
          auVar213._28_4_ = fVar167 + fVar273;
          auVar295._0_4_ = local_5c0 * fVar342;
          auVar295._4_4_ = fStack_5bc * fVar343;
          auVar295._8_4_ = fStack_5b8 * fVar353;
          auVar295._12_4_ = fStack_5b4 * fVar364;
          auVar295._16_4_ = fStack_5b0 * fVar366;
          auVar295._20_4_ = fStack_5ac * fVar368;
          auVar295._24_4_ = fStack_5a8 * fVar396;
          auVar295._28_4_ = 0;
          auVar211 = vsubps_avx(auVar295,auVar213);
          auVar247._0_4_ = fVar354 + fVar249 * fVar275;
          auVar247._4_4_ = fVar365 + fVar253 * fVar301;
          auVar247._8_4_ = fVar367 + fVar284 * fVar302;
          auVar247._12_4_ = fVar369 + fVar328 * fVar303;
          auVar247._16_4_ = fStack_830 + fVar349 * fVar304;
          auVar247._20_4_ = fStack_82c + fVar372 * fVar331;
          auVar247._24_4_ = fStack_828 + fVar40 * fVar333;
          auVar247._28_4_ = fStack_824 + auVar35._28_4_;
          auVar97._4_4_ = fStack_5dc * fVar343;
          auVar97._0_4_ = local_5e0 * fVar342;
          auVar97._8_4_ = fStack_5d8 * fVar353;
          auVar97._12_4_ = fStack_5d4 * fVar364;
          auVar97._16_4_ = fStack_5d0 * fVar366;
          auVar97._20_4_ = fStack_5cc * fVar368;
          auVar97._24_4_ = fStack_5c8 * fVar396;
          auVar97._28_4_ = 0;
          auVar35 = vsubps_avx(auVar97,auVar247);
          auVar241 = auVar35._0_28_;
          fVar251 = fVar251 * (fVar255 * fVar226 + (float)local_8c0._0_4_);
          fVar278 = fVar278 * (fVar270 * fVar225 + (float)local_8c0._4_4_);
          fVar306 = fVar306 * (fVar272 * fVar223 + fStack_8b8);
          fVar345 = fVar345 * (fVar274 * fVar250 + fStack_8b4);
          fVar370 = fVar370 * (fVar276 * fVar224 + fStack_8b0);
          fVar305 = fVar305 * (fVar279 * fVar269 + fStack_8ac);
          fVar307 = fVar307 * (fVar282 * fVar271 + fStack_8a8);
          auVar319._0_4_ = local_860 + fVar195 * fVar251;
          auVar319._4_4_ = fStack_85c + fVar254 * fVar278;
          auVar319._8_4_ = fStack_858 + fVar300 * fVar306;
          auVar319._12_4_ = fStack_854 + fVar330 * fVar345;
          auVar319._16_4_ = fStack_850 + fVar351 * fVar370;
          auVar319._20_4_ = fStack_84c + fVar373 * fVar305;
          auVar319._24_4_ = fStack_848 + fVar41 * fVar307;
          auVar319._28_4_ = fStack_844 + (float)local_640._28_4_;
          auVar98._4_4_ = fVar225 * fStack_59c;
          auVar98._0_4_ = fVar226 * local_5a0;
          auVar98._8_4_ = fVar223 * fStack_598;
          auVar98._12_4_ = fVar250 * fStack_594;
          auVar98._16_4_ = fVar224 * fStack_590;
          auVar98._20_4_ = fVar269 * fStack_58c;
          auVar98._24_4_ = fVar271 * fStack_588;
          auVar98._28_4_ = fStack_844;
          _local_6e0 = vsubps_avx(auVar98,auVar319);
          auVar320._0_4_ = fVar127 + fVar169 * fVar251;
          auVar320._4_4_ = fVar156 + fVar252 * fVar278;
          auVar320._8_4_ = fVar157 + fVar281 * fVar306;
          auVar320._12_4_ = fVar159 + fVar327 * fVar345;
          auVar320._16_4_ = fVar161 + fVar347 * fVar370;
          auVar320._20_4_ = fVar163 + fVar371 * fVar305;
          auVar320._24_4_ = fVar165 + fVar39 * fVar307;
          auVar320._28_4_ = fVar167 + local_6e0._28_4_;
          auVar99._4_4_ = fStack_5bc * fVar225;
          auVar99._0_4_ = local_5c0 * fVar226;
          auVar99._8_4_ = fStack_5b8 * fVar223;
          auVar99._12_4_ = fStack_5b4 * fVar250;
          auVar99._16_4_ = fStack_5b0 * fVar224;
          auVar99._20_4_ = fStack_5ac * fVar269;
          auVar99._24_4_ = fStack_5a8 * fVar271;
          auVar99._28_4_ = fStack_844;
          _local_700 = vsubps_avx(auVar99,auVar320);
          auVar296._0_4_ = fVar354 + fVar249 * fVar251;
          auVar296._4_4_ = fVar365 + fVar253 * fVar278;
          auVar296._8_4_ = fVar367 + fVar284 * fVar306;
          auVar296._12_4_ = fVar369 + fVar328 * fVar345;
          auVar296._16_4_ = fStack_830 + fVar349 * fVar370;
          auVar296._20_4_ = fStack_82c + fVar372 * fVar305;
          auVar296._24_4_ = fStack_828 + fVar40 * fVar307;
          auVar296._28_4_ = fStack_824 + fStack_8a4 + 0.0;
          auVar100._4_4_ = fStack_5dc * fVar225;
          auVar100._0_4_ = local_5e0 * fVar226;
          auVar100._8_4_ = fStack_5d8 * fVar223;
          auVar100._12_4_ = fStack_5d4 * fVar250;
          auVar100._16_4_ = fStack_5d0 * fVar224;
          auVar100._20_4_ = fStack_5cc * fVar269;
          auVar100._24_4_ = fStack_5c8 * fVar271;
          auVar100._28_4_ = local_700._28_4_;
          _local_720 = vsubps_avx(auVar100,auVar296);
          auVar35 = vcmpps_avx(auVar34,_DAT_01faff00,5);
          auVar297._8_4_ = 0x7f800000;
          auVar297._0_8_ = 0x7f8000007f800000;
          auVar297._12_4_ = 0x7f800000;
          auVar297._16_4_ = 0x7f800000;
          auVar297._20_4_ = 0x7f800000;
          auVar297._24_4_ = 0x7f800000;
          auVar297._28_4_ = 0x7f800000;
          auVar294 = vblendvps_avx(auVar297,auVar94,auVar35);
          auVar407._8_4_ = 0x7fffffff;
          auVar407._0_8_ = 0x7fffffff7fffffff;
          auVar407._12_4_ = 0x7fffffff;
          auVar407._16_4_ = 0x7fffffff;
          auVar407._20_4_ = 0x7fffffff;
          auVar407._24_4_ = 0x7fffffff;
          auVar407._28_4_ = 0x7fffffff;
          auVar34 = vandps_avx(auVar407,local_300);
          auVar34 = vmaxps_avx(local_4a0,auVar34);
          auVar101._4_4_ = auVar34._4_4_ * 1.9073486e-06;
          auVar101._0_4_ = auVar34._0_4_ * 1.9073486e-06;
          auVar101._8_4_ = auVar34._8_4_ * 1.9073486e-06;
          auVar101._12_4_ = auVar34._12_4_ * 1.9073486e-06;
          auVar101._16_4_ = auVar34._16_4_ * 1.9073486e-06;
          auVar101._20_4_ = auVar34._20_4_ * 1.9073486e-06;
          auVar101._24_4_ = auVar34._24_4_ * 1.9073486e-06;
          auVar101._28_4_ = auVar34._28_4_;
          auVar34 = vandps_avx(auVar407,local_4c0);
          auVar34 = vcmpps_avx(auVar34,auVar101,1);
          auVar321._8_4_ = 0xff800000;
          auVar321._0_8_ = 0xff800000ff800000;
          auVar321._12_4_ = 0xff800000;
          auVar321._16_4_ = 0xff800000;
          auVar321._20_4_ = 0xff800000;
          auVar321._24_4_ = 0xff800000;
          auVar321._28_4_ = 0xff800000;
          auVar318 = vblendvps_avx(auVar321,auVar95,auVar35);
          auVar37 = auVar35 & auVar34;
          _local_a80 = auVar183;
          local_880 = auVar211;
          if ((((((((auVar37 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar37 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar37 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar37 >> 0x7f,0) != '\0') ||
                (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar37 >> 0xbf,0) != '\0') ||
              (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar37[0x1f] < '\0') {
            auVar186 = vandps_avx(auVar34,auVar35);
            auVar232 = vpackssdw_avx(auVar186._0_16_,auVar186._16_16_);
            auVar37 = vcmpps_avx(local_800,ZEXT832(0) << 0x20,2);
            auVar456._8_4_ = 0xff800000;
            auVar456._0_8_ = 0xff800000ff800000;
            auVar456._12_4_ = 0xff800000;
            auVar456._16_4_ = 0xff800000;
            auVar456._20_4_ = 0xff800000;
            auVar456._24_4_ = 0xff800000;
            auVar456._28_4_ = 0xff800000;
            auVar447._8_4_ = 0x7f800000;
            auVar447._0_8_ = 0x7f8000007f800000;
            auVar447._12_4_ = 0x7f800000;
            auVar447._16_4_ = 0x7f800000;
            auVar447._20_4_ = 0x7f800000;
            auVar447._24_4_ = 0x7f800000;
            auVar447._28_4_ = 0x7f800000;
            auVar34 = vblendvps_avx(auVar447,auVar456,auVar37);
            auVar238 = vpmovsxwd_avx(auVar232);
            auVar435 = ZEXT1664(auVar238);
            auVar232 = vpunpckhwd_avx(auVar232,auVar232);
            auVar408._16_16_ = auVar232;
            auVar408._0_16_ = auVar238;
            auVar294 = vblendvps_avx(auVar294,auVar34,auVar408);
            auVar34 = vblendvps_avx(auVar456,auVar447,auVar37);
            auVar318 = vblendvps_avx(auVar318,auVar34,auVar408);
            auVar34 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
            auVar155._0_4_ = auVar34._0_4_ ^ auVar186._0_4_;
            auVar155._4_4_ = auVar34._4_4_ ^ auVar186._4_4_;
            auVar155._8_4_ = auVar34._8_4_ ^ auVar186._8_4_;
            auVar155._12_4_ = auVar34._12_4_ ^ auVar186._12_4_;
            auVar155._16_4_ = auVar34._16_4_ ^ auVar186._16_4_;
            auVar155._20_4_ = auVar34._20_4_ ^ auVar186._20_4_;
            auVar155._24_4_ = auVar34._24_4_ ^ auVar186._24_4_;
            auVar155._28_4_ = auVar34._28_4_ ^ auVar186._28_4_;
            auVar186 = vorps_avx(auVar37,auVar155);
            auVar186 = vandps_avx(auVar35,auVar186);
          }
        }
        fVar226 = (ray->dir).field_0.m128[0];
        auVar377._4_4_ = fVar226;
        auVar377._0_4_ = fVar226;
        auVar377._8_4_ = fVar226;
        auVar377._12_4_ = fVar226;
        auVar377._16_4_ = fVar226;
        auVar377._20_4_ = fVar226;
        auVar377._24_4_ = fVar226;
        local_960._28_4_ = fVar226;
        local_960._0_28_ = auVar377;
        auVar383 = ZEXT3264(local_960);
        fVar169 = (ray->dir).field_0.m128[1];
        local_980._4_4_ = fVar169;
        local_980._0_4_ = fVar169;
        local_980._8_4_ = fVar169;
        local_980._12_4_ = fVar169;
        local_980._16_4_ = fVar169;
        local_980._20_4_ = fVar169;
        local_980._24_4_ = fVar169;
        local_980._28_4_ = fVar169;
        auVar409 = ZEXT3264(local_980);
        fVar249 = (ray->dir).field_0.m128[2];
        local_9a0._4_4_ = fVar249;
        local_9a0._0_4_ = fVar249;
        local_9a0._8_4_ = fVar249;
        local_9a0._12_4_ = fVar249;
        local_9a0._16_4_ = fVar249;
        local_9a0._20_4_ = fVar249;
        local_9a0._24_4_ = fVar249;
        local_9a0._28_4_ = fVar249;
        auVar419 = ZEXT3264(local_9a0);
        local_500 = _local_680;
        local_4e0 = vminps_avx(local_520,auVar294);
        local_740 = vmaxps_avx(_local_680,auVar318);
        auVar322 = ZEXT3264(local_740);
        _local_540 = local_740;
        auVar34 = vcmpps_avx(_local_680,local_4e0,2);
        local_600 = vandps_avx(auVar34,auVar141);
        auVar299 = ZEXT3264(local_600);
        auVar34 = vcmpps_avx(local_740,local_520,2);
        local_640 = vandps_avx(auVar34,auVar141);
        auVar141 = vorps_avx(local_640,local_600);
        if ((((((((auVar141 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar141 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar141 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar141 >> 0x7f,0) != '\0') ||
              (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar141 >> 0xbf,0) != '\0') ||
            (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar141[0x1f] < '\0') {
          auVar141 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
          local_660._0_4_ = auVar186._0_4_ ^ auVar141._0_4_;
          local_660._4_4_ = auVar186._4_4_ ^ auVar141._4_4_;
          local_660._8_4_ = auVar186._8_4_ ^ auVar141._8_4_;
          local_660._12_4_ = auVar186._12_4_ ^ auVar141._12_4_;
          local_660._16_4_ = auVar186._16_4_ ^ auVar141._16_4_;
          local_660._20_4_ = auVar186._20_4_ ^ auVar141._20_4_;
          local_660._24_4_ = auVar186._24_4_ ^ auVar141._24_4_;
          local_660._28_4_ = (uint)auVar186._28_4_ ^ auVar141._28_4_;
          auVar150._0_4_ =
               fVar226 * auVar183._0_4_ + fVar169 * auVar211._0_4_ + fVar249 * auVar241._0_4_;
          auVar150._4_4_ =
               fVar226 * auVar183._4_4_ + fVar169 * auVar211._4_4_ + fVar249 * auVar241._4_4_;
          auVar150._8_4_ =
               fVar226 * auVar183._8_4_ + fVar169 * auVar211._8_4_ + fVar249 * auVar241._8_4_;
          auVar150._12_4_ =
               fVar226 * auVar183._12_4_ + fVar169 * auVar211._12_4_ + fVar249 * auVar241._12_4_;
          auVar150._16_4_ =
               fVar226 * auVar183._16_4_ + fVar169 * auVar211._16_4_ + fVar249 * auVar241._16_4_;
          auVar150._20_4_ =
               fVar226 * auVar183._20_4_ + fVar169 * auVar211._20_4_ + fVar249 * auVar241._20_4_;
          auVar150._24_4_ =
               fVar226 * auVar183._24_4_ + fVar169 * auVar211._24_4_ + fVar249 * auVar241._24_4_;
          auVar150._28_4_ = auVar186._28_4_ + auVar183._28_4_ + auVar211._28_4_;
          auVar187._8_4_ = 0x7fffffff;
          auVar187._0_8_ = 0x7fffffff7fffffff;
          auVar187._12_4_ = 0x7fffffff;
          auVar187._16_4_ = 0x7fffffff;
          auVar187._20_4_ = 0x7fffffff;
          auVar187._24_4_ = 0x7fffffff;
          auVar187._28_4_ = 0x7fffffff;
          auVar141 = vandps_avx(auVar150,auVar187);
          auVar188._8_4_ = 0x3e99999a;
          auVar188._0_8_ = 0x3e99999a3e99999a;
          auVar188._12_4_ = 0x3e99999a;
          auVar188._16_4_ = 0x3e99999a;
          auVar188._20_4_ = 0x3e99999a;
          auVar188._24_4_ = 0x3e99999a;
          auVar188._28_4_ = 0x3e99999a;
          auVar141 = vcmpps_avx(auVar141,auVar188,1);
          auVar141 = vorps_avx(auVar141,local_660);
          auVar189._8_4_ = 3;
          auVar189._0_8_ = 0x300000003;
          auVar189._12_4_ = 3;
          auVar189._16_4_ = 3;
          auVar189._20_4_ = 3;
          auVar189._24_4_ = 3;
          auVar189._28_4_ = 3;
          auVar214._8_4_ = 2;
          auVar214._0_8_ = 0x200000002;
          auVar214._12_4_ = 2;
          auVar214._16_4_ = 2;
          auVar214._20_4_ = 2;
          auVar214._24_4_ = 2;
          auVar214._28_4_ = 2;
          auVar141 = vblendvps_avx(auVar214,auVar189,auVar141);
          local_6a0 = ZEXT432(local_b44);
          auVar238 = vpshufd_avx(ZEXT416(local_b44),0);
          fVar226 = 0.0;
          auVar232 = vpcmpgtd_avx(auVar141._16_16_,auVar238);
          local_6c0 = auVar238._0_4_;
          fStack_6bc = auVar238._4_4_;
          fStack_6b8 = auVar238._8_4_;
          fStack_6b4 = auVar238._12_4_;
          auVar238 = vpcmpgtd_avx(auVar141._0_16_,auVar238);
          auVar190._16_16_ = auVar232;
          auVar190._0_16_ = auVar238;
          local_620 = vblendps_avx(ZEXT1632(auVar238),auVar190,0xf0);
          local_580 = vandnps_avx(local_620,local_600);
          auVar192 = ZEXT3264(local_580);
          auVar141 = local_600 & ~local_620;
          auVar341 = ZEXT3264(local_aa0);
          if ((((((((auVar141 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar141 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar141 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar141 >> 0x7f,0) == '\0') &&
                (auVar141 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar141 >> 0xbf,0) == '\0') &&
              (auVar141 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar141[0x1f]) {
            fVar169 = ray->tfar;
            auVar151._4_4_ = fVar169;
            auVar151._0_4_ = fVar169;
            auVar151._8_4_ = fVar169;
            auVar151._12_4_ = fVar169;
            auVar151._16_4_ = fVar169;
            auVar151._20_4_ = fVar169;
            auVar151._24_4_ = fVar169;
            auVar151._28_4_ = fVar169;
            local_9a0 = auVar36;
            local_980 = auVar51;
          }
          else {
            local_7c0._4_4_ = local_aa0._4_4_ + (float)local_680._4_4_;
            local_7c0._0_4_ = local_aa0._0_4_ + (float)local_680._0_4_;
            fStack_7b8 = local_aa0._8_4_ + fStack_678;
            fStack_7b4 = local_aa0._12_4_ + fStack_674;
            fStack_7b0 = local_aa0._16_4_ + fStack_670;
            fStack_7ac = local_aa0._20_4_ + fStack_66c;
            fStack_7a8 = local_aa0._24_4_ + fStack_668;
            fStack_7a4 = local_aa0._28_4_ + fStack_664;
            do {
              auVar152._8_4_ = 0x7f800000;
              auVar152._0_8_ = 0x7f8000007f800000;
              auVar152._12_4_ = 0x7f800000;
              auVar152._16_4_ = 0x7f800000;
              auVar152._20_4_ = 0x7f800000;
              auVar152._24_4_ = 0x7f800000;
              auVar152._28_4_ = 0x7f800000;
              auVar141 = auVar192._0_32_;
              auVar186 = vblendvps_avx(auVar152,_local_680,auVar141);
              auVar34 = vshufps_avx(auVar186,auVar186,0xb1);
              auVar34 = vminps_avx(auVar186,auVar34);
              auVar35 = vshufpd_avx(auVar34,auVar34,5);
              auVar34 = vminps_avx(auVar34,auVar35);
              auVar35 = vperm2f128_avx(auVar34,auVar34,1);
              auVar34 = vminps_avx(auVar34,auVar35);
              auVar186 = vcmpps_avx(auVar186,auVar34,0);
              auVar34 = auVar141 & auVar186;
              if ((((((((auVar34 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar34 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar34 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar34 >> 0x7f,0) != '\0') ||
                    (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar34 >> 0xbf,0) != '\0') ||
                  (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar34[0x1f] < '\0') {
                auVar141 = vandps_avx(auVar186,auVar141);
              }
              uVar115 = vmovmskps_avx(auVar141);
              uVar118 = 0;
              if (uVar115 != 0) {
                for (; (uVar115 >> uVar118 & 1) == 0; uVar118 = uVar118 + 1) {
                }
              }
              uVar117 = (ulong)uVar118;
              *(undefined4 *)(local_580 + uVar117 * 4) = 0;
              aVar9 = (ray->dir).field_0.field_1;
              local_840 = aVar9.x;
              fStack_83c = aVar9.y;
              fStack_838 = aVar9.z;
              aStack_834 = aVar9.field_3;
              auVar232 = vdpps_avx((undefined1  [16])aVar9,(undefined1  [16])aVar9,0x7f);
              fVar226 = local_1a0[uVar117];
              uVar118 = *(uint *)(local_500 + uVar117 * 4);
              if (auVar232._0_4_ < 0.0) {
                fVar169 = sqrtf(auVar232._0_4_);
              }
              else {
                auVar232 = vsqrtss_avx(auVar232,auVar232);
                fVar169 = auVar232._0_4_;
              }
              auVar238 = vminps_avx(_local_9e0,_local_a00);
              auVar232 = vmaxps_avx(_local_9e0,_local_a00);
              auVar137 = vminps_avx(_local_9f0,_local_a10);
              auVar175 = vminps_avx(auVar238,auVar137);
              auVar238 = vmaxps_avx(_local_9f0,_local_a10);
              auVar137 = vmaxps_avx(auVar232,auVar238);
              auVar229._8_4_ = 0x7fffffff;
              auVar229._0_8_ = 0x7fffffff7fffffff;
              auVar229._12_4_ = 0x7fffffff;
              auVar232 = vandps_avx(auVar175,auVar229);
              auVar238 = vandps_avx(auVar137,auVar229);
              auVar232 = vmaxps_avx(auVar232,auVar238);
              auVar238 = vmovshdup_avx(auVar232);
              auVar238 = vmaxss_avx(auVar238,auVar232);
              auVar232 = vshufpd_avx(auVar232,auVar232,1);
              auVar232 = vmaxss_avx(auVar232,auVar238);
              local_860 = auVar232._0_4_ * 1.9073486e-06;
              local_800._0_4_ = fVar169 * 1.9073486e-06;
              _local_7a0 = vshufps_avx(auVar137,auVar137,0xff);
              auVar232 = vinsertps_avx(ZEXT416(uVar118),ZEXT416((uint)fVar226),0x10);
              auVar383 = ZEXT1664(auVar232);
              bVar126 = true;
              uVar117 = 0;
              do {
                auVar376 = auVar383._0_16_;
                auVar238 = vmovshdup_avx(auVar376);
                fVar250 = auVar238._0_4_;
                fVar223 = 1.0 - fVar250;
                fVar226 = fVar223 * fVar223;
                fVar169 = fVar223 * fVar226;
                fVar249 = fVar250 * fVar250;
                fVar195 = fVar250 * fVar249;
                fVar225 = fVar250 * fVar223;
                auVar232 = vshufps_avx(ZEXT416((uint)(fVar195 * 0.16666667)),
                                       ZEXT416((uint)(fVar195 * 0.16666667)),0);
                auVar137 = ZEXT416((uint)((fVar195 * 4.0 + fVar169 +
                                          fVar250 * fVar225 * 12.0 + fVar223 * fVar225 * 6.0) *
                                         0.16666667));
                auVar137 = vshufps_avx(auVar137,auVar137,0);
                auVar175 = ZEXT416((uint)((fVar169 * 4.0 + fVar195 +
                                          fVar223 * fVar225 * 12.0 + fVar250 * fVar225 * 6.0) *
                                         0.16666667));
                auVar175 = vshufps_avx(auVar175,auVar175,0);
                auVar136 = vshufps_avx(auVar376,auVar376,0);
                auVar201._0_4_ = auVar136._0_4_ * local_840 + 0.0;
                auVar201._4_4_ = auVar136._4_4_ * fStack_83c + 0.0;
                auVar201._8_4_ = auVar136._8_4_ * fStack_838 + 0.0;
                auVar201._12_4_ = auVar136._12_4_ * aStack_834.w + 0.0;
                auVar136 = vshufps_avx(ZEXT416((uint)(fVar169 * 0.16666667)),
                                       ZEXT416((uint)(fVar169 * 0.16666667)),0);
                auVar131._0_4_ =
                     auVar136._0_4_ * (float)local_9e0._0_4_ +
                     auVar175._0_4_ * (float)local_a00._0_4_ +
                     auVar232._0_4_ * (float)local_a10._0_4_ +
                     auVar137._0_4_ * (float)local_9f0._0_4_;
                auVar131._4_4_ =
                     auVar136._4_4_ * (float)local_9e0._4_4_ +
                     auVar175._4_4_ * (float)local_a00._4_4_ +
                     auVar232._4_4_ * (float)local_a10._4_4_ +
                     auVar137._4_4_ * (float)local_9f0._4_4_;
                auVar131._8_4_ =
                     auVar136._8_4_ * fStack_9d8 +
                     auVar175._8_4_ * fStack_9f8 +
                     auVar232._8_4_ * fStack_a08 + auVar137._8_4_ * fStack_9e8;
                auVar131._12_4_ =
                     auVar136._12_4_ * fStack_9d4 +
                     auVar175._12_4_ * fStack_9f4 +
                     auVar232._12_4_ * fStack_a04 + auVar137._12_4_ * fStack_9e4;
                local_880._0_16_ = auVar131;
                auVar232 = vsubps_avx(auVar201,auVar131);
                _local_a80 = auVar232;
                auVar232 = vdpps_avx(auVar232,auVar232,0x7f);
                fVar169 = auVar232._0_4_;
                if (fVar169 < 0.0) {
                  local_a40._0_16_ = auVar238;
                  local_a60._0_4_ = fVar249;
                  local_940._0_4_ = fVar226;
                  local_8a0._0_4_ = fVar225;
                  fVar195 = sqrtf(fVar169);
                  fVar226 = (float)local_940._0_4_;
                  fVar249 = (float)local_a60._0_4_;
                  fVar225 = (float)local_8a0._0_4_;
                  auVar238 = local_a40._0_16_;
                }
                else {
                  auVar137 = vsqrtss_avx(auVar232,auVar232);
                  fVar195 = auVar137._0_4_;
                }
                fVar250 = auVar238._0_4_;
                auVar238 = vshufps_avx(ZEXT416((uint)(fVar249 * 0.5)),ZEXT416((uint)(fVar249 * 0.5))
                                       ,0);
                auVar137 = ZEXT416((uint)((fVar226 + fVar225 * 4.0) * 0.5));
                auVar137 = vshufps_avx(auVar137,auVar137,0);
                auVar175 = ZEXT416((uint)((fVar250 * -fVar250 - fVar225 * 4.0) * 0.5));
                auVar175 = vshufps_avx(auVar175,auVar175,0);
                auVar136 = ZEXT416((uint)(fVar223 * -fVar223 * 0.5));
                auVar136 = vshufps_avx(auVar136,auVar136,0);
                auVar355._0_4_ =
                     (float)local_9e0._0_4_ * auVar136._0_4_ +
                     (float)local_a00._0_4_ * auVar175._0_4_ +
                     (float)local_a10._0_4_ * auVar238._0_4_ +
                     (float)local_9f0._0_4_ * auVar137._0_4_;
                auVar355._4_4_ =
                     (float)local_9e0._4_4_ * auVar136._4_4_ +
                     (float)local_a00._4_4_ * auVar175._4_4_ +
                     (float)local_a10._4_4_ * auVar238._4_4_ +
                     (float)local_9f0._4_4_ * auVar137._4_4_;
                auVar355._8_4_ =
                     fStack_9d8 * auVar136._8_4_ +
                     fStack_9f8 * auVar175._8_4_ +
                     fStack_a08 * auVar238._8_4_ + fStack_9e8 * auVar137._8_4_;
                auVar355._12_4_ =
                     fStack_9d4 * auVar136._12_4_ +
                     fStack_9f4 * auVar175._12_4_ +
                     fStack_a04 * auVar238._12_4_ + fStack_9e4 * auVar137._12_4_;
                auVar238 = vshufps_avx(auVar376,auVar376,0x55);
                auVar137 = ZEXT416((uint)(fVar223 - (fVar250 + fVar250)));
                auVar175 = vshufps_avx(auVar137,auVar137,0);
                auVar137 = ZEXT416((uint)(fVar250 - (fVar223 + fVar223)));
                auVar136 = vshufps_avx(auVar137,auVar137,0);
                auVar11 = vshufps_avx(ZEXT416((uint)fVar223),ZEXT416((uint)fVar223),0);
                auVar137 = vdpps_avx(auVar355,auVar355,0x7f);
                auVar173._0_4_ =
                     (float)local_9e0._0_4_ * auVar11._0_4_ +
                     (float)local_a00._0_4_ * auVar136._0_4_ +
                     (float)local_a10._0_4_ * auVar238._0_4_ +
                     (float)local_9f0._0_4_ * auVar175._0_4_;
                auVar173._4_4_ =
                     (float)local_9e0._4_4_ * auVar11._4_4_ +
                     (float)local_a00._4_4_ * auVar136._4_4_ +
                     (float)local_a10._4_4_ * auVar238._4_4_ +
                     (float)local_9f0._4_4_ * auVar175._4_4_;
                auVar173._8_4_ =
                     fStack_9d8 * auVar11._8_4_ +
                     fStack_9f8 * auVar136._8_4_ +
                     fStack_a08 * auVar238._8_4_ + fStack_9e8 * auVar175._8_4_;
                auVar173._12_4_ =
                     fStack_9d4 * auVar11._12_4_ +
                     fStack_9f4 * auVar136._12_4_ +
                     fStack_a04 * auVar238._12_4_ + fStack_9e4 * auVar175._12_4_;
                auVar238 = vblendps_avx(auVar137,_DAT_01f7aa10,0xe);
                auVar175 = vrsqrtss_avx(auVar238,auVar238);
                fVar249 = auVar175._0_4_;
                fVar226 = auVar137._0_4_;
                auVar175 = vdpps_avx(auVar355,auVar173,0x7f);
                auVar136 = vshufps_avx(auVar137,auVar137,0);
                auVar174._0_4_ = auVar173._0_4_ * auVar136._0_4_;
                auVar174._4_4_ = auVar173._4_4_ * auVar136._4_4_;
                auVar174._8_4_ = auVar173._8_4_ * auVar136._8_4_;
                auVar174._12_4_ = auVar173._12_4_ * auVar136._12_4_;
                auVar175 = vshufps_avx(auVar175,auVar175,0);
                auVar258._0_4_ = auVar355._0_4_ * auVar175._0_4_;
                auVar258._4_4_ = auVar355._4_4_ * auVar175._4_4_;
                auVar258._8_4_ = auVar355._8_4_ * auVar175._8_4_;
                auVar258._12_4_ = auVar355._12_4_ * auVar175._12_4_;
                auVar11 = vsubps_avx(auVar174,auVar258);
                auVar175 = vrcpss_avx(auVar238,auVar238);
                auVar238 = vmaxss_avx(ZEXT416((uint)local_860),
                                      ZEXT416((uint)(auVar383._0_4_ * (float)local_800._0_4_)));
                auVar175 = ZEXT416((uint)(auVar175._0_4_ * (2.0 - fVar226 * auVar175._0_4_)));
                auVar175 = vshufps_avx(auVar175,auVar175,0);
                uVar102 = CONCAT44(auVar355._4_4_,auVar355._0_4_);
                auVar287._0_8_ = uVar102 ^ 0x8000000080000000;
                auVar287._8_4_ = -auVar355._8_4_;
                auVar287._12_4_ = -auVar355._12_4_;
                auVar136 = ZEXT416((uint)(fVar249 * 1.5 +
                                         fVar226 * -0.5 * fVar249 * fVar249 * fVar249));
                auVar136 = vshufps_avx(auVar136,auVar136,0);
                auVar230._0_4_ = auVar136._0_4_ * auVar11._0_4_ * auVar175._0_4_;
                auVar230._4_4_ = auVar136._4_4_ * auVar11._4_4_ * auVar175._4_4_;
                auVar230._8_4_ = auVar136._8_4_ * auVar11._8_4_ * auVar175._8_4_;
                auVar230._12_4_ = auVar136._12_4_ * auVar11._12_4_ * auVar175._12_4_;
                auVar312._0_4_ = auVar355._0_4_ * auVar136._0_4_;
                auVar312._4_4_ = auVar355._4_4_ * auVar136._4_4_;
                auVar312._8_4_ = auVar355._8_4_ * auVar136._8_4_;
                auVar312._12_4_ = auVar355._12_4_ * auVar136._12_4_;
                local_a40._0_4_ = auVar238._0_4_;
                if (fVar226 < 0.0) {
                  local_a60._0_4_ = fVar195;
                  local_940._0_16_ = auVar287;
                  local_8a0._0_16_ = auVar312;
                  local_820._0_16_ = auVar230;
                  fVar249 = sqrtf(fVar226);
                  auVar230 = local_820._0_16_;
                  auVar287 = local_940._0_16_;
                  auVar312 = local_8a0._0_16_;
                  fVar195 = (float)local_a60._0_4_;
                  fVar226 = (float)local_a40._0_4_;
                }
                else {
                  auVar137 = vsqrtss_avx(auVar137,auVar137);
                  fVar249 = auVar137._0_4_;
                  fVar226 = auVar238._0_4_;
                }
                auVar238 = vdpps_avx(_local_a80,auVar312,0x7f);
                fVar249 = (local_860 / fVar249) * (fVar195 + 1.0) + fVar195 * local_860 + fVar226;
                auVar137 = vdpps_avx(auVar287,auVar312,0x7f);
                auVar175 = vdpps_avx(_local_a80,auVar230,0x7f);
                auVar106._4_4_ = fStack_83c;
                auVar106._0_4_ = local_840;
                auVar106._8_4_ = fStack_838;
                auVar106._12_4_ = aStack_834.a;
                auVar136 = vdpps_avx(auVar106,auVar312,0x7f);
                auVar11 = vdpps_avx(_local_a80,auVar287,0x7f);
                fVar195 = auVar137._0_4_ + auVar175._0_4_;
                fVar225 = auVar238._0_4_;
                auVar132._0_4_ = fVar225 * fVar225;
                auVar132._4_4_ = auVar238._4_4_ * auVar238._4_4_;
                auVar132._8_4_ = auVar238._8_4_ * auVar238._8_4_;
                auVar132._12_4_ = auVar238._12_4_ * auVar238._12_4_;
                auVar175 = vsubps_avx(auVar232,auVar132);
                auVar137 = vdpps_avx(_local_a80,auVar106,0x7f);
                fVar223 = auVar11._0_4_ - fVar225 * fVar195;
                fVar250 = auVar137._0_4_ - fVar225 * auVar136._0_4_;
                auVar137 = vrsqrtss_avx(auVar175,auVar175);
                fVar224 = auVar175._0_4_;
                fVar225 = auVar137._0_4_;
                fVar225 = fVar225 * 1.5 + fVar224 * -0.5 * fVar225 * fVar225 * fVar225;
                if (fVar224 < 0.0) {
                  local_a60._0_16_ = auVar238;
                  local_940._0_4_ = fVar249;
                  local_8a0._0_16_ = auVar136;
                  local_820._0_16_ = ZEXT416((uint)fVar195);
                  local_780._0_4_ = fVar223;
                  local_8c0._0_4_ = fVar250;
                  local_8e0._0_4_ = fVar225;
                  fVar224 = sqrtf(fVar224);
                  fVar225 = (float)local_8e0._0_4_;
                  fVar223 = (float)local_780._0_4_;
                  fVar250 = (float)local_8c0._0_4_;
                  auVar136 = local_8a0._0_16_;
                  auVar238 = local_a60._0_16_;
                  fVar249 = (float)local_940._0_4_;
                  fVar226 = (float)local_a40._0_4_;
                  auVar137 = local_820._0_16_;
                }
                else {
                  auVar137 = vsqrtss_avx(auVar175,auVar175);
                  fVar224 = auVar137._0_4_;
                  auVar137 = ZEXT416((uint)fVar195);
                }
                auVar409 = ZEXT3264(local_980);
                auVar419 = ZEXT3264(local_9a0);
                auVar435 = ZEXT1664(auVar355);
                auVar11 = vpermilps_avx(local_880._0_16_,0xff);
                auVar12 = vshufps_avx(auVar355,auVar355,0xff);
                fVar223 = fVar223 * fVar225 - auVar12._0_4_;
                auVar259._0_8_ = auVar136._0_8_ ^ 0x8000000080000000;
                auVar259._8_4_ = auVar136._8_4_ ^ 0x80000000;
                auVar259._12_4_ = auVar136._12_4_ ^ 0x80000000;
                auVar288._0_4_ = -fVar223;
                auVar288._4_4_ = 0x80000000;
                auVar288._8_4_ = 0x80000000;
                auVar288._12_4_ = 0x80000000;
                auVar299 = ZEXT1664(auVar288);
                fVar195 = auVar137._0_4_ * fVar250 * fVar225;
                auVar322 = ZEXT464((uint)fVar195);
                auVar175 = vinsertps_avx(auVar288,ZEXT416((uint)(fVar250 * fVar225)),0x1c);
                auVar136 = vmovsldup_avx(ZEXT416((uint)(fVar195 - auVar136._0_4_ * fVar223)));
                auVar175 = vdivps_avx(auVar175,auVar136);
                auVar137 = vinsertps_avx(auVar137,auVar259,0x10);
                auVar137 = vdivps_avx(auVar137,auVar136);
                auVar136 = vmovsldup_avx(auVar238);
                auVar178 = ZEXT416((uint)(fVar224 - auVar11._0_4_));
                auVar11 = vmovsldup_avx(auVar178);
                auVar202._0_4_ = auVar136._0_4_ * auVar175._0_4_ + auVar11._0_4_ * auVar137._0_4_;
                auVar202._4_4_ = auVar136._4_4_ * auVar175._4_4_ + auVar11._4_4_ * auVar137._4_4_;
                auVar202._8_4_ = auVar136._8_4_ * auVar175._8_4_ + auVar11._8_4_ * auVar137._8_4_;
                auVar202._12_4_ =
                     auVar136._12_4_ * auVar175._12_4_ + auVar11._12_4_ * auVar137._12_4_;
                auVar137 = vsubps_avx(auVar376,auVar202);
                auVar383 = ZEXT1664(auVar137);
                auVar203._8_4_ = 0x7fffffff;
                auVar203._0_8_ = 0x7fffffff7fffffff;
                auVar203._12_4_ = 0x7fffffff;
                auVar238 = vandps_avx(auVar238,auVar203);
                auVar377 = local_960._0_28_;
                if (auVar238._0_4_ < fVar249) {
                  auVar231._8_4_ = 0x7fffffff;
                  auVar231._0_8_ = 0x7fffffff7fffffff;
                  auVar231._12_4_ = 0x7fffffff;
                  auVar238 = vandps_avx(auVar178,auVar231);
                  if (auVar238._0_4_ < (float)local_7a0._0_4_ * 1.9073486e-06 + fVar249 + fVar226) {
                    fVar226 = auVar137._0_4_ + (float)local_7e0._0_4_;
                    bVar113 = 0;
                    bVar112 = 0;
                    if (fVar226 < (ray->org).field_0.m128[3]) goto LAB_0113eed1;
                    fVar249 = ray->tfar;
                    auVar341 = ZEXT3264(local_aa0);
                    if (fVar249 < fVar226) goto LAB_0113eeda;
                    auVar238 = vmovshdup_avx(auVar137);
                    bVar113 = 0;
                    fVar225 = auVar238._0_4_;
                    if ((fVar225 < 0.0) || (1.0 < fVar225)) goto LAB_0113eeda;
                    auVar232 = vrsqrtss_avx(auVar232,auVar232);
                    fVar223 = auVar232._0_4_;
                    auVar299 = ZEXT464((uint)(fVar169 * -0.5));
                    pGVar29 = (context->scene->geometries).items[uVar114].ptr;
                    if ((pGVar29->mask & ray->mask) == 0) {
                      bVar112 = 0;
                      goto LAB_0113eed1;
                    }
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar112 = 1, pGVar29->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_0113eed1;
                    auVar232 = ZEXT416((uint)(fVar223 * 1.5 +
                                             fVar169 * -0.5 * fVar223 * fVar223 * fVar223));
                    auVar232 = vshufps_avx(auVar232,auVar232,0);
                    auVar233._0_4_ = auVar232._0_4_ * (float)local_a80._0_4_;
                    auVar233._4_4_ = auVar232._4_4_ * (float)local_a80._4_4_;
                    auVar233._8_4_ = auVar232._8_4_ * fStack_a78;
                    auVar233._12_4_ = auVar232._12_4_ * fStack_a74;
                    auVar133._0_4_ = auVar355._0_4_ + auVar12._0_4_ * auVar233._0_4_;
                    auVar133._4_4_ = auVar355._4_4_ + auVar12._4_4_ * auVar233._4_4_;
                    auVar133._8_4_ = auVar355._8_4_ + auVar12._8_4_ * auVar233._8_4_;
                    auVar133._12_4_ = auVar355._12_4_ + auVar12._12_4_ * auVar233._12_4_;
                    auVar232 = vshufps_avx(auVar233,auVar233,0xc9);
                    auVar238 = vshufps_avx(auVar355,auVar355,0xc9);
                    auVar234._0_4_ = auVar238._0_4_ * auVar233._0_4_;
                    auVar234._4_4_ = auVar238._4_4_ * auVar233._4_4_;
                    auVar234._8_4_ = auVar238._8_4_ * auVar233._8_4_;
                    auVar234._12_4_ = auVar238._12_4_ * auVar233._12_4_;
                    auVar260._0_4_ = auVar355._0_4_ * auVar232._0_4_;
                    auVar260._4_4_ = auVar355._4_4_ * auVar232._4_4_;
                    auVar260._8_4_ = auVar355._8_4_ * auVar232._8_4_;
                    auVar260._12_4_ = auVar355._12_4_ * auVar232._12_4_;
                    auVar175 = vsubps_avx(auVar260,auVar234);
                    auVar232 = vshufps_avx(auVar175,auVar175,0xc9);
                    auVar238 = vshufps_avx(auVar133,auVar133,0xc9);
                    auVar299 = ZEXT1664(auVar238);
                    auVar261._0_4_ = auVar238._0_4_ * auVar232._0_4_;
                    auVar261._4_4_ = auVar238._4_4_ * auVar232._4_4_;
                    auVar261._8_4_ = auVar238._8_4_ * auVar232._8_4_;
                    auVar261._12_4_ = auVar238._12_4_ * auVar232._12_4_;
                    auVar232 = vshufps_avx(auVar175,auVar175,0xd2);
                    auVar134._0_4_ = auVar133._0_4_ * auVar232._0_4_;
                    auVar134._4_4_ = auVar133._4_4_ * auVar232._4_4_;
                    auVar134._8_4_ = auVar133._8_4_ * auVar232._8_4_;
                    auVar134._12_4_ = auVar133._12_4_ * auVar232._12_4_;
                    auVar175 = vsubps_avx(auVar261,auVar134);
                    auVar232 = vshufps_avx(auVar175,auVar175,0xe9);
                    local_920 = vmovlps_avx(auVar232);
                    local_918 = auVar175._0_4_;
                    local_910 = 0;
                    local_90c = (undefined4)local_8e8;
                    local_904 = context->user->instID[0];
                    local_900 = context->user->instPrimID[0];
                    ray->tfar = fVar226;
                    local_760._0_4_ = 0xffffffff;
                    local_9d0.valid = (int *)local_760;
                    local_9d0.geometryUserPtr = pGVar29->userPtr;
                    local_9d0.context = context->user;
                    local_9d0.hit = (RTCHitN *)&local_920;
                    local_9d0.N = 1;
                    local_9d0.ray = (RTCRayN *)ray;
                    local_914 = fVar225;
                    local_908 = uVar114;
                    if (pGVar29->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0113f107:
                      p_Var32 = context->args->filter;
                      if ((p_Var32 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar29->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar299 = ZEXT1664(auVar299._0_16_);
                        auVar322 = ZEXT1664(auVar322._0_16_);
                        auVar383 = ZEXT1664(auVar383._0_16_);
                        auVar435 = ZEXT1664(auVar435._0_16_);
                        (*p_Var32)(&local_9d0);
                        if (*local_9d0.valid == 0) goto LAB_0113f14b;
                      }
                      bVar113 = 1;
                    }
                    else {
                      auVar299 = ZEXT1664(auVar238);
                      auVar322 = ZEXT464((uint)fVar195);
                      auVar383 = ZEXT1664(auVar137);
                      auVar435 = ZEXT1664(auVar355);
                      (*pGVar29->occlusionFilterN)(&local_9d0);
                      if (*local_9d0.valid != 0) goto LAB_0113f107;
LAB_0113f14b:
                      ray->tfar = fVar249;
                      bVar113 = 0;
                    }
                    auVar341 = ZEXT3264(local_aa0);
                    auVar377 = local_960._0_28_;
                    auVar409 = ZEXT3264(local_980);
                    auVar419 = ZEXT3264(local_9a0);
                    goto LAB_0113eeda;
                  }
                }
                bVar126 = uVar117 < 4;
                uVar117 = uVar117 + 1;
              } while (uVar117 != 5);
              bVar126 = false;
              bVar112 = 5;
LAB_0113eed1:
              bVar113 = bVar112;
              auVar341 = ZEXT3264(local_aa0);
LAB_0113eeda:
              bVar123 = (bool)(bVar123 | bVar126 & bVar113);
              fVar226 = ray->tfar;
              auVar151._4_4_ = fVar226;
              auVar151._0_4_ = fVar226;
              auVar151._8_4_ = fVar226;
              auVar151._12_4_ = fVar226;
              auVar151._16_4_ = fVar226;
              auVar151._20_4_ = fVar226;
              auVar151._24_4_ = fVar226;
              auVar151._28_4_ = fVar226;
              auVar186 = vcmpps_avx(_local_7c0,auVar151,2);
              fVar226 = auVar186._28_4_;
              auVar141 = vandps_avx(auVar186,local_580);
              auVar192 = ZEXT3264(auVar141);
              auVar186 = local_580 & auVar186;
              local_580 = auVar141;
            } while ((((((((auVar186 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar186 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar186 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar186 >> 0x7f,0) != '\0') ||
                       (auVar186 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar186 >> 0xbf,0) != '\0') ||
                     (auVar186 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar186[0x1f] < '\0');
          }
          auVar363 = ZEXT3264(_local_540);
          auVar191._0_4_ =
               auVar377._0_4_ * (float)local_6e0._0_4_ +
               auVar409._0_4_ * (float)local_700._0_4_ + auVar419._0_4_ * (float)local_720._0_4_;
          auVar191._4_4_ =
               auVar377._4_4_ * (float)local_6e0._4_4_ +
               auVar409._4_4_ * (float)local_700._4_4_ + auVar419._4_4_ * (float)local_720._4_4_;
          auVar191._8_4_ =
               auVar377._8_4_ * fStack_6d8 +
               auVar409._8_4_ * fStack_6f8 + auVar419._8_4_ * fStack_718;
          auVar191._12_4_ =
               auVar377._12_4_ * fStack_6d4 +
               auVar409._12_4_ * fStack_6f4 + auVar419._12_4_ * fStack_714;
          auVar191._16_4_ =
               auVar377._16_4_ * fStack_6d0 +
               auVar409._16_4_ * fStack_6f0 + auVar419._16_4_ * fStack_710;
          auVar191._20_4_ =
               auVar377._20_4_ * fStack_6cc +
               auVar409._20_4_ * fStack_6ec + auVar419._20_4_ * fStack_70c;
          auVar191._24_4_ =
               auVar377._24_4_ * fStack_6c8 +
               auVar409._24_4_ * fStack_6e8 + auVar419._24_4_ * fStack_708;
          auVar191._28_4_ = fVar226 + fVar226 + auVar192._28_4_;
          auVar215._8_4_ = 0x7fffffff;
          auVar215._0_8_ = 0x7fffffff7fffffff;
          auVar215._12_4_ = 0x7fffffff;
          auVar215._16_4_ = 0x7fffffff;
          auVar215._20_4_ = 0x7fffffff;
          auVar215._24_4_ = 0x7fffffff;
          auVar215._28_4_ = 0x7fffffff;
          auVar141 = vandps_avx(auVar191,auVar215);
          auVar216._8_4_ = 0x3e99999a;
          auVar216._0_8_ = 0x3e99999a3e99999a;
          auVar216._12_4_ = 0x3e99999a;
          auVar216._16_4_ = 0x3e99999a;
          auVar216._20_4_ = 0x3e99999a;
          auVar216._24_4_ = 0x3e99999a;
          auVar216._28_4_ = 0x3e99999a;
          auVar141 = vcmpps_avx(auVar141,auVar216,1);
          auVar186 = vorps_avx(auVar141,local_660);
          auVar217._0_4_ = auVar341._0_4_ + local_740._0_4_;
          auVar217._4_4_ = auVar341._4_4_ + local_740._4_4_;
          auVar217._8_4_ = auVar341._8_4_ + local_740._8_4_;
          auVar217._12_4_ = auVar341._12_4_ + local_740._12_4_;
          auVar217._16_4_ = auVar341._16_4_ + local_740._16_4_;
          auVar217._20_4_ = auVar341._20_4_ + local_740._20_4_;
          auVar217._24_4_ = auVar341._24_4_ + local_740._24_4_;
          auVar217._28_4_ = auVar341._28_4_ + local_740._28_4_;
          auVar141 = vcmpps_avx(auVar217,auVar151,2);
          _local_7c0 = vandps_avx(auVar141,local_640);
          auVar218._8_4_ = 3;
          auVar218._0_8_ = 0x300000003;
          auVar218._12_4_ = 3;
          auVar218._16_4_ = 3;
          auVar218._20_4_ = 3;
          auVar218._24_4_ = 3;
          auVar218._28_4_ = 3;
          auVar248._8_4_ = 2;
          auVar248._0_8_ = 0x200000002;
          auVar248._12_4_ = 2;
          auVar248._16_4_ = 2;
          auVar248._20_4_ = 2;
          auVar248._24_4_ = 2;
          auVar248._28_4_ = 2;
          auVar141 = vblendvps_avx(auVar248,auVar218,auVar186);
          auVar109._4_4_ = fStack_6bc;
          auVar109._0_4_ = local_6c0;
          auVar109._8_4_ = fStack_6b8;
          auVar109._12_4_ = fStack_6b4;
          auVar232 = vpcmpgtd_avx(auVar141._16_16_,auVar109);
          auVar238 = vpshufd_avx(local_6a0._0_16_,0);
          auVar238 = vpcmpgtd_avx(auVar141._0_16_,auVar238);
          auVar219._16_16_ = auVar232;
          auVar219._0_16_ = auVar151._0_16_;
          local_960 = vblendps_avx(ZEXT1632(auVar238),auVar219,0xf0);
          auVar141 = vandnps_avx(local_960,_local_7c0);
          auVar186 = _local_7c0 & ~local_960;
          local_760 = auVar141;
          if ((((((((auVar186 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar186 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar186 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar186 >> 0x7f,0) != '\0') ||
                (auVar186 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar186 >> 0xbf,0) != '\0') ||
              (auVar186 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar186[0x1f] < '\0') {
            local_7a0._4_4_ = local_540._4_4_ + auVar341._4_4_;
            local_7a0._0_4_ = local_540._0_4_ + auVar341._0_4_;
            fStack_798 = local_540._8_4_ + auVar341._8_4_;
            fStack_794 = local_540._12_4_ + auVar341._12_4_;
            fStack_790 = local_540._16_4_ + auVar341._16_4_;
            fStack_78c = local_540._20_4_ + auVar341._20_4_;
            fStack_788 = local_540._24_4_ + auVar341._24_4_;
            fStack_784 = local_540._28_4_ + auVar341._28_4_;
            local_8e0 = _local_540;
            do {
              auVar153._8_4_ = 0x7f800000;
              auVar153._0_8_ = 0x7f8000007f800000;
              auVar153._12_4_ = 0x7f800000;
              auVar153._16_4_ = 0x7f800000;
              auVar153._20_4_ = 0x7f800000;
              auVar153._24_4_ = 0x7f800000;
              auVar153._28_4_ = 0x7f800000;
              auVar186 = vblendvps_avx(auVar153,auVar363._0_32_,auVar141);
              auVar34 = vshufps_avx(auVar186,auVar186,0xb1);
              auVar34 = vminps_avx(auVar186,auVar34);
              auVar35 = vshufpd_avx(auVar34,auVar34,5);
              auVar34 = vminps_avx(auVar34,auVar35);
              auVar35 = vperm2f128_avx(auVar34,auVar34,1);
              auVar34 = vminps_avx(auVar34,auVar35);
              auVar34 = vcmpps_avx(auVar186,auVar34,0);
              auVar35 = auVar141 & auVar34;
              auVar186 = auVar141;
              if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar35 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar35 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar35 >> 0x7f,0) != '\0') ||
                    (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar35 >> 0xbf,0) != '\0') ||
                  (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar35[0x1f] < '\0') {
                auVar186 = vandps_avx(auVar34,auVar141);
              }
              uVar115 = vmovmskps_avx(auVar186);
              uVar118 = 0;
              if (uVar115 != 0) {
                for (; (uVar115 >> uVar118 & 1) == 0; uVar118 = uVar118 + 1) {
                }
              }
              uVar117 = (ulong)uVar118;
              local_760 = auVar141;
              *(undefined4 *)(local_760 + uVar117 * 4) = 0;
              aVar9 = (ray->dir).field_0.field_1;
              local_840 = aVar9.x;
              fStack_83c = aVar9.y;
              fStack_838 = aVar9.z;
              aStack_834 = aVar9.field_3;
              auVar232 = vdpps_avx((undefined1  [16])aVar9,(undefined1  [16])aVar9,0x7f);
              fVar226 = local_1c0[uVar117];
              uVar118 = *(uint *)(local_520 + uVar117 * 4);
              if (auVar232._0_4_ < 0.0) {
                fVar169 = sqrtf(auVar232._0_4_);
              }
              else {
                auVar232 = vsqrtss_avx(auVar232,auVar232);
                fVar169 = auVar232._0_4_;
              }
              auVar238 = vminps_avx(_local_9e0,_local_a00);
              auVar232 = vmaxps_avx(_local_9e0,_local_a00);
              auVar137 = vminps_avx(_local_9f0,_local_a10);
              auVar175 = vminps_avx(auVar238,auVar137);
              auVar238 = vmaxps_avx(_local_9f0,_local_a10);
              auVar137 = vmaxps_avx(auVar232,auVar238);
              auVar235._8_4_ = 0x7fffffff;
              auVar235._0_8_ = 0x7fffffff7fffffff;
              auVar235._12_4_ = 0x7fffffff;
              auVar232 = vandps_avx(auVar175,auVar235);
              auVar238 = vandps_avx(auVar137,auVar235);
              auVar232 = vmaxps_avx(auVar232,auVar238);
              auVar238 = vmovshdup_avx(auVar232);
              auVar238 = vmaxss_avx(auVar238,auVar232);
              auVar232 = vshufpd_avx(auVar232,auVar232,1);
              auVar232 = vmaxss_avx(auVar232,auVar238);
              local_860 = auVar232._0_4_ * 1.9073486e-06;
              local_800._0_4_ = fVar169 * 1.9073486e-06;
              _local_8c0 = vshufps_avx(auVar137,auVar137,0xff);
              auVar232 = vinsertps_avx(ZEXT416(uVar118),ZEXT416((uint)fVar226),0x10);
              auVar383 = ZEXT1664(auVar232);
              bVar126 = true;
              uVar117 = 0;
              do {
                auVar376 = auVar383._0_16_;
                auVar238 = vmovshdup_avx(auVar376);
                fVar226 = auVar238._0_4_;
                fVar250 = 1.0 - fVar226;
                fVar169 = fVar250 * fVar250;
                fVar249 = fVar250 * fVar169;
                fVar195 = fVar226 * fVar226;
                fVar225 = fVar226 * fVar195;
                fVar223 = fVar226 * fVar250;
                auVar232 = vshufps_avx(ZEXT416((uint)(fVar225 * 0.16666667)),
                                       ZEXT416((uint)(fVar225 * 0.16666667)),0);
                auVar137 = ZEXT416((uint)((fVar225 * 4.0 + fVar249 +
                                          fVar226 * fVar223 * 12.0 + fVar250 * fVar223 * 6.0) *
                                         0.16666667));
                auVar137 = vshufps_avx(auVar137,auVar137,0);
                auVar175 = ZEXT416((uint)((fVar249 * 4.0 + fVar225 +
                                          fVar250 * fVar223 * 12.0 + fVar226 * fVar223 * 6.0) *
                                         0.16666667));
                auVar175 = vshufps_avx(auVar175,auVar175,0);
                auVar136 = vshufps_avx(auVar376,auVar376,0);
                auVar204._0_4_ = auVar136._0_4_ * local_840 + 0.0;
                auVar204._4_4_ = auVar136._4_4_ * fStack_83c + 0.0;
                auVar204._8_4_ = auVar136._8_4_ * fStack_838 + 0.0;
                auVar204._12_4_ = auVar136._12_4_ * aStack_834.w + 0.0;
                auVar136 = vshufps_avx(ZEXT416((uint)(fVar249 * 0.16666667)),
                                       ZEXT416((uint)(fVar249 * 0.16666667)),0);
                auVar135._0_4_ =
                     auVar136._0_4_ * (float)local_9e0._0_4_ +
                     auVar175._0_4_ * (float)local_a00._0_4_ +
                     auVar232._0_4_ * (float)local_a10._0_4_ +
                     auVar137._0_4_ * (float)local_9f0._0_4_;
                auVar135._4_4_ =
                     auVar136._4_4_ * (float)local_9e0._4_4_ +
                     auVar175._4_4_ * (float)local_a00._4_4_ +
                     auVar232._4_4_ * (float)local_a10._4_4_ +
                     auVar137._4_4_ * (float)local_9f0._4_4_;
                auVar135._8_4_ =
                     auVar136._8_4_ * fStack_9d8 +
                     auVar175._8_4_ * fStack_9f8 +
                     auVar232._8_4_ * fStack_a08 + auVar137._8_4_ * fStack_9e8;
                auVar135._12_4_ =
                     auVar136._12_4_ * fStack_9d4 +
                     auVar175._12_4_ * fStack_9f4 +
                     auVar232._12_4_ * fStack_a04 + auVar137._12_4_ * fStack_9e4;
                local_880._0_16_ = auVar135;
                auVar232 = vsubps_avx(auVar204,auVar135);
                _local_a80 = auVar232;
                auVar232 = vdpps_avx(auVar232,auVar232,0x7f);
                fVar249 = auVar232._0_4_;
                local_b40 = auVar383._0_4_;
                if (fVar249 < 0.0) {
                  local_a40._0_16_ = auVar238;
                  local_980._0_4_ = fVar195;
                  local_9a0._0_4_ = fVar169;
                  local_a60._0_4_ = fVar223;
                  fVar225 = sqrtf(fVar249);
                  fVar195 = (float)local_980._0_4_;
                  fVar169 = (float)local_9a0._0_4_;
                  fVar223 = (float)local_a60._0_4_;
                  fVar226 = (float)local_a40._0_4_;
                }
                else {
                  auVar238 = vsqrtss_avx(auVar232,auVar232);
                  fVar225 = auVar238._0_4_;
                }
                auVar238 = vshufps_avx(ZEXT416((uint)(fVar195 * 0.5)),ZEXT416((uint)(fVar195 * 0.5))
                                       ,0);
                auVar137 = ZEXT416((uint)((fVar169 + fVar223 * 4.0) * 0.5));
                auVar137 = vshufps_avx(auVar137,auVar137,0);
                auVar175 = ZEXT416((uint)((fVar226 * -fVar226 - fVar223 * 4.0) * 0.5));
                auVar175 = vshufps_avx(auVar175,auVar175,0);
                auVar136 = ZEXT416((uint)(fVar250 * -fVar250 * 0.5));
                auVar136 = vshufps_avx(auVar136,auVar136,0);
                auVar356._0_4_ =
                     (float)local_9e0._0_4_ * auVar136._0_4_ +
                     (float)local_a00._0_4_ * auVar175._0_4_ +
                     (float)local_a10._0_4_ * auVar238._0_4_ +
                     (float)local_9f0._0_4_ * auVar137._0_4_;
                auVar356._4_4_ =
                     (float)local_9e0._4_4_ * auVar136._4_4_ +
                     (float)local_a00._4_4_ * auVar175._4_4_ +
                     (float)local_a10._4_4_ * auVar238._4_4_ +
                     (float)local_9f0._4_4_ * auVar137._4_4_;
                auVar356._8_4_ =
                     fStack_9d8 * auVar136._8_4_ +
                     fStack_9f8 * auVar175._8_4_ +
                     fStack_a08 * auVar238._8_4_ + fStack_9e8 * auVar137._8_4_;
                auVar356._12_4_ =
                     fStack_9d4 * auVar136._12_4_ +
                     fStack_9f4 * auVar175._12_4_ +
                     fStack_a04 * auVar238._12_4_ + fStack_9e4 * auVar137._12_4_;
                auVar238 = vshufps_avx(auVar376,auVar376,0x55);
                auVar137 = ZEXT416((uint)(fVar250 - (fVar226 + fVar226)));
                auVar175 = vshufps_avx(auVar137,auVar137,0);
                auVar137 = ZEXT416((uint)(fVar226 - (fVar250 + fVar250)));
                auVar136 = vshufps_avx(auVar137,auVar137,0);
                auVar11 = vshufps_avx(ZEXT416((uint)fVar250),ZEXT416((uint)fVar250),0);
                auVar137 = vdpps_avx(auVar356,auVar356,0x7f);
                auVar176._0_4_ =
                     (float)local_9e0._0_4_ * auVar11._0_4_ +
                     (float)local_a00._0_4_ * auVar136._0_4_ +
                     (float)local_a10._0_4_ * auVar238._0_4_ +
                     (float)local_9f0._0_4_ * auVar175._0_4_;
                auVar176._4_4_ =
                     (float)local_9e0._4_4_ * auVar11._4_4_ +
                     (float)local_a00._4_4_ * auVar136._4_4_ +
                     (float)local_a10._4_4_ * auVar238._4_4_ +
                     (float)local_9f0._4_4_ * auVar175._4_4_;
                auVar176._8_4_ =
                     fStack_9d8 * auVar11._8_4_ +
                     fStack_9f8 * auVar136._8_4_ +
                     fStack_a08 * auVar238._8_4_ + fStack_9e8 * auVar175._8_4_;
                auVar176._12_4_ =
                     fStack_9d4 * auVar11._12_4_ +
                     fStack_9f4 * auVar136._12_4_ +
                     fStack_a04 * auVar238._12_4_ + fStack_9e4 * auVar175._12_4_;
                auVar238 = vblendps_avx(auVar137,_DAT_01f7aa10,0xe);
                auVar175 = vrsqrtss_avx(auVar238,auVar238);
                fVar169 = auVar175._0_4_;
                fVar226 = auVar137._0_4_;
                auVar175 = vdpps_avx(auVar356,auVar176,0x7f);
                auVar136 = vshufps_avx(auVar137,auVar137,0);
                auVar177._0_4_ = auVar176._0_4_ * auVar136._0_4_;
                auVar177._4_4_ = auVar176._4_4_ * auVar136._4_4_;
                auVar177._8_4_ = auVar176._8_4_ * auVar136._8_4_;
                auVar177._12_4_ = auVar176._12_4_ * auVar136._12_4_;
                auVar175 = vshufps_avx(auVar175,auVar175,0);
                auVar262._0_4_ = auVar356._0_4_ * auVar175._0_4_;
                auVar262._4_4_ = auVar356._4_4_ * auVar175._4_4_;
                auVar262._8_4_ = auVar356._8_4_ * auVar175._8_4_;
                auVar262._12_4_ = auVar356._12_4_ * auVar175._12_4_;
                auVar11 = vsubps_avx(auVar177,auVar262);
                auVar175 = vrcpss_avx(auVar238,auVar238);
                auVar238 = vmaxss_avx(ZEXT416((uint)local_860),
                                      ZEXT416((uint)(local_b40 * (float)local_800._0_4_)));
                auVar175 = ZEXT416((uint)(auVar175._0_4_ * (2.0 - fVar226 * auVar175._0_4_)));
                auVar175 = vshufps_avx(auVar175,auVar175,0);
                uVar102 = CONCAT44(auVar356._4_4_,auVar356._0_4_);
                auVar289._0_8_ = uVar102 ^ 0x8000000080000000;
                auVar289._8_4_ = -auVar356._8_4_;
                auVar289._12_4_ = -auVar356._12_4_;
                auVar136 = ZEXT416((uint)(fVar169 * 1.5 +
                                         fVar226 * -0.5 * fVar169 * fVar169 * fVar169));
                auVar136 = vshufps_avx(auVar136,auVar136,0);
                auVar236._0_4_ = auVar136._0_4_ * auVar11._0_4_ * auVar175._0_4_;
                auVar236._4_4_ = auVar136._4_4_ * auVar11._4_4_ * auVar175._4_4_;
                auVar236._8_4_ = auVar136._8_4_ * auVar11._8_4_ * auVar175._8_4_;
                auVar236._12_4_ = auVar136._12_4_ * auVar11._12_4_ * auVar175._12_4_;
                auVar313._0_4_ = auVar356._0_4_ * auVar136._0_4_;
                auVar313._4_4_ = auVar356._4_4_ * auVar136._4_4_;
                auVar313._8_4_ = auVar356._8_4_ * auVar136._8_4_;
                auVar313._12_4_ = auVar356._12_4_ * auVar136._12_4_;
                local_a40._0_4_ = auVar238._0_4_;
                if (fVar226 < 0.0) {
                  local_980._0_4_ = fVar225;
                  local_9a0._0_16_ = auVar289;
                  local_a60._0_16_ = auVar313;
                  local_940._0_16_ = auVar236;
                  fVar169 = sqrtf(fVar226);
                  auVar236 = local_940._0_16_;
                  auVar289 = local_9a0._0_16_;
                  auVar313 = local_a60._0_16_;
                  fVar226 = (float)local_a40._0_4_;
                  fVar225 = (float)local_980._0_4_;
                }
                else {
                  auVar137 = vsqrtss_avx(auVar137,auVar137);
                  fVar169 = auVar137._0_4_;
                  fVar226 = auVar238._0_4_;
                }
                auVar238 = vdpps_avx(_local_a80,auVar313,0x7f);
                fVar169 = (local_860 / fVar169) * (fVar225 + 1.0) + fVar225 * local_860 + fVar226;
                auVar137 = vdpps_avx(auVar289,auVar313,0x7f);
                auVar175 = vdpps_avx(_local_a80,auVar236,0x7f);
                auVar107._4_4_ = fStack_83c;
                auVar107._0_4_ = local_840;
                auVar107._8_4_ = fStack_838;
                auVar107._12_4_ = aStack_834.a;
                auVar136 = vdpps_avx(auVar107,auVar313,0x7f);
                auVar11 = vdpps_avx(_local_a80,auVar289,0x7f);
                fVar195 = auVar137._0_4_ + auVar175._0_4_;
                fVar225 = auVar238._0_4_;
                auVar138._0_4_ = fVar225 * fVar225;
                auVar138._4_4_ = auVar238._4_4_ * auVar238._4_4_;
                auVar138._8_4_ = auVar238._8_4_ * auVar238._8_4_;
                auVar138._12_4_ = auVar238._12_4_ * auVar238._12_4_;
                auVar175 = vsubps_avx(auVar232,auVar138);
                auVar137 = vdpps_avx(_local_a80,auVar107,0x7f);
                fVar223 = auVar11._0_4_ - fVar225 * fVar195;
                fVar250 = auVar137._0_4_ - fVar225 * auVar136._0_4_;
                auVar137 = vrsqrtss_avx(auVar175,auVar175);
                fVar224 = auVar175._0_4_;
                fVar225 = auVar137._0_4_;
                fVar225 = fVar225 * 1.5 + fVar224 * -0.5 * fVar225 * fVar225 * fVar225;
                if (fVar224 < 0.0) {
                  local_980._0_16_ = auVar238;
                  local_9a0._0_4_ = fVar169;
                  local_a60._0_16_ = auVar136;
                  local_940._0_16_ = ZEXT416((uint)fVar195);
                  local_8a0._0_4_ = fVar223;
                  local_820._0_4_ = fVar250;
                  local_780._0_4_ = fVar225;
                  fVar224 = sqrtf(fVar224);
                  fVar225 = (float)local_780._0_4_;
                  fVar223 = (float)local_8a0._0_4_;
                  fVar250 = (float)local_820._0_4_;
                  auVar136 = local_a60._0_16_;
                  auVar238 = local_980._0_16_;
                  fVar169 = (float)local_9a0._0_4_;
                  fVar226 = (float)local_a40._0_4_;
                  auVar137 = local_940._0_16_;
                }
                else {
                  auVar137 = vsqrtss_avx(auVar175,auVar175);
                  fVar224 = auVar137._0_4_;
                  auVar137 = ZEXT416((uint)fVar195);
                }
                auVar435 = ZEXT464((uint)fVar169);
                auVar409 = ZEXT1664(auVar232);
                auVar419 = ZEXT1664(auVar356);
                auVar11 = vpermilps_avx(local_880._0_16_,0xff);
                auVar12 = vshufps_avx(auVar356,auVar356,0xff);
                fVar223 = fVar223 * fVar225 - auVar12._0_4_;
                auVar263._0_8_ = auVar136._0_8_ ^ 0x8000000080000000;
                auVar263._8_4_ = auVar136._8_4_ ^ 0x80000000;
                auVar263._12_4_ = auVar136._12_4_ ^ 0x80000000;
                auVar290._0_4_ = -fVar223;
                auVar290._4_4_ = 0x80000000;
                auVar290._8_4_ = 0x80000000;
                auVar290._12_4_ = 0x80000000;
                auVar299 = ZEXT1664(auVar290);
                fVar195 = auVar137._0_4_ * fVar250 * fVar225;
                auVar322 = ZEXT464((uint)fVar195);
                auVar175 = vinsertps_avx(auVar290,ZEXT416((uint)(fVar250 * fVar225)),0x1c);
                auVar136 = vmovsldup_avx(ZEXT416((uint)(fVar195 - auVar136._0_4_ * fVar223)));
                auVar175 = vdivps_avx(auVar175,auVar136);
                auVar137 = vinsertps_avx(auVar137,auVar263,0x10);
                auVar137 = vdivps_avx(auVar137,auVar136);
                auVar136 = vmovsldup_avx(auVar238);
                auVar178 = ZEXT416((uint)(fVar224 - auVar11._0_4_));
                auVar11 = vmovsldup_avx(auVar178);
                auVar205._0_4_ = auVar136._0_4_ * auVar175._0_4_ + auVar11._0_4_ * auVar137._0_4_;
                auVar205._4_4_ = auVar136._4_4_ * auVar175._4_4_ + auVar11._4_4_ * auVar137._4_4_;
                auVar205._8_4_ = auVar136._8_4_ * auVar175._8_4_ + auVar11._8_4_ * auVar137._8_4_;
                auVar205._12_4_ =
                     auVar136._12_4_ * auVar175._12_4_ + auVar11._12_4_ * auVar137._12_4_;
                auVar137 = vsubps_avx(auVar376,auVar205);
                auVar383 = ZEXT1664(auVar137);
                auVar206._8_4_ = 0x7fffffff;
                auVar206._0_8_ = 0x7fffffff7fffffff;
                auVar206._12_4_ = 0x7fffffff;
                auVar238 = vandps_avx(auVar238,auVar206);
                if (auVar238._0_4_ < fVar169) {
                  auVar237._8_4_ = 0x7fffffff;
                  auVar237._0_8_ = 0x7fffffff7fffffff;
                  auVar237._12_4_ = 0x7fffffff;
                  auVar238 = vandps_avx(auVar178,auVar237);
                  if (auVar238._0_4_ < (float)local_8c0._0_4_ * 1.9073486e-06 + fVar169 + fVar226) {
                    fVar226 = auVar137._0_4_ + (float)local_7e0._0_4_;
                    bVar113 = 0;
                    bVar112 = 0;
                    if (fVar226 < (ray->org).field_0.m128[3]) goto LAB_0113f958;
                    fVar169 = ray->tfar;
                    auVar435 = ZEXT464((uint)fVar169);
                    auVar341 = ZEXT3264(local_aa0);
                    auVar363 = ZEXT3264(local_8e0);
                    if (fVar169 < fVar226) goto LAB_0113f96a;
                    auVar238 = vmovshdup_avx(auVar137);
                    bVar113 = 0;
                    fVar225 = auVar238._0_4_;
                    if ((fVar225 < 0.0) || (1.0 < fVar225)) goto LAB_0113f96a;
                    auVar238 = vrsqrtss_avx(auVar232,auVar232);
                    fVar223 = auVar238._0_4_;
                    auVar299 = ZEXT464((uint)(fVar249 * -0.5));
                    pGVar29 = (context->scene->geometries).items[uVar114].ptr;
                    if ((pGVar29->mask & ray->mask) == 0) {
                      bVar113 = 0;
                      goto LAB_0113f96a;
                    }
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar113 = 1, pGVar29->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_0113f96a;
                    auVar238 = ZEXT416((uint)(fVar223 * 1.5 +
                                             fVar249 * -0.5 * fVar223 * fVar223 * fVar223));
                    auVar238 = vshufps_avx(auVar238,auVar238,0);
                    auVar239._0_4_ = auVar238._0_4_ * (float)local_a80._0_4_;
                    auVar239._4_4_ = auVar238._4_4_ * (float)local_a80._4_4_;
                    auVar239._8_4_ = auVar238._8_4_ * fStack_a78;
                    auVar239._12_4_ = auVar238._12_4_ * fStack_a74;
                    auVar139._0_4_ = auVar356._0_4_ + auVar12._0_4_ * auVar239._0_4_;
                    auVar139._4_4_ = auVar356._4_4_ + auVar12._4_4_ * auVar239._4_4_;
                    auVar139._8_4_ = auVar356._8_4_ + auVar12._8_4_ * auVar239._8_4_;
                    auVar139._12_4_ = auVar356._12_4_ + auVar12._12_4_ * auVar239._12_4_;
                    auVar238 = vshufps_avx(auVar239,auVar239,0xc9);
                    auVar175 = vshufps_avx(auVar356,auVar356,0xc9);
                    auVar240._0_4_ = auVar175._0_4_ * auVar239._0_4_;
                    auVar240._4_4_ = auVar175._4_4_ * auVar239._4_4_;
                    auVar240._8_4_ = auVar175._8_4_ * auVar239._8_4_;
                    auVar240._12_4_ = auVar175._12_4_ * auVar239._12_4_;
                    auVar264._0_4_ = auVar356._0_4_ * auVar238._0_4_;
                    auVar264._4_4_ = auVar356._4_4_ * auVar238._4_4_;
                    auVar264._8_4_ = auVar356._8_4_ * auVar238._8_4_;
                    auVar264._12_4_ = auVar356._12_4_ * auVar238._12_4_;
                    auVar136 = vsubps_avx(auVar264,auVar240);
                    auVar238 = vshufps_avx(auVar136,auVar136,0xc9);
                    auVar175 = vshufps_avx(auVar139,auVar139,0xc9);
                    auVar299 = ZEXT1664(auVar175);
                    auVar265._0_4_ = auVar175._0_4_ * auVar238._0_4_;
                    auVar265._4_4_ = auVar175._4_4_ * auVar238._4_4_;
                    auVar265._8_4_ = auVar175._8_4_ * auVar238._8_4_;
                    auVar265._12_4_ = auVar175._12_4_ * auVar238._12_4_;
                    auVar238 = vshufps_avx(auVar136,auVar136,0xd2);
                    auVar140._0_4_ = auVar139._0_4_ * auVar238._0_4_;
                    auVar140._4_4_ = auVar139._4_4_ * auVar238._4_4_;
                    auVar140._8_4_ = auVar139._8_4_ * auVar238._8_4_;
                    auVar140._12_4_ = auVar139._12_4_ * auVar238._12_4_;
                    auVar136 = vsubps_avx(auVar265,auVar140);
                    auVar238 = vshufps_avx(auVar136,auVar136,0xe9);
                    local_920 = vmovlps_avx(auVar238);
                    local_918 = auVar136._0_4_;
                    local_910 = 0;
                    local_90c = (undefined4)local_8e8;
                    local_904 = context->user->instID[0];
                    local_900 = context->user->instPrimID[0];
                    ray->tfar = fVar226;
                    local_aa4 = -1;
                    local_9d0.valid = &local_aa4;
                    local_9d0.geometryUserPtr = pGVar29->userPtr;
                    local_9d0.context = context->user;
                    local_9d0.hit = (RTCHitN *)&local_920;
                    local_9d0.N = 1;
                    local_9d0.ray = (RTCRayN *)ray;
                    local_914 = fVar225;
                    local_908 = uVar114;
                    if (pGVar29->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0113fb97:
                      p_Var32 = context->args->filter;
                      if ((p_Var32 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar29->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar299 = ZEXT1664(auVar299._0_16_);
                        auVar322 = ZEXT1664(auVar322._0_16_);
                        auVar383 = ZEXT1664(auVar383._0_16_);
                        auVar409 = ZEXT1664(auVar409._0_16_);
                        auVar419 = ZEXT1664(auVar419._0_16_);
                        auVar435 = ZEXT1664(auVar435._0_16_);
                        (*p_Var32)(&local_9d0);
                        if (*local_9d0.valid == 0) goto LAB_0113fbde;
                      }
                      bVar112 = 1;
                    }
                    else {
                      auVar299 = ZEXT1664(auVar175);
                      auVar322 = ZEXT464((uint)fVar195);
                      auVar383 = ZEXT1664(auVar137);
                      auVar409 = ZEXT1664(auVar232);
                      auVar419 = ZEXT1664(auVar356);
                      auVar435 = ZEXT464((uint)fVar169);
                      (*pGVar29->occlusionFilterN)(&local_9d0);
                      if (*local_9d0.valid != 0) goto LAB_0113fb97;
LAB_0113fbde:
                      ray->tfar = fVar169;
                      bVar112 = 0;
                    }
                    goto LAB_0113f958;
                  }
                }
                bVar126 = uVar117 < 4;
                uVar117 = uVar117 + 1;
              } while (uVar117 != 5);
              bVar126 = false;
              bVar112 = 5;
LAB_0113f958:
              bVar113 = bVar112;
              auVar341 = ZEXT3264(local_aa0);
              auVar363 = ZEXT3264(local_8e0);
LAB_0113f96a:
              bVar123 = (bool)(bVar123 | bVar126 & bVar113);
              fVar226 = ray->tfar;
              auVar151._4_4_ = fVar226;
              auVar151._0_4_ = fVar226;
              auVar151._8_4_ = fVar226;
              auVar151._12_4_ = fVar226;
              auVar151._16_4_ = fVar226;
              auVar151._20_4_ = fVar226;
              auVar151._24_4_ = fVar226;
              auVar151._28_4_ = fVar226;
              auVar186 = vcmpps_avx(_local_7a0,auVar151,2);
              auVar141 = vandps_avx(auVar186,local_760);
              auVar186 = local_760 & auVar186;
              local_760 = auVar141;
            } while ((((((((auVar186 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar186 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar186 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar186 >> 0x7f,0) != '\0') ||
                       (auVar186 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar186 >> 0xbf,0) != '\0') ||
                     (auVar186 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar186[0x1f] < '\0');
          }
          auVar141 = vandps_avx(local_620,local_600);
          auVar186 = vandps_avx(_local_7c0,local_960);
          auVar267._0_4_ = auVar341._0_4_ + local_500._0_4_;
          auVar267._4_4_ = auVar341._4_4_ + local_500._4_4_;
          auVar267._8_4_ = auVar341._8_4_ + local_500._8_4_;
          auVar267._12_4_ = auVar341._12_4_ + local_500._12_4_;
          auVar267._16_4_ = auVar341._16_4_ + local_500._16_4_;
          auVar267._20_4_ = auVar341._20_4_ + local_500._20_4_;
          auVar267._24_4_ = auVar341._24_4_ + local_500._24_4_;
          auVar267._28_4_ = auVar341._28_4_ + local_500._28_4_;
          auVar34 = vcmpps_avx(auVar267,auVar151,2);
          auVar141 = vandps_avx(auVar34,auVar141);
          auVar268._0_4_ = local_540._0_4_ + auVar341._0_4_;
          auVar268._4_4_ = local_540._4_4_ + auVar341._4_4_;
          auVar268._8_4_ = local_540._8_4_ + auVar341._8_4_;
          auVar268._12_4_ = local_540._12_4_ + auVar341._12_4_;
          auVar268._16_4_ = local_540._16_4_ + auVar341._16_4_;
          auVar268._20_4_ = local_540._20_4_ + auVar341._20_4_;
          auVar268._24_4_ = local_540._24_4_ + auVar341._24_4_;
          auVar268._28_4_ = local_540._28_4_ + auVar341._28_4_;
          auVar34 = vcmpps_avx(auVar268,auVar151,2);
          auVar186 = vandps_avx(auVar34,auVar186);
          auVar186 = vorps_avx(auVar141,auVar186);
          if ((((((((auVar186 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar186 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar186 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar186 >> 0x7f,0) != '\0') ||
                (auVar186 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar186 >> 0xbf,0) != '\0') ||
              (auVar186 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar186[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar125 * 0x60) = auVar186;
            auVar141 = vblendvps_avx(_local_540,local_500,auVar141);
            *(undefined1 (*) [32])(auStack_160 + uVar125 * 0x60) = auVar141;
            uVar8 = vmovlps_avx(local_550);
            (&uStack_140)[uVar125 * 0xc] = uVar8;
            aiStack_138[uVar125 * 0x18] = local_b44 + 1;
            iVar124 = iVar124 + 1;
          }
          goto LAB_0113e57e;
        }
      }
      auVar341 = ZEXT3264(local_aa0);
    }
LAB_0113e57e:
    fVar226 = ray->tfar;
    auVar148._4_4_ = fVar226;
    auVar148._0_4_ = fVar226;
    auVar148._8_4_ = fVar226;
    auVar148._12_4_ = fVar226;
    auVar148._16_4_ = fVar226;
    auVar148._20_4_ = fVar226;
    auVar148._24_4_ = fVar226;
    auVar148._28_4_ = fVar226;
    if (iVar124 == 0) break;
    uVar118 = -iVar124;
    pauVar116 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar124 - 1) * 0x60);
    while( true ) {
      auVar141 = pauVar116[1];
      auVar185._0_4_ = auVar341._0_4_ + auVar141._0_4_;
      auVar185._4_4_ = auVar341._4_4_ + auVar141._4_4_;
      auVar185._8_4_ = auVar341._8_4_ + auVar141._8_4_;
      auVar185._12_4_ = auVar341._12_4_ + auVar141._12_4_;
      auVar185._16_4_ = auVar341._16_4_ + auVar141._16_4_;
      auVar185._20_4_ = auVar341._20_4_ + auVar141._20_4_;
      auVar185._24_4_ = auVar341._24_4_ + auVar141._24_4_;
      auVar185._28_4_ = auVar341._28_4_ + auVar141._28_4_;
      auVar34 = vcmpps_avx(auVar185,auVar148,2);
      auVar186 = vandps_avx(auVar34,*pauVar116);
      local_500 = auVar186;
      auVar34 = *pauVar116 & auVar34;
      if ((((((((auVar34 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar34 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar34 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar34 >> 0x7f,0) != '\0') ||
            (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar34 >> 0xbf,0) != '\0') ||
          (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar34[0x1f] < '\0') break;
      pauVar116 = pauVar116 + -3;
      uVar118 = uVar118 + 1;
      if (uVar118 == 0) goto LAB_0113fd7c;
    }
    auVar149._8_4_ = 0x7f800000;
    auVar149._0_8_ = 0x7f8000007f800000;
    auVar149._12_4_ = 0x7f800000;
    auVar149._16_4_ = 0x7f800000;
    auVar149._20_4_ = 0x7f800000;
    auVar149._24_4_ = 0x7f800000;
    auVar149._28_4_ = 0x7f800000;
    auVar141 = vblendvps_avx(auVar149,auVar141,auVar186);
    auVar34 = vshufps_avx(auVar141,auVar141,0xb1);
    auVar34 = vminps_avx(auVar141,auVar34);
    auVar35 = vshufpd_avx(auVar34,auVar34,5);
    auVar34 = vminps_avx(auVar34,auVar35);
    auVar35 = vperm2f128_avx(auVar34,auVar34,1);
    auVar34 = vminps_avx(auVar34,auVar35);
    auVar141 = vcmpps_avx(auVar141,auVar34,0);
    auVar34 = auVar186 & auVar141;
    if ((((((((auVar34 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar34 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar34 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar34 >> 0x7f,0) != '\0') ||
          (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar34 >> 0xbf,0) != '\0') ||
        (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar34[0x1f] < '\0')
    {
      auVar186 = vandps_avx(auVar141,auVar186);
    }
    auVar130._8_8_ = 0;
    auVar130._0_8_ = *(ulong *)pauVar116[2];
    local_b44 = *(uint *)(pauVar116[2] + 8);
    uVar119 = vmovmskps_avx(auVar186);
    uVar115 = 0;
    if (uVar119 != 0) {
      for (; (uVar119 >> uVar115 & 1) == 0; uVar115 = uVar115 + 1) {
      }
    }
    *(undefined4 *)(local_500 + (ulong)uVar115 * 4) = 0;
    *pauVar116 = local_500;
    uVar119 = ~uVar118;
    if ((((((((local_500 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_500 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_500 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_500 >> 0x7f,0) != '\0') ||
          (local_500 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_500 >> 0xbf,0) != '\0') ||
        (local_500 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_500[0x1f] < '\0') {
      uVar119 = -uVar118;
    }
    uVar125 = (ulong)uVar119;
    auVar232 = vshufps_avx(auVar130,auVar130,0);
    auVar238 = vshufps_avx(auVar130,auVar130,0x55);
    auVar238 = vsubps_avx(auVar238,auVar232);
    local_540._4_4_ = auVar232._4_4_ + auVar238._4_4_ * 0.14285715;
    local_540._0_4_ = auVar232._0_4_ + auVar238._0_4_ * 0.0;
    fStack_538 = auVar232._8_4_ + auVar238._8_4_ * 0.2857143;
    fStack_534 = auVar232._12_4_ + auVar238._12_4_ * 0.42857146;
    fStack_530 = auVar232._0_4_ + auVar238._0_4_ * 0.5714286;
    fStack_52c = auVar232._4_4_ + auVar238._4_4_ * 0.71428573;
    fStack_528 = auVar232._8_4_ + auVar238._8_4_ * 0.8571429;
    fStack_524 = auVar232._12_4_ + auVar238._12_4_;
    local_550._8_8_ = 0;
    local_550._0_8_ = *(ulong *)(local_540 + (ulong)uVar115 * 4);
  } while( true );
LAB_0113fd7c:
  if (bVar123 != false) {
    return bVar123;
  }
  auVar141 = vcmpps_avx(local_2c0,auVar148,2);
  uVar114 = vmovmskps_avx(auVar141);
  uVar114 = (uint)local_7c8 - 1 & (uint)local_7c8 & uVar114;
  if (uVar114 == 0) {
    return false;
  }
  goto LAB_0113d422;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }